

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx512::CurveNiMBIntersectorK<4,16>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  float *pfVar9;
  undefined4 uVar10;
  Primitive PVar11;
  uint uVar12;
  Geometry *pGVar13;
  __int_type_conflict _Var14;
  long lVar15;
  long lVar16;
  RTCRayQueryContext *pRVar17;
  RTCFilterFunctionN p_Var18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  undefined1 auVar33 [16];
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [60];
  undefined1 auVar62 [60];
  undefined1 auVar63 [12];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  byte bVar79;
  byte bVar80;
  ulong uVar81;
  byte bVar82;
  uint uVar83;
  byte bVar84;
  uint uVar85;
  byte bVar86;
  byte bVar87;
  long lVar88;
  ulong uVar89;
  long lVar90;
  bool bVar91;
  ulong uVar92;
  uint uVar154;
  uint uVar155;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  uint uVar156;
  uint uVar157;
  uint uVar158;
  uint uVar159;
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  uint uVar160;
  undefined1 auVar149 [64];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  undefined1 auVar153 [64];
  float fVar161;
  float fVar162;
  float fVar185;
  float fVar186;
  vint4 bi_2;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar187;
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  float fVar188;
  float fVar189;
  float fVar190;
  undefined1 auVar184 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  vint4 bi_1;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  float fVar212;
  float fVar229;
  float fVar230;
  vint4 bi;
  float fVar231;
  undefined1 auVar226 [32];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar227 [32];
  undefined1 auVar228 [64];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  float fVar253;
  vint4 ai_2;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  float fVar254;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  vint4 ai_1;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  float fVar260;
  undefined1 auVar259 [64];
  vint4 ai;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  float fVar266;
  float fVar267;
  float fVar268;
  undefined1 auVar265 [32];
  float fVar269;
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  float fVar276;
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar281;
  undefined1 auVar277 [64];
  float fVar282;
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  float fVar290;
  undefined1 auVar288 [32];
  undefined1 auVar289 [64];
  undefined1 auVar291 [32];
  undefined1 auVar292 [64];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [64];
  undefined1 auVar298 [16];
  undefined1 auVar299 [64];
  undefined1 auVar300 [64];
  undefined1 auVar301 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vint<16> mask;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  RTCFilterFunctionNArguments local_b50;
  undefined1 local_b20 [32];
  undefined1 local_af0 [16];
  undefined1 (*local_ad8) [32];
  Primitive *local_ad0;
  ulong local_ac8;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [16];
  undefined1 local_990 [16];
  float local_980;
  float fStack_97c;
  float fStack_978;
  float fStack_974;
  undefined1 local_970 [16];
  undefined1 local_960 [16];
  undefined1 local_950 [16];
  float local_940;
  float fStack_93c;
  float fStack_938;
  float fStack_934;
  ulong local_928;
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [64];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_7f0 [16];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined4 local_6a0;
  undefined4 uStack_69c;
  undefined4 uStack_698;
  undefined4 uStack_694;
  undefined4 uStack_690;
  undefined4 uStack_68c;
  undefined4 uStack_688;
  undefined4 uStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined4 local_620;
  undefined4 uStack_61c;
  undefined4 uStack_618;
  undefined4 uStack_614;
  undefined4 uStack_610;
  undefined4 uStack_60c;
  undefined4 uStack_608;
  undefined4 uStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined4 local_5a0;
  undefined4 uStack_59c;
  undefined4 uStack_598;
  undefined4 uStack_594;
  undefined4 uStack_590;
  undefined4 uStack_58c;
  undefined4 uStack_588;
  undefined4 uStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined4 local_520;
  undefined4 uStack_51c;
  undefined4 uStack_518;
  undefined4 uStack_514;
  undefined4 uStack_510;
  undefined4 uStack_50c;
  undefined4 uStack_508;
  undefined4 uStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  uint auStack_180 [7];
  float fStack_164;
  undefined8 uStack_160;
  float afStack_158 [74];
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined1 auVar152 [64];
  undefined1 auVar139 [32];
  undefined1 auVar285 [64];
  
  PVar11 = prim[1];
  uVar92 = (ulong)(byte)PVar11;
  lVar90 = uVar92 * 0x25;
  fVar161 = *(float *)(prim + lVar90 + 0x12);
  auVar97 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar97 = vinsertps_avx(auVar97,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar96 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar96 = vinsertps_avx(auVar96,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar97 = vsubps_avx(auVar97,*(undefined1 (*) [16])(prim + lVar90 + 6));
  auVar232._0_4_ = fVar161 * auVar97._0_4_;
  auVar232._4_4_ = fVar161 * auVar97._4_4_;
  auVar232._8_4_ = fVar161 * auVar97._8_4_;
  auVar232._12_4_ = fVar161 * auVar97._12_4_;
  auVar97 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 * 4 + 6)));
  auVar163._0_4_ = fVar161 * auVar96._0_4_;
  auVar163._4_4_ = fVar161 * auVar96._4_4_;
  auVar163._8_4_ = fVar161 * auVar96._8_4_;
  auVar163._12_4_ = fVar161 * auVar96._12_4_;
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 * 5 + 6)));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar99 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 * 6 + 6)));
  auVar284 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 * 0xf + 6)));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar284 = vcvtdq2ps_avx(auVar284);
  auVar100 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar11 * 0x10 + 6)));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar11 * 0x10 + uVar92 + 6)));
  auVar33 = vcvtdq2ps_avx(auVar33);
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 * 0x1a + 6)));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar98 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 * 0x1b + 6)));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar283 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 * 0x1c + 6)));
  auVar283 = vcvtdq2ps_avx(auVar283);
  auVar255._4_4_ = auVar163._0_4_;
  auVar255._0_4_ = auVar163._0_4_;
  auVar255._8_4_ = auVar163._0_4_;
  auVar255._12_4_ = auVar163._0_4_;
  auVar103 = vshufps_avx(auVar163,auVar163,0x55);
  auVar102 = vshufps_avx(auVar163,auVar163,0xaa);
  fVar161 = auVar102._0_4_;
  auVar213._0_4_ = fVar161 * auVar99._0_4_;
  fVar276 = auVar102._4_4_;
  auVar213._4_4_ = fVar276 * auVar99._4_4_;
  fVar278 = auVar102._8_4_;
  auVar213._8_4_ = fVar278 * auVar99._8_4_;
  fVar279 = auVar102._12_4_;
  auVar213._12_4_ = fVar279 * auVar99._12_4_;
  auVar191._0_4_ = auVar33._0_4_ * fVar161;
  auVar191._4_4_ = auVar33._4_4_ * fVar276;
  auVar191._8_4_ = auVar33._8_4_ * fVar278;
  auVar191._12_4_ = auVar33._12_4_ * fVar279;
  auVar164._0_4_ = auVar283._0_4_ * fVar161;
  auVar164._4_4_ = auVar283._4_4_ * fVar276;
  auVar164._8_4_ = auVar283._8_4_ * fVar278;
  auVar164._12_4_ = auVar283._12_4_ * fVar279;
  auVar102 = vfmadd231ps_fma(auVar213,auVar103,auVar96);
  auVar104 = vfmadd231ps_fma(auVar191,auVar103,auVar100);
  auVar103 = vfmadd231ps_fma(auVar164,auVar98,auVar103);
  auVar105 = vfmadd231ps_fma(auVar102,auVar255,auVar97);
  auVar104 = vfmadd231ps_fma(auVar104,auVar255,auVar284);
  auVar38 = vfmadd231ps_fma(auVar103,auVar101,auVar255);
  auVar298._4_4_ = auVar232._0_4_;
  auVar298._0_4_ = auVar232._0_4_;
  auVar298._8_4_ = auVar232._0_4_;
  auVar298._12_4_ = auVar232._0_4_;
  auVar103 = vshufps_avx(auVar232,auVar232,0x55);
  auVar102 = vshufps_avx(auVar232,auVar232,0xaa);
  fVar161 = auVar102._0_4_;
  auVar256._0_4_ = fVar161 * auVar99._0_4_;
  fVar276 = auVar102._4_4_;
  auVar256._4_4_ = fVar276 * auVar99._4_4_;
  fVar278 = auVar102._8_4_;
  auVar256._8_4_ = fVar278 * auVar99._8_4_;
  fVar279 = auVar102._12_4_;
  auVar256._12_4_ = fVar279 * auVar99._12_4_;
  auVar243._0_4_ = auVar33._0_4_ * fVar161;
  auVar243._4_4_ = auVar33._4_4_ * fVar276;
  auVar243._8_4_ = auVar33._8_4_ * fVar278;
  auVar243._12_4_ = auVar33._12_4_ * fVar279;
  auVar233._0_4_ = auVar283._0_4_ * fVar161;
  auVar233._4_4_ = auVar283._4_4_ * fVar276;
  auVar233._8_4_ = auVar283._8_4_ * fVar278;
  auVar233._12_4_ = auVar283._12_4_ * fVar279;
  auVar96 = vfmadd231ps_fma(auVar256,auVar103,auVar96);
  auVar99 = vfmadd231ps_fma(auVar243,auVar103,auVar100);
  auVar100 = vfmadd231ps_fma(auVar233,auVar103,auVar98);
  auVar39 = vfmadd231ps_fma(auVar96,auVar298,auVar97);
  auVar163 = vfmadd231ps_fma(auVar99,auVar298,auVar284);
  auVar274._8_4_ = 0x7fffffff;
  auVar274._0_8_ = 0x7fffffff7fffffff;
  auVar274._12_4_ = 0x7fffffff;
  auVar164 = vfmadd231ps_fma(auVar100,auVar298,auVar101);
  auVar97 = vandps_avx(auVar274,auVar105);
  auVar270._8_4_ = 0x219392ef;
  auVar270._0_8_ = 0x219392ef219392ef;
  auVar270._12_4_ = 0x219392ef;
  uVar81 = vcmpps_avx512vl(auVar97,auVar270,1);
  bVar19 = (bool)((byte)uVar81 & 1);
  auVar93._0_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar105._0_4_;
  bVar19 = (bool)((byte)(uVar81 >> 1) & 1);
  auVar93._4_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar105._4_4_;
  bVar19 = (bool)((byte)(uVar81 >> 2) & 1);
  auVar93._8_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar105._8_4_;
  bVar19 = (bool)((byte)(uVar81 >> 3) & 1);
  auVar93._12_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar105._12_4_;
  auVar97 = vandps_avx(auVar274,auVar104);
  uVar81 = vcmpps_avx512vl(auVar97,auVar270,1);
  bVar19 = (bool)((byte)uVar81 & 1);
  auVar94._0_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar104._0_4_;
  bVar19 = (bool)((byte)(uVar81 >> 1) & 1);
  auVar94._4_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar104._4_4_;
  bVar19 = (bool)((byte)(uVar81 >> 2) & 1);
  auVar94._8_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar104._8_4_;
  bVar19 = (bool)((byte)(uVar81 >> 3) & 1);
  auVar94._12_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar104._12_4_;
  auVar97 = vandps_avx(auVar274,auVar38);
  uVar81 = vcmpps_avx512vl(auVar97,auVar270,1);
  bVar19 = (bool)((byte)uVar81 & 1);
  auVar95._0_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar38._0_4_;
  bVar19 = (bool)((byte)(uVar81 >> 1) & 1);
  auVar95._4_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar38._4_4_;
  bVar19 = (bool)((byte)(uVar81 >> 2) & 1);
  auVar95._8_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar38._8_4_;
  bVar19 = (bool)((byte)(uVar81 >> 3) & 1);
  auVar95._12_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar38._12_4_;
  auVar96 = vrcp14ps_avx512vl(auVar93);
  auVar271._8_4_ = 0x3f800000;
  auVar271._0_8_ = &DAT_3f8000003f800000;
  auVar271._12_4_ = 0x3f800000;
  auVar97 = vfnmadd213ps_fma(auVar93,auVar96,auVar271);
  auVar105 = vfmadd132ps_fma(auVar97,auVar96,auVar96);
  auVar96 = vrcp14ps_avx512vl(auVar94);
  auVar97 = vfnmadd213ps_fma(auVar94,auVar96,auVar271);
  auVar38 = vfmadd132ps_fma(auVar97,auVar96,auVar96);
  auVar96 = vrcp14ps_avx512vl(auVar95);
  auVar97 = vfnmadd213ps_fma(auVar95,auVar96,auVar271);
  auVar37 = vfmadd132ps_fma(auVar97,auVar96,auVar96);
  fVar161 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar90 + 0x16)) *
            *(float *)(prim + lVar90 + 0x1a);
  auVar261._4_4_ = fVar161;
  auVar261._0_4_ = fVar161;
  auVar261._8_4_ = fVar161;
  auVar261._12_4_ = fVar161;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *(ulong *)(prim + uVar92 * 7 + 6);
  auVar97 = vpmovsxwd_avx(auVar97);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar92 * 0xb + 6);
  auVar96 = vpmovsxwd_avx(auVar96);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar284 = vsubps_avx(auVar96,auVar97);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *(ulong *)(prim + uVar92 * 9 + 6);
  auVar96 = vpmovsxwd_avx(auVar99);
  auVar99 = vfmadd213ps_fma(auVar284,auVar261,auVar97);
  auVar97 = vcvtdq2ps_avx(auVar96);
  auVar284._8_8_ = 0;
  auVar284._0_8_ = *(ulong *)(prim + uVar92 * 0xd + 6);
  auVar96 = vpmovsxwd_avx(auVar284);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,auVar97);
  auVar284 = vfmadd213ps_fma(auVar96,auVar261,auVar97);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *(ulong *)(prim + uVar92 * 0x12 + 6);
  auVar97 = vpmovsxwd_avx(auVar100);
  auVar97 = vcvtdq2ps_avx(auVar97);
  uVar81 = (ulong)(uint)((int)(uVar92 * 5) << 2);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar92 * 2 + uVar81 + 6);
  auVar96 = vpmovsxwd_avx(auVar33);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,auVar97);
  auVar100 = vfmadd213ps_fma(auVar96,auVar261,auVar97);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + uVar81 + 6);
  auVar97 = vpmovsxwd_avx(auVar101);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar98._8_8_ = 0;
  auVar98._0_8_ = *(ulong *)(prim + uVar92 * 0x18 + 6);
  auVar96 = vpmovsxwd_avx(auVar98);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,auVar97);
  auVar33 = vfmadd213ps_fma(auVar96,auVar261,auVar97);
  auVar289 = ZEXT1664(auVar33);
  auVar283._8_8_ = 0;
  auVar283._0_8_ = *(ulong *)(prim + uVar92 * 0x1d + 6);
  auVar97 = vpmovsxwd_avx(auVar283);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = *(ulong *)(prim + uVar92 + (ulong)(byte)PVar11 * 0x20 + 6);
  auVar96 = vpmovsxwd_avx(auVar103);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,auVar97);
  auVar101 = vfmadd213ps_fma(auVar96,auVar261,auVar97);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar11 * 0x20 - uVar92) + 6);
  auVar97 = vpmovsxwd_avx(auVar102);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = *(ulong *)(prim + uVar92 * 0x23 + 6);
  auVar96 = vpmovsxwd_avx(auVar104);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,auVar97);
  auVar96 = vfmadd213ps_fma(auVar96,auVar261,auVar97);
  auVar97 = vsubps_avx(auVar99,auVar39);
  auVar262._0_4_ = auVar105._0_4_ * auVar97._0_4_;
  auVar262._4_4_ = auVar105._4_4_ * auVar97._4_4_;
  auVar262._8_4_ = auVar105._8_4_ * auVar97._8_4_;
  auVar262._12_4_ = auVar105._12_4_ * auVar97._12_4_;
  auVar97 = vsubps_avx(auVar284,auVar39);
  auVar214._0_4_ = auVar105._0_4_ * auVar97._0_4_;
  auVar214._4_4_ = auVar105._4_4_ * auVar97._4_4_;
  auVar214._8_4_ = auVar105._8_4_ * auVar97._8_4_;
  auVar214._12_4_ = auVar105._12_4_ * auVar97._12_4_;
  auVar97 = vsubps_avx(auVar100,auVar163);
  auVar257._0_4_ = auVar38._0_4_ * auVar97._0_4_;
  auVar257._4_4_ = auVar38._4_4_ * auVar97._4_4_;
  auVar257._8_4_ = auVar38._8_4_ * auVar97._8_4_;
  auVar257._12_4_ = auVar38._12_4_ * auVar97._12_4_;
  auVar97 = vsubps_avx(auVar33,auVar163);
  auVar192._0_4_ = auVar38._0_4_ * auVar97._0_4_;
  auVar192._4_4_ = auVar38._4_4_ * auVar97._4_4_;
  auVar192._8_4_ = auVar38._8_4_ * auVar97._8_4_;
  auVar192._12_4_ = auVar38._12_4_ * auVar97._12_4_;
  auVar97 = vsubps_avx(auVar101,auVar164);
  auVar244._0_4_ = auVar37._0_4_ * auVar97._0_4_;
  auVar244._4_4_ = auVar37._4_4_ * auVar97._4_4_;
  auVar244._8_4_ = auVar37._8_4_ * auVar97._8_4_;
  auVar244._12_4_ = auVar37._12_4_ * auVar97._12_4_;
  auVar97 = vsubps_avx(auVar96,auVar164);
  auVar165._0_4_ = auVar37._0_4_ * auVar97._0_4_;
  auVar165._4_4_ = auVar37._4_4_ * auVar97._4_4_;
  auVar165._8_4_ = auVar37._8_4_ * auVar97._8_4_;
  auVar165._12_4_ = auVar37._12_4_ * auVar97._12_4_;
  auVar97 = vpminsd_avx(auVar262,auVar214);
  auVar96 = vpminsd_avx(auVar257,auVar192);
  auVar97 = vmaxps_avx(auVar97,auVar96);
  auVar96 = vpminsd_avx(auVar244,auVar165);
  uVar10 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar105._4_4_ = uVar10;
  auVar105._0_4_ = uVar10;
  auVar105._8_4_ = uVar10;
  auVar105._12_4_ = uVar10;
  auVar96 = vmaxps_avx512vl(auVar96,auVar105);
  auVar97 = vmaxps_avx(auVar97,auVar96);
  auVar38._8_4_ = 0x3f7ffffa;
  auVar38._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar38._12_4_ = 0x3f7ffffa;
  local_7f0 = vmulps_avx512vl(auVar97,auVar38);
  auVar97 = vpmaxsd_avx(auVar262,auVar214);
  auVar96 = vpmaxsd_avx(auVar257,auVar192);
  auVar97 = vminps_avx(auVar97,auVar96);
  auVar96 = vpmaxsd_avx(auVar244,auVar165);
  uVar10 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar37._4_4_ = uVar10;
  auVar37._0_4_ = uVar10;
  auVar37._8_4_ = uVar10;
  auVar37._12_4_ = uVar10;
  auVar96 = vminps_avx512vl(auVar96,auVar37);
  auVar97 = vminps_avx(auVar97,auVar96);
  auVar39._8_4_ = 0x3f800003;
  auVar39._0_8_ = 0x3f8000033f800003;
  auVar39._12_4_ = 0x3f800003;
  auVar97 = vmulps_avx512vl(auVar97,auVar39);
  auVar96 = vpbroadcastd_avx512vl();
  uVar34 = vcmpps_avx512vl(local_7f0,auVar97,2);
  local_928 = vpcmpgtd_avx512vl(auVar96,_DAT_01ff0cf0);
  local_928 = ((byte)uVar34 & 0xf) & local_928;
  if ((char)local_928 == '\0') {
    return;
  }
  local_ad8 = (undefined1 (*) [32])local_240;
  auVar184 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_4c0 = vmovdqa64_avx512f(auVar184);
  auVar184 = ZEXT3264(CONCAT428(0x7fffffff,
                                CONCAT424(0x7fffffff,
                                          CONCAT420(0x7fffffff,
                                                    CONCAT416(0x7fffffff,
                                                              CONCAT412(0x7fffffff,
                                                                        CONCAT48(0x7fffffff,
                                                                                 0x7fffffff7fffffff)
                                                                       ))))));
  auVar277 = ZEXT3264(_DAT_02020f20);
  auVar106 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar300 = ZEXT3264(auVar106);
  local_ad0 = prim;
LAB_01c3e4aa:
  lVar90 = 0;
  for (uVar81 = local_928; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
    lVar90 = lVar90 + 1;
  }
  uVar83 = *(uint *)(prim + 2);
  uVar12 = *(uint *)(prim + lVar90 * 4 + 6);
  pGVar13 = (context->scene->geometries).items[uVar83].ptr;
  uVar81 = (ulong)*(uint *)(*(long *)&pGVar13->field_0x58 +
                           (ulong)uVar12 *
                           pGVar13[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar161 = (pGVar13->time_range).lower;
  fVar161 = pGVar13->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x1c0) - fVar161) / ((pGVar13->time_range).upper - fVar161));
  auVar97 = vroundss_avx(ZEXT416((uint)fVar161),ZEXT416((uint)fVar161),9);
  auVar97 = vminss_avx(auVar97,ZEXT416((uint)(pGVar13->fnumTimeSegments + -1.0)));
  auVar97 = vmaxss_avx(ZEXT816(0) << 0x20,auVar97);
  fVar161 = fVar161 - auVar97._0_4_;
  _Var14 = pGVar13[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar88 = (long)(int)auVar97._0_4_ * 0x38;
  lVar90 = *(long *)(_Var14 + 0x10 + lVar88);
  lVar15 = *(long *)(_Var14 + 0x38 + lVar88);
  lVar16 = *(long *)(_Var14 + 0x48 + lVar88);
  pfVar9 = (float *)(lVar15 + uVar81 * lVar16);
  auVar215._0_4_ = fVar161 * *pfVar9;
  auVar215._4_4_ = fVar161 * pfVar9[1];
  auVar215._8_4_ = fVar161 * pfVar9[2];
  auVar215._12_4_ = fVar161 * pfVar9[3];
  pfVar9 = (float *)(lVar15 + (uVar81 + 1) * lVar16);
  auVar234._0_4_ = fVar161 * *pfVar9;
  auVar234._4_4_ = fVar161 * pfVar9[1];
  auVar234._8_4_ = fVar161 * pfVar9[2];
  auVar234._12_4_ = fVar161 * pfVar9[3];
  pfVar9 = (float *)(lVar15 + (uVar81 + 2) * lVar16);
  auVar245._0_4_ = fVar161 * *pfVar9;
  auVar245._4_4_ = fVar161 * pfVar9[1];
  auVar245._8_4_ = fVar161 * pfVar9[2];
  auVar245._12_4_ = fVar161 * pfVar9[3];
  pfVar9 = (float *)(lVar15 + lVar16 * (uVar81 + 3));
  auVar193._0_4_ = fVar161 * *pfVar9;
  auVar193._4_4_ = fVar161 * pfVar9[1];
  auVar193._8_4_ = fVar161 * pfVar9[2];
  auVar193._12_4_ = fVar161 * pfVar9[3];
  lVar15 = *(long *)(_Var14 + lVar88);
  fVar161 = 1.0 - fVar161;
  auVar166._4_4_ = fVar161;
  auVar166._0_4_ = fVar161;
  auVar166._8_4_ = fVar161;
  auVar166._12_4_ = fVar161;
  auVar99 = vfmadd231ps_fma(auVar215,auVar166,*(undefined1 (*) [16])(lVar15 + lVar90 * uVar81));
  auVar284 = vfmadd231ps_fma(auVar234,auVar166,
                             *(undefined1 (*) [16])(lVar15 + lVar90 * (uVar81 + 1)));
  auVar100 = vfmadd231ps_fma(auVar245,auVar166,
                             *(undefined1 (*) [16])(lVar15 + lVar90 * (uVar81 + 2)));
  auVar33 = vfmadd231ps_fma(auVar193,auVar166,*(undefined1 (*) [16])(lVar15 + lVar90 * (uVar81 + 3))
                           );
  auVar97 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar96 = vinsertps_avx(auVar97,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  local_aa0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x100)));
  auVar301 = ZEXT3264(local_aa0);
  auVar106 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x140)));
  auVar97 = vunpcklps_avx512vl(local_aa0._0_16_,auVar106._0_16_);
  local_ac0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x180)));
  auVar299 = ZEXT3264(local_ac0);
  auVar103 = local_ac0._0_16_;
  local_a30 = vinsertps_avx512f(auVar97,auVar103,0x28);
  auVar292 = ZEXT1664(local_a30);
  auVar258._0_4_ = auVar99._0_4_ + auVar284._0_4_ + auVar100._0_4_ + auVar33._0_4_;
  auVar258._4_4_ = auVar99._4_4_ + auVar284._4_4_ + auVar100._4_4_ + auVar33._4_4_;
  auVar258._8_4_ = auVar99._8_4_ + auVar284._8_4_ + auVar100._8_4_ + auVar33._8_4_;
  auVar258._12_4_ = auVar99._12_4_ + auVar284._12_4_ + auVar100._12_4_ + auVar33._12_4_;
  auVar40._8_4_ = 0x3e800000;
  auVar40._0_8_ = 0x3e8000003e800000;
  auVar40._12_4_ = 0x3e800000;
  auVar97 = vmulps_avx512vl(auVar258,auVar40);
  auVar97 = vsubps_avx(auVar97,auVar96);
  auVar97 = vdpps_avx(auVar97,local_a30,0x7f);
  fVar161 = *(float *)(ray + k * 4 + 0xc0);
  auVar297 = ZEXT464((uint)fVar161);
  local_a40 = vdpps_avx(local_a30,local_a30,0x7f);
  auVar283 = ZEXT816(0) << 0x40;
  auVar285 = ZEXT1664(auVar283);
  auVar263._4_12_ = ZEXT812(0) << 0x20;
  auVar263._0_4_ = local_a40._0_4_;
  auVar98 = vrcp14ss_avx512f(auVar283,auVar263);
  auVar101 = vfnmadd213ss_fma(auVar98,local_a40,ZEXT416(0x40000000));
  local_740 = auVar97._0_4_ * auVar98._0_4_ * auVar101._0_4_;
  auVar259 = ZEXT464((uint)local_740);
  auVar264._4_4_ = local_740;
  auVar264._0_4_ = local_740;
  auVar264._8_4_ = local_740;
  auVar264._12_4_ = local_740;
  fStack_8f0 = local_740;
  _local_900 = auVar264;
  fStack_8ec = local_740;
  fStack_8e8 = local_740;
  fStack_8e4 = local_740;
  auVar97 = vfmadd231ps_fma(auVar96,local_a30,auVar264);
  auVar97 = vblendps_avx(auVar97,auVar283,8);
  auVar96 = vsubps_avx(auVar99,auVar97);
  auVar99 = vsubps_avx(auVar100,auVar97);
  auVar284 = vsubps_avx(auVar284,auVar97);
  auVar97 = vsubps_avx(auVar33,auVar97);
  local_520 = auVar96._0_4_;
  uStack_51c = local_520;
  uStack_518 = local_520;
  uStack_514 = local_520;
  uStack_510 = local_520;
  uStack_50c = local_520;
  uStack_508 = local_520;
  uStack_504 = local_520;
  auVar108._8_4_ = 1;
  auVar108._0_8_ = 0x100000001;
  auVar108._12_4_ = 1;
  auVar108._16_4_ = 1;
  auVar108._20_4_ = 1;
  auVar108._24_4_ = 1;
  auVar108._28_4_ = 1;
  local_9c0 = ZEXT1632(auVar96);
  local_540 = vpermps_avx2(auVar108,local_9c0);
  auVar107._8_4_ = 2;
  auVar107._0_8_ = 0x200000002;
  auVar107._12_4_ = 2;
  auVar107._16_4_ = 2;
  auVar107._20_4_ = 2;
  auVar107._24_4_ = 2;
  auVar107._28_4_ = 2;
  local_560 = vpermps_avx2(auVar107,local_9c0);
  auVar109._8_4_ = 3;
  auVar109._0_8_ = 0x300000003;
  auVar109._12_4_ = 3;
  auVar109._16_4_ = 3;
  auVar109._20_4_ = 3;
  auVar109._24_4_ = 3;
  auVar109._28_4_ = 3;
  local_580 = vpermps_avx2(auVar109,local_9c0);
  local_5a0 = auVar284._0_4_;
  uStack_59c = local_5a0;
  uStack_598 = local_5a0;
  uStack_594 = local_5a0;
  uStack_590 = local_5a0;
  uStack_58c = local_5a0;
  uStack_588 = local_5a0;
  uStack_584 = local_5a0;
  local_a00 = ZEXT1632(auVar284);
  local_5c0 = vpermps_avx2(auVar108,local_a00);
  local_5e0 = vpermps_avx2(auVar107,local_a00);
  local_600 = vpermps_avx2(auVar109,local_a00);
  local_620 = auVar99._0_4_;
  uStack_61c = local_620;
  uStack_618 = local_620;
  uStack_614 = local_620;
  uStack_610 = local_620;
  uStack_60c = local_620;
  uStack_608 = local_620;
  uStack_604 = local_620;
  local_9e0 = ZEXT1632(auVar99);
  local_640 = vpermps_avx2(auVar108,local_9e0);
  local_660 = vpermps_avx2(auVar107,local_9e0);
  local_680 = vpermps_avx2(auVar109,local_9e0);
  local_6a0 = auVar97._0_4_;
  uStack_69c = local_6a0;
  uStack_698 = local_6a0;
  uStack_694 = local_6a0;
  uStack_690 = local_6a0;
  uStack_68c = local_6a0;
  uStack_688 = local_6a0;
  uStack_684 = local_6a0;
  _local_a20 = ZEXT1632(auVar97);
  local_6c0 = vpermps_avx2(auVar108,_local_a20);
  local_6e0 = vpermps_avx2(auVar107,_local_a20);
  auVar107 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  _local_700 = vpermps_avx2(auVar109,_local_a20);
  auVar97 = vmulss_avx512f(auVar103,auVar103);
  auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar97),auVar106,auVar106);
  auVar108 = vfmadd231ps_avx512vl(auVar108,local_aa0,local_aa0);
  local_720._0_4_ = auVar108._0_4_;
  local_720._4_4_ = local_720._0_4_;
  local_720._8_4_ = local_720._0_4_;
  local_720._12_4_ = local_720._0_4_;
  local_720._16_4_ = local_720._0_4_;
  local_720._20_4_ = local_720._0_4_;
  local_720._24_4_ = local_720._0_4_;
  local_720._28_4_ = local_720._0_4_;
  local_7c0 = vandps_avx(auVar184._0_32_,local_720);
  local_990 = ZEXT416((uint)local_740);
  local_740 = fVar161 - local_740;
  fStack_73c = local_740;
  fStack_738 = local_740;
  fStack_734 = local_740;
  fStack_730 = local_740;
  fStack_72c = local_740;
  fStack_728 = local_740;
  fStack_724 = local_740;
  auVar149 = vpbroadcastd_avx512f();
  local_440 = vmovdqa64_avx512f(auVar149);
  uVar81 = 0;
  local_ac8 = 1;
  auVar149 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar149);
  auVar97 = vsqrtss_avx(local_a40,local_a40);
  auVar96 = vsqrtss_avx(local_a40,local_a40);
  auVar228 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar108 = auVar149._32_32_;
  do {
    local_af0 = auVar228._0_16_;
    auVar99 = vmovshdup_avx(local_af0);
    fVar276 = auVar228._0_4_;
    fVar290 = auVar99._0_4_ - fVar276;
    fVar268 = fVar290 * 0.04761905;
    auVar250._4_4_ = fVar276;
    auVar250._0_4_ = fVar276;
    auVar250._8_4_ = fVar276;
    auVar250._12_4_ = fVar276;
    auVar250._16_4_ = fVar276;
    auVar250._20_4_ = fVar276;
    auVar250._24_4_ = fVar276;
    auVar250._28_4_ = fVar276;
    local_a60._4_4_ = fVar290;
    local_a60._0_4_ = fVar290;
    local_a60._8_4_ = fVar290;
    local_a60._12_4_ = fVar290;
    local_a60._16_4_ = fVar290;
    local_a60._20_4_ = fVar290;
    local_a60._24_4_ = fVar290;
    local_a60._28_4_ = fVar290;
    auVar99 = vfmadd231ps_fma(auVar250,local_a60,auVar277._0_32_);
    auVar109 = vsubps_avx512vl(auVar300._0_32_,ZEXT1632(auVar99));
    fVar276 = auVar109._0_4_;
    fVar279 = auVar109._4_4_;
    fVar266 = auVar109._8_4_;
    fVar281 = auVar109._12_4_;
    fVar269 = auVar109._16_4_;
    fVar254 = auVar109._20_4_;
    fVar282 = auVar109._24_4_;
    fVar162 = fVar276 * fVar276 * fVar276;
    fVar185 = fVar279 * fVar279 * fVar279;
    fVar186 = fVar266 * fVar266 * fVar266;
    fVar187 = fVar281 * fVar281 * fVar281;
    fVar188 = fVar269 * fVar269 * fVar269;
    fVar189 = fVar254 * fVar254 * fVar254;
    fVar190 = fVar282 * fVar282 * fVar282;
    fVar278 = auVar99._0_4_;
    fVar280 = auVar99._4_4_;
    fVar267 = auVar99._8_4_;
    fVar253 = auVar99._12_4_;
    fVar212 = fVar278 * fVar278 * fVar278;
    fVar229 = fVar280 * fVar280 * fVar280;
    fVar230 = fVar267 * fVar267 * fVar267;
    fVar231 = fVar253 * fVar253 * fVar253;
    auVar300._0_4_ = fVar278 * fVar276;
    auVar300._4_4_ = fVar280 * fVar279;
    auVar300._8_4_ = fVar267 * fVar266;
    auVar300._12_4_ = fVar253 * fVar281;
    auVar300._16_4_ = fVar269 * 0.0;
    auVar300._20_4_ = fVar254 * 0.0;
    auVar300._28_36_ = auVar285._28_36_;
    auVar300._24_4_ = fVar282 * 0.0;
    fVar290 = auVar289._28_4_ + auVar297._28_4_ + fVar290;
    fVar260 = fVar290 + auVar292._28_4_ + auVar259._28_4_;
    auVar114._4_4_ = fVar185 * 0.16666667;
    auVar114._0_4_ = fVar162 * 0.16666667;
    auVar114._8_4_ = fVar186 * 0.16666667;
    auVar114._12_4_ = fVar187 * 0.16666667;
    auVar114._16_4_ = fVar188 * 0.16666667;
    auVar114._20_4_ = fVar189 * 0.16666667;
    auVar114._24_4_ = fVar190 * 0.16666667;
    auVar114._28_4_ = fVar290;
    auVar115._4_4_ =
         (auVar300._4_4_ * fVar279 * 12.0 + auVar300._4_4_ * fVar280 * 6.0 + fVar229 + fVar185 * 4.0
         ) * 0.16666667;
    auVar115._0_4_ =
         (auVar300._0_4_ * fVar276 * 12.0 + auVar300._0_4_ * fVar278 * 6.0 + fVar212 + fVar162 * 4.0
         ) * 0.16666667;
    auVar115._8_4_ =
         (auVar300._8_4_ * fVar266 * 12.0 + auVar300._8_4_ * fVar267 * 6.0 + fVar230 + fVar186 * 4.0
         ) * 0.16666667;
    auVar115._12_4_ =
         (auVar300._12_4_ * fVar281 * 12.0 + auVar300._12_4_ * fVar253 * 6.0 +
         fVar231 + fVar187 * 4.0) * 0.16666667;
    auVar115._16_4_ =
         (auVar300._16_4_ * fVar269 * 12.0 + auVar300._16_4_ * 0.0 * 6.0 + fVar188 * 4.0 + 0.0) *
         0.16666667;
    auVar115._20_4_ =
         (auVar300._20_4_ * fVar254 * 12.0 + auVar300._20_4_ * 0.0 * 6.0 + fVar189 * 4.0 + 0.0) *
         0.16666667;
    auVar115._24_4_ =
         (auVar300._24_4_ * fVar282 * 12.0 + auVar300._24_4_ * 0.0 * 6.0 + fVar190 * 4.0 + 0.0) *
         0.16666667;
    auVar115._28_4_ = auVar292._28_4_;
    auVar116._4_4_ =
         (fVar229 * 4.0 + fVar185 + auVar300._4_4_ * fVar280 * 12.0 + auVar300._4_4_ * fVar279 * 6.0
         ) * 0.16666667;
    auVar116._0_4_ =
         (fVar212 * 4.0 + fVar162 + auVar300._0_4_ * fVar278 * 12.0 + auVar300._0_4_ * fVar276 * 6.0
         ) * 0.16666667;
    auVar116._8_4_ =
         (fVar230 * 4.0 + fVar186 + auVar300._8_4_ * fVar267 * 12.0 + auVar300._8_4_ * fVar266 * 6.0
         ) * 0.16666667;
    auVar116._12_4_ =
         (fVar231 * 4.0 + fVar187 +
         auVar300._12_4_ * fVar253 * 12.0 + auVar300._12_4_ * fVar281 * 6.0) * 0.16666667;
    auVar116._16_4_ =
         (fVar188 + 0.0 + auVar300._16_4_ * 0.0 * 12.0 + auVar300._16_4_ * fVar269 * 6.0) *
         0.16666667;
    auVar116._20_4_ =
         (fVar189 + 0.0 + auVar300._20_4_ * 0.0 * 12.0 + auVar300._20_4_ * fVar254 * 6.0) *
         0.16666667;
    auVar116._24_4_ =
         (fVar190 + 0.0 + auVar300._24_4_ * 0.0 * 12.0 + auVar300._24_4_ * fVar282 * 6.0) *
         0.16666667;
    auVar116._28_4_ = auVar297._28_4_;
    auVar117._28_4_ = fVar260;
    auVar117._0_28_ =
         ZEXT1628(CONCAT412(fVar231 * 0.16666667,
                            CONCAT48(fVar230 * 0.16666667,
                                     CONCAT44(fVar229 * 0.16666667,fVar212 * 0.16666667))));
    auVar226._4_4_ = uStack_69c;
    auVar226._0_4_ = local_6a0;
    auVar226._8_4_ = uStack_698;
    auVar226._12_4_ = uStack_694;
    auVar226._16_4_ = uStack_690;
    auVar226._20_4_ = uStack_68c;
    auVar226._24_4_ = uStack_688;
    auVar226._28_4_ = uStack_684;
    auVar110 = vmulps_avx512vl(auVar226,auVar117);
    auVar111 = vmulps_avx512vl(local_6c0,auVar117);
    auVar112 = vmulps_avx512vl(local_6e0,auVar117);
    auVar118._4_4_ = (float)local_700._4_4_ * fVar229 * 0.16666667;
    auVar118._0_4_ = (float)local_700._0_4_ * fVar212 * 0.16666667;
    auVar118._8_4_ = fStack_6f8 * fVar230 * 0.16666667;
    auVar118._12_4_ = fStack_6f4 * fVar231 * 0.16666667;
    auVar118._16_4_ = fStack_6f0 * 0.0;
    auVar118._20_4_ = fStack_6ec * 0.0;
    auVar118._24_4_ = fStack_6e8 * 0.0;
    auVar118._28_4_ = fVar260;
    auVar131._4_4_ = uStack_61c;
    auVar131._0_4_ = local_620;
    auVar131._8_4_ = uStack_618;
    auVar131._12_4_ = uStack_614;
    auVar131._16_4_ = uStack_610;
    auVar131._20_4_ = uStack_60c;
    auVar131._24_4_ = uStack_608;
    auVar131._28_4_ = uStack_604;
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar116,auVar131);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar116,local_640);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar116,local_660);
    auVar113 = vfmadd231ps_avx512vl(auVar118,local_680,auVar116);
    auVar132._4_4_ = uStack_59c;
    auVar132._0_4_ = local_5a0;
    auVar132._8_4_ = uStack_598;
    auVar132._12_4_ = uStack_594;
    auVar132._16_4_ = uStack_590;
    auVar132._20_4_ = uStack_58c;
    auVar132._24_4_ = uStack_588;
    auVar132._28_4_ = uStack_584;
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar115,auVar132);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar115,local_5c0);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar115,local_5e0);
    auVar113 = vfmadd231ps_avx512vl(auVar113,local_600,auVar115);
    auVar136._4_4_ = uStack_51c;
    auVar136._0_4_ = local_520;
    auVar136._8_4_ = uStack_518;
    auVar136._12_4_ = uStack_514;
    auVar136._16_4_ = uStack_510;
    auVar136._20_4_ = uStack_50c;
    auVar136._24_4_ = uStack_508;
    auVar136._28_4_ = uStack_504;
    auVar284 = vfmadd231ps_fma(auVar110,auVar114,auVar136);
    auVar100 = vfmadd231ps_fma(auVar111,auVar114,local_540);
    auVar33 = vfmadd231ps_fma(auVar112,auVar114,local_560);
    auVar114 = vfmadd231ps_avx512vl(auVar113,local_580,auVar114);
    auVar111 = vxorps_avx512vl(auVar109,auVar107);
    auVar112 = vxorps_avx512vl(ZEXT1632(auVar99),auVar107);
    auVar137._0_4_ = auVar112._0_4_ * fVar278;
    auVar137._4_4_ = auVar112._4_4_ * fVar280;
    auVar137._8_4_ = auVar112._8_4_ * fVar267;
    auVar137._12_4_ = auVar112._12_4_ * fVar253;
    auVar137._16_4_ = auVar112._16_4_ * 0.0;
    auVar137._20_4_ = auVar112._20_4_ * 0.0;
    auVar137._24_4_ = auVar112._24_4_ * 0.0;
    auVar137._28_4_ = 0;
    auVar110._8_4_ = 0x40800000;
    auVar110._0_8_ = 0x4080000040800000;
    auVar110._12_4_ = 0x40800000;
    auVar110._16_4_ = 0x40800000;
    auVar110._20_4_ = 0x40800000;
    auVar110._24_4_ = 0x40800000;
    auVar110._28_4_ = 0x40800000;
    auVar110 = vmulps_avx512vl(auVar300._0_32_,auVar110);
    auVar107 = vsubps_avx(auVar137,auVar110);
    auVar119._4_4_ = auVar111._4_4_ * fVar279 * 0.5;
    auVar119._0_4_ = auVar111._0_4_ * fVar276 * 0.5;
    auVar119._8_4_ = auVar111._8_4_ * fVar266 * 0.5;
    auVar119._12_4_ = auVar111._12_4_ * fVar281 * 0.5;
    auVar119._16_4_ = auVar111._16_4_ * fVar269 * 0.5;
    auVar119._20_4_ = auVar111._20_4_ * fVar254 * 0.5;
    auVar119._24_4_ = auVar111._24_4_ * fVar282 * 0.5;
    auVar119._28_4_ = auVar109._28_4_;
    auVar120._4_4_ = auVar107._4_4_ * 0.5;
    auVar120._0_4_ = auVar107._0_4_ * 0.5;
    auVar120._8_4_ = auVar107._8_4_ * 0.5;
    auVar120._12_4_ = auVar107._12_4_ * 0.5;
    auVar120._16_4_ = auVar107._16_4_ * 0.5;
    auVar120._20_4_ = auVar107._20_4_ * 0.5;
    auVar120._24_4_ = auVar107._24_4_ * 0.5;
    auVar120._28_4_ = auVar107._28_4_;
    auVar124._4_4_ = (fVar279 * fVar279 + auVar110._4_4_) * 0.5;
    auVar124._0_4_ = (fVar276 * fVar276 + auVar110._0_4_) * 0.5;
    auVar124._8_4_ = (fVar266 * fVar266 + auVar110._8_4_) * 0.5;
    auVar124._12_4_ = (fVar281 * fVar281 + auVar110._12_4_) * 0.5;
    auVar124._16_4_ = (fVar269 * fVar269 + auVar110._16_4_) * 0.5;
    auVar124._20_4_ = (fVar254 * fVar254 + auVar110._20_4_) * 0.5;
    auVar124._24_4_ = (fVar282 * fVar282 + auVar110._24_4_) * 0.5;
    auVar124._28_4_ = auVar184._28_4_ + auVar110._28_4_;
    fVar276 = fVar278 * fVar278 * 0.5;
    fVar278 = fVar280 * fVar280 * 0.5;
    fVar279 = fVar267 * fVar267 * 0.5;
    fVar280 = fVar253 * fVar253 * 0.5;
    auVar125._28_4_ = auVar277._28_4_;
    auVar125._0_28_ = ZEXT1628(CONCAT412(fVar280,CONCAT48(fVar279,CONCAT44(fVar278,fVar276))));
    auVar107 = vmulps_avx512vl(auVar226,auVar125);
    auVar109 = vmulps_avx512vl(local_6c0,auVar125);
    auVar110 = vmulps_avx512vl(local_6e0,auVar125);
    auVar126._4_4_ = fVar278 * (float)local_700._4_4_;
    auVar126._0_4_ = fVar276 * (float)local_700._0_4_;
    auVar126._8_4_ = fVar279 * fStack_6f8;
    auVar126._12_4_ = fVar280 * fStack_6f4;
    auVar126._16_4_ = fStack_6f0 * 0.0;
    auVar126._20_4_ = fStack_6ec * 0.0;
    auVar126._24_4_ = fStack_6e8 * 0.0;
    auVar126._28_4_ = auVar277._28_4_;
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar124,auVar131);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar124,local_640);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar124,local_660);
    auVar111 = vfmadd231ps_avx512vl(auVar126,local_680,auVar124);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar120,auVar132);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar120,local_5c0);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar120,local_5e0);
    auVar111 = vfmadd231ps_avx512vl(auVar111,local_600,auVar120);
    auVar99 = vfmadd231ps_fma(auVar107,auVar119,auVar136);
    auVar101 = vfmadd231ps_fma(auVar109,auVar119,local_540);
    auVar98 = vfmadd231ps_fma(auVar110,auVar119,local_560);
    auVar107 = vfmadd231ps_avx512vl(auVar111,local_580,auVar119);
    auVar135._4_4_ = auVar99._4_4_ * fVar268;
    auVar135._0_4_ = auVar99._0_4_ * fVar268;
    auVar135._8_4_ = auVar99._8_4_ * fVar268;
    auVar135._12_4_ = auVar99._12_4_ * fVar268;
    auVar135._16_4_ = fVar268 * 0.0;
    auVar135._20_4_ = fVar268 * 0.0;
    auVar135._24_4_ = fVar268 * 0.0;
    auVar135._28_4_ = auVar112._28_4_;
    auVar289 = ZEXT3264(auVar135);
    auVar139._0_4_ = auVar101._0_4_ * fVar268;
    auVar139._4_4_ = auVar101._4_4_ * fVar268;
    auVar139._8_4_ = auVar101._8_4_ * fVar268;
    auVar139._12_4_ = auVar101._12_4_ * fVar268;
    auVar139._16_4_ = fVar268 * 0.0;
    auVar139._20_4_ = fVar268 * 0.0;
    auVar139._24_4_ = fVar268 * 0.0;
    auVar139._28_4_ = 0;
    auVar292 = ZEXT3264(auVar139);
    auVar295._0_4_ = auVar98._0_4_ * fVar268;
    auVar295._4_4_ = auVar98._4_4_ * fVar268;
    auVar295._8_4_ = auVar98._8_4_ * fVar268;
    auVar295._12_4_ = auVar98._12_4_ * fVar268;
    auVar295._16_4_ = fVar268 * 0.0;
    auVar295._20_4_ = fVar268 * 0.0;
    auVar295._24_4_ = fVar268 * 0.0;
    auVar295._28_4_ = 0;
    auVar297 = ZEXT3264(auVar295);
    fVar276 = auVar107._0_4_ * fVar268;
    fVar278 = auVar107._4_4_ * fVar268;
    auVar127._4_4_ = fVar278;
    auVar127._0_4_ = fVar276;
    fVar279 = auVar107._8_4_ * fVar268;
    auVar127._8_4_ = fVar279;
    fVar280 = auVar107._12_4_ * fVar268;
    auVar127._12_4_ = fVar280;
    fVar266 = auVar107._16_4_ * fVar268;
    auVar127._16_4_ = fVar266;
    fVar267 = auVar107._20_4_ * fVar268;
    auVar127._20_4_ = fVar267;
    fVar268 = auVar107._24_4_ * fVar268;
    auVar127._24_4_ = fVar268;
    auVar127._28_4_ = fStack_6e4;
    auVar99 = vxorps_avx512vl(local_6e0._0_16_,local_6e0._0_16_);
    auVar115 = vpermt2ps_avx512vl(ZEXT1632(auVar284),_DAT_0205fd20,ZEXT1632(auVar99));
    auVar116 = vpermt2ps_avx512vl(ZEXT1632(auVar100),_DAT_0205fd20,ZEXT1632(auVar99));
    auVar110 = ZEXT1632(auVar99);
    auVar117 = vpermt2ps_avx512vl(ZEXT1632(auVar33),_DAT_0205fd20,auVar110);
    auVar285 = ZEXT3264(auVar117);
    auVar138._0_4_ = fVar276 + auVar114._0_4_;
    auVar138._4_4_ = fVar278 + auVar114._4_4_;
    auVar138._8_4_ = fVar279 + auVar114._8_4_;
    auVar138._12_4_ = fVar280 + auVar114._12_4_;
    auVar138._16_4_ = fVar266 + auVar114._16_4_;
    auVar138._20_4_ = fVar267 + auVar114._20_4_;
    auVar138._24_4_ = fVar268 + auVar114._24_4_;
    auVar138._28_4_ = fStack_6e4 + auVar114._28_4_;
    auVar107 = vmaxps_avx(auVar114,auVar138);
    auVar109 = vminps_avx(auVar114,auVar138);
    auVar112 = vpermt2ps_avx512vl(auVar114,_DAT_0205fd20,auVar110);
    auVar118 = vpermt2ps_avx512vl(auVar135,_DAT_0205fd20,auVar110);
    auVar119 = vpermt2ps_avx512vl(auVar139,_DAT_0205fd20,auVar110);
    auVar126 = ZEXT1632(auVar99);
    auVar120 = vpermt2ps_avx512vl(auVar295,_DAT_0205fd20,auVar126);
    auVar259 = ZEXT3264(auVar120);
    auVar110 = vpermt2ps_avx512vl(auVar127,_DAT_0205fd20,auVar126);
    auVar113 = vsubps_avx512vl(auVar112,auVar110);
    auVar110 = vsubps_avx(auVar115,ZEXT1632(auVar284));
    auVar114 = vsubps_avx(auVar116,ZEXT1632(auVar100));
    local_8e0 = vsubps_avx512vl(auVar117,ZEXT1632(auVar33));
    auVar111 = vmulps_avx512vl(auVar114,auVar295);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar139,local_8e0);
    auVar121 = vmulps_avx512vl(local_8e0,auVar135);
    auVar121 = vfmsub231ps_avx512vl(auVar121,auVar295,auVar110);
    auVar122 = vmulps_avx512vl(auVar110,auVar139);
    auVar122 = vfmsub231ps_avx512vl(auVar122,auVar135,auVar114);
    auVar122 = vmulps_avx512vl(auVar122,auVar122);
    auVar121 = vfmadd231ps_avx512vl(auVar122,auVar121,auVar121);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar111,auVar111);
    auVar111 = vmulps_avx512vl(local_8e0,local_8e0);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar114,auVar114);
    auVar122 = vfmadd231ps_avx512vl(auVar111,auVar110,auVar110);
    auVar123 = vrcp14ps_avx512vl(auVar122);
    auVar111._8_4_ = 0x3f800000;
    auVar111._0_8_ = &DAT_3f8000003f800000;
    auVar111._12_4_ = 0x3f800000;
    auVar111._16_4_ = 0x3f800000;
    auVar111._20_4_ = 0x3f800000;
    auVar111._24_4_ = 0x3f800000;
    auVar111._28_4_ = 0x3f800000;
    auVar111 = vfnmadd213ps_avx512vl(auVar123,auVar122,auVar111);
    auVar111 = vfmadd132ps_avx512vl(auVar111,auVar123,auVar123);
    auVar121 = vmulps_avx512vl(auVar121,auVar111);
    auVar123 = vmulps_avx512vl(auVar114,auVar120);
    auVar123 = vfmsub231ps_avx512vl(auVar123,auVar119,local_8e0);
    auVar124 = vmulps_avx512vl(local_8e0,auVar118);
    auVar124 = vfmsub231ps_avx512vl(auVar124,auVar120,auVar110);
    auVar125 = vmulps_avx512vl(auVar110,auVar119);
    auVar125 = vfmsub231ps_avx512vl(auVar125,auVar118,auVar114);
    auVar125 = vmulps_avx512vl(auVar125,auVar125);
    auVar124 = vfmadd231ps_avx512vl(auVar125,auVar124,auVar124);
    auVar123 = vfmadd231ps_avx512vl(auVar124,auVar123,auVar123);
    auVar111 = vmulps_avx512vl(auVar123,auVar111);
    auVar111 = vmaxps_avx512vl(auVar121,auVar111);
    auVar111 = vsqrtps_avx512vl(auVar111);
    auVar121 = vmaxps_avx512vl(auVar113,auVar112);
    auVar107 = vmaxps_avx512vl(auVar107,auVar121);
    auVar121 = vaddps_avx512vl(auVar111,auVar107);
    auVar107 = vminps_avx512vl(auVar113,auVar112);
    auVar107 = vminps_avx(auVar109,auVar107);
    auVar107 = vsubps_avx512vl(auVar107,auVar111);
    auVar112._8_4_ = 0x3f800002;
    auVar112._0_8_ = 0x3f8000023f800002;
    auVar112._12_4_ = 0x3f800002;
    auVar112._16_4_ = 0x3f800002;
    auVar112._20_4_ = 0x3f800002;
    auVar112._24_4_ = 0x3f800002;
    auVar112._28_4_ = 0x3f800002;
    auVar109 = vmulps_avx512vl(auVar121,auVar112);
    auVar113._8_4_ = 0x3f7ffffc;
    auVar113._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar113._12_4_ = 0x3f7ffffc;
    auVar113._16_4_ = 0x3f7ffffc;
    auVar113._20_4_ = 0x3f7ffffc;
    auVar113._24_4_ = 0x3f7ffffc;
    auVar113._28_4_ = 0x3f7ffffc;
    auVar111 = vmulps_avx512vl(auVar107,auVar113);
    auVar129._4_4_ = auVar109._4_4_ * auVar109._4_4_;
    auVar129._0_4_ = auVar109._0_4_ * auVar109._0_4_;
    auVar129._8_4_ = auVar109._8_4_ * auVar109._8_4_;
    auVar129._12_4_ = auVar109._12_4_ * auVar109._12_4_;
    auVar129._16_4_ = auVar109._16_4_ * auVar109._16_4_;
    auVar129._20_4_ = auVar109._20_4_ * auVar109._20_4_;
    auVar129._24_4_ = auVar109._24_4_ * auVar109._24_4_;
    auVar129._28_4_ = auVar107._28_4_;
    auVar107 = vrsqrt14ps_avx512vl(auVar122);
    auVar121._8_4_ = 0xbf000000;
    auVar121._0_8_ = 0xbf000000bf000000;
    auVar121._12_4_ = 0xbf000000;
    auVar121._16_4_ = 0xbf000000;
    auVar121._20_4_ = 0xbf000000;
    auVar121._24_4_ = 0xbf000000;
    auVar121._28_4_ = 0xbf000000;
    auVar109 = vmulps_avx512vl(auVar122,auVar121);
    auVar128._4_4_ = auVar107._4_4_ * auVar109._4_4_;
    auVar128._0_4_ = auVar107._0_4_ * auVar109._0_4_;
    auVar128._8_4_ = auVar107._8_4_ * auVar109._8_4_;
    auVar128._12_4_ = auVar107._12_4_ * auVar109._12_4_;
    auVar128._16_4_ = auVar107._16_4_ * auVar109._16_4_;
    auVar128._20_4_ = auVar107._20_4_ * auVar109._20_4_;
    auVar128._24_4_ = auVar107._24_4_ * auVar109._24_4_;
    auVar128._28_4_ = auVar109._28_4_;
    auVar109 = vmulps_avx512vl(auVar107,auVar107);
    auVar109 = vmulps_avx512vl(auVar109,auVar128);
    auVar122._8_4_ = 0x3fc00000;
    auVar122._0_8_ = 0x3fc000003fc00000;
    auVar122._12_4_ = 0x3fc00000;
    auVar122._16_4_ = 0x3fc00000;
    auVar122._20_4_ = 0x3fc00000;
    auVar122._24_4_ = 0x3fc00000;
    auVar122._28_4_ = 0x3fc00000;
    auVar112 = vfmadd231ps_avx512vl(auVar109,auVar107,auVar122);
    auVar130._4_4_ = auVar112._4_4_ * auVar110._4_4_;
    auVar130._0_4_ = auVar112._0_4_ * auVar110._0_4_;
    auVar130._8_4_ = auVar112._8_4_ * auVar110._8_4_;
    auVar130._12_4_ = auVar112._12_4_ * auVar110._12_4_;
    auVar130._16_4_ = auVar112._16_4_ * auVar110._16_4_;
    auVar130._20_4_ = auVar112._20_4_ * auVar110._20_4_;
    auVar130._24_4_ = auVar112._24_4_ * auVar110._24_4_;
    auVar130._28_4_ = auVar107._28_4_;
    auVar107 = vmulps_avx512vl(auVar114,auVar112);
    auVar109 = vmulps_avx512vl(local_8e0,auVar112);
    local_b20 = ZEXT1632(auVar284);
    auVar113 = vsubps_avx512vl(auVar126,local_b20);
    auVar226 = ZEXT1632(auVar100);
    auVar121 = vsubps_avx512vl(auVar126,auVar226);
    local_a80 = ZEXT1632(auVar33);
    auVar122 = vsubps_avx512vl(auVar126,local_a80);
    auVar123 = vmulps_avx512vl(auVar299._0_32_,auVar122);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar106,auVar121);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar301._0_32_,auVar113);
    auVar124 = vmulps_avx512vl(auVar122,auVar122);
    auVar124 = vfmadd231ps_avx512vl(auVar124,auVar121,auVar121);
    auVar124 = vfmadd231ps_avx512vl(auVar124,auVar113,auVar113);
    auVar125 = vmulps_avx512vl(auVar299._0_32_,auVar109);
    auVar125 = vfmadd231ps_avx512vl(auVar125,auVar107,auVar106);
    auVar125 = vfmadd231ps_avx512vl(auVar125,auVar130,auVar301._0_32_);
    auVar109 = vmulps_avx512vl(auVar122,auVar109);
    auVar107 = vfmadd231ps_avx512vl(auVar109,auVar121,auVar107);
    auVar126 = vfmadd231ps_avx512vl(auVar107,auVar113,auVar130);
    auVar127 = vmulps_avx512vl(auVar125,auVar125);
    auVar107 = vsubps_avx(local_720,auVar127);
    auVar109 = vmulps_avx512vl(auVar125,auVar126);
    auVar109 = vsubps_avx512vl(auVar123,auVar109);
    auVar128 = vaddps_avx512vl(auVar109,auVar109);
    auVar109 = vmulps_avx512vl(auVar126,auVar126);
    auVar124 = vsubps_avx512vl(auVar124,auVar109);
    auVar109 = vsubps_avx(auVar124,auVar129);
    auVar129 = vmulps_avx512vl(auVar128,auVar128);
    auVar123._8_4_ = 0x40800000;
    auVar123._0_8_ = 0x4080000040800000;
    auVar123._12_4_ = 0x40800000;
    auVar123._16_4_ = 0x40800000;
    auVar123._20_4_ = 0x40800000;
    auVar123._24_4_ = 0x40800000;
    auVar123._28_4_ = 0x40800000;
    auVar123 = vmulps_avx512vl(auVar107,auVar123);
    auVar130 = vmulps_avx512vl(auVar123,auVar109);
    auVar130 = vsubps_avx512vl(auVar129,auVar130);
    uVar92 = vcmpps_avx512vl(auVar130,ZEXT832(0) << 0x20,5);
    bVar84 = (byte)uVar92;
    if (bVar84 == 0) {
      auVar133 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar134 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar130 = vsqrtps_avx512vl(auVar130);
      auVar131 = vaddps_avx512vl(auVar107,auVar107);
      auVar132 = vrcp14ps_avx512vl(auVar131);
      auVar44._8_4_ = 0x3f800000;
      auVar44._0_8_ = &DAT_3f8000003f800000;
      auVar44._12_4_ = 0x3f800000;
      auVar44._16_4_ = 0x3f800000;
      auVar44._20_4_ = 0x3f800000;
      auVar44._24_4_ = 0x3f800000;
      auVar44._28_4_ = 0x3f800000;
      auVar131 = vfnmadd213ps_avx512vl(auVar131,auVar132,auVar44);
      auVar131 = vfmadd132ps_avx512vl(auVar131,auVar132,auVar132);
      auVar45._8_4_ = 0x80000000;
      auVar45._0_8_ = 0x8000000080000000;
      auVar45._12_4_ = 0x80000000;
      auVar45._16_4_ = 0x80000000;
      auVar45._20_4_ = 0x80000000;
      auVar45._24_4_ = 0x80000000;
      auVar45._28_4_ = 0x80000000;
      auVar132 = vxorps_avx512vl(auVar128,auVar45);
      auVar132 = vsubps_avx512vl(auVar132,auVar130);
      auVar132 = vmulps_avx512vl(auVar132,auVar131);
      auVar130 = vsubps_avx512vl(auVar130,auVar128);
      auVar130 = vmulps_avx512vl(auVar130,auVar131);
      auVar131 = vfmadd213ps_avx512vl(auVar125,auVar132,auVar126);
      local_820 = vmulps_avx512vl(auVar112,auVar131);
      auVar131 = vfmadd213ps_avx512vl(auVar125,auVar130,auVar126);
      local_840 = vmulps_avx512vl(auVar112,auVar131);
      auVar131 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar131 = vblendmps_avx512vl(auVar131,auVar132);
      auVar133._0_4_ =
           (uint)(bVar84 & 1) * auVar131._0_4_ | (uint)!(bool)(bVar84 & 1) * local_840._0_4_;
      bVar19 = (bool)((byte)(uVar92 >> 1) & 1);
      auVar133._4_4_ = (uint)bVar19 * auVar131._4_4_ | (uint)!bVar19 * local_840._4_4_;
      bVar19 = (bool)((byte)(uVar92 >> 2) & 1);
      auVar133._8_4_ = (uint)bVar19 * auVar131._8_4_ | (uint)!bVar19 * local_840._8_4_;
      bVar19 = (bool)((byte)(uVar92 >> 3) & 1);
      auVar133._12_4_ = (uint)bVar19 * auVar131._12_4_ | (uint)!bVar19 * local_840._12_4_;
      bVar19 = (bool)((byte)(uVar92 >> 4) & 1);
      auVar133._16_4_ = (uint)bVar19 * auVar131._16_4_ | (uint)!bVar19 * local_840._16_4_;
      bVar19 = (bool)((byte)(uVar92 >> 5) & 1);
      auVar133._20_4_ = (uint)bVar19 * auVar131._20_4_ | (uint)!bVar19 * local_840._20_4_;
      bVar19 = (bool)((byte)(uVar92 >> 6) & 1);
      auVar133._24_4_ = (uint)bVar19 * auVar131._24_4_ | (uint)!bVar19 * local_840._24_4_;
      bVar19 = SUB81(uVar92 >> 7,0);
      auVar133._28_4_ = (uint)bVar19 * auVar131._28_4_ | (uint)!bVar19 * local_840._28_4_;
      auVar239._8_4_ = 0xff800000;
      auVar239._0_8_ = 0xff800000ff800000;
      auVar239._12_4_ = 0xff800000;
      auVar239._16_4_ = 0xff800000;
      auVar239._20_4_ = 0xff800000;
      auVar239._24_4_ = 0xff800000;
      auVar239._28_4_ = 0xff800000;
      auVar131 = vblendmps_avx512vl(auVar239,auVar130);
      auVar134._0_4_ =
           (uint)(bVar84 & 1) * auVar131._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar130._0_4_;
      bVar19 = (bool)((byte)(uVar92 >> 1) & 1);
      auVar134._4_4_ = (uint)bVar19 * auVar131._4_4_ | (uint)!bVar19 * auVar130._4_4_;
      bVar19 = (bool)((byte)(uVar92 >> 2) & 1);
      auVar134._8_4_ = (uint)bVar19 * auVar131._8_4_ | (uint)!bVar19 * auVar130._8_4_;
      bVar19 = (bool)((byte)(uVar92 >> 3) & 1);
      auVar134._12_4_ = (uint)bVar19 * auVar131._12_4_ | (uint)!bVar19 * auVar130._12_4_;
      bVar19 = (bool)((byte)(uVar92 >> 4) & 1);
      auVar134._16_4_ = (uint)bVar19 * auVar131._16_4_ | (uint)!bVar19 * auVar130._16_4_;
      bVar19 = (bool)((byte)(uVar92 >> 5) & 1);
      auVar134._20_4_ = (uint)bVar19 * auVar131._20_4_ | (uint)!bVar19 * auVar130._20_4_;
      bVar19 = (bool)((byte)(uVar92 >> 6) & 1);
      auVar134._24_4_ = (uint)bVar19 * auVar131._24_4_ | (uint)!bVar19 * auVar130._24_4_;
      bVar19 = SUB81(uVar92 >> 7,0);
      auVar134._28_4_ = (uint)bVar19 * auVar131._28_4_ | (uint)!bVar19 * auVar130._28_4_;
      auVar130 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar127,auVar130);
      auVar131 = vmaxps_avx512vl(local_7c0,auVar130);
      auVar46._8_4_ = 0x36000000;
      auVar46._0_8_ = 0x3600000036000000;
      auVar46._12_4_ = 0x36000000;
      auVar46._16_4_ = 0x36000000;
      auVar46._20_4_ = 0x36000000;
      auVar46._24_4_ = 0x36000000;
      auVar46._28_4_ = 0x36000000;
      auVar131 = vmulps_avx512vl(auVar131,auVar46);
      vandps_avx512vl(auVar107,auVar130);
      uVar89 = vcmpps_avx512vl(auVar131,auVar131,1);
      uVar92 = uVar92 & uVar89;
      bVar87 = (byte)uVar92;
      if (bVar87 != 0) {
        uVar89 = vcmpps_avx512vl(auVar109,ZEXT832(0) << 0x20,2);
        auVar251._8_4_ = 0xff800000;
        auVar251._0_8_ = 0xff800000ff800000;
        auVar251._12_4_ = 0xff800000;
        auVar251._16_4_ = 0xff800000;
        auVar251._20_4_ = 0xff800000;
        auVar251._24_4_ = 0xff800000;
        auVar251._28_4_ = 0xff800000;
        auVar109 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar130 = vblendmps_avx512vl(auVar109,auVar251);
        bVar82 = (byte)uVar89;
        iVar1 = (uint)(bVar82 & 1) * auVar130._0_4_;
        iVar2 = (uint)((byte)(uVar89 >> 1) & 1) * auVar130._4_4_;
        iVar3 = (uint)((byte)(uVar89 >> 2) & 1) * auVar130._8_4_;
        iVar4 = (uint)((byte)(uVar89 >> 3) & 1) * auVar130._12_4_;
        iVar5 = (uint)((byte)(uVar89 >> 4) & 1) * auVar130._16_4_;
        iVar6 = (uint)((byte)(uVar89 >> 5) & 1) * auVar130._20_4_;
        iVar7 = (uint)((byte)(uVar89 >> 6) & 1) * auVar130._24_4_;
        iVar8 = (uint)(byte)(uVar89 >> 7) * auVar130._28_4_;
        auVar133._0_4_ = (uint)(bVar87 & 1) * iVar1 | !(bool)(bVar87 & 1) * auVar133._0_4_;
        bVar19 = (bool)((byte)(uVar92 >> 1) & 1);
        auVar133._4_4_ = (uint)bVar19 * iVar2 | !bVar19 * auVar133._4_4_;
        bVar19 = (bool)((byte)(uVar92 >> 2) & 1);
        auVar133._8_4_ = (uint)bVar19 * iVar3 | !bVar19 * auVar133._8_4_;
        bVar19 = (bool)((byte)(uVar92 >> 3) & 1);
        auVar133._12_4_ = (uint)bVar19 * iVar4 | !bVar19 * auVar133._12_4_;
        bVar19 = (bool)((byte)(uVar92 >> 4) & 1);
        auVar133._16_4_ = (uint)bVar19 * iVar5 | !bVar19 * auVar133._16_4_;
        bVar19 = (bool)((byte)(uVar92 >> 5) & 1);
        auVar133._20_4_ = (uint)bVar19 * iVar6 | !bVar19 * auVar133._20_4_;
        bVar19 = (bool)((byte)(uVar92 >> 6) & 1);
        auVar133._24_4_ = (uint)bVar19 * iVar7 | !bVar19 * auVar133._24_4_;
        bVar19 = SUB81(uVar92 >> 7,0);
        auVar133._28_4_ = (uint)bVar19 * iVar8 | !bVar19 * auVar133._28_4_;
        auVar109 = vblendmps_avx512vl(auVar251,auVar109);
        bVar19 = (bool)((byte)(uVar89 >> 1) & 1);
        bVar20 = (bool)((byte)(uVar89 >> 2) & 1);
        bVar21 = (bool)((byte)(uVar89 >> 3) & 1);
        bVar22 = (bool)((byte)(uVar89 >> 4) & 1);
        bVar23 = (bool)((byte)(uVar89 >> 5) & 1);
        bVar24 = (bool)((byte)(uVar89 >> 6) & 1);
        bVar25 = SUB81(uVar89 >> 7,0);
        auVar134._0_4_ =
             (uint)(bVar87 & 1) *
             ((uint)(bVar82 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar82 & 1) * iVar1) |
             !(bool)(bVar87 & 1) * auVar134._0_4_;
        bVar91 = (bool)((byte)(uVar92 >> 1) & 1);
        auVar134._4_4_ =
             (uint)bVar91 * ((uint)bVar19 * auVar109._4_4_ | (uint)!bVar19 * iVar2) |
             !bVar91 * auVar134._4_4_;
        bVar19 = (bool)((byte)(uVar92 >> 2) & 1);
        auVar134._8_4_ =
             (uint)bVar19 * ((uint)bVar20 * auVar109._8_4_ | (uint)!bVar20 * iVar3) |
             !bVar19 * auVar134._8_4_;
        bVar19 = (bool)((byte)(uVar92 >> 3) & 1);
        auVar134._12_4_ =
             (uint)bVar19 * ((uint)bVar21 * auVar109._12_4_ | (uint)!bVar21 * iVar4) |
             !bVar19 * auVar134._12_4_;
        bVar19 = (bool)((byte)(uVar92 >> 4) & 1);
        auVar134._16_4_ =
             (uint)bVar19 * ((uint)bVar22 * auVar109._16_4_ | (uint)!bVar22 * iVar5) |
             !bVar19 * auVar134._16_4_;
        bVar19 = (bool)((byte)(uVar92 >> 5) & 1);
        auVar134._20_4_ =
             (uint)bVar19 * ((uint)bVar23 * auVar109._20_4_ | (uint)!bVar23 * iVar6) |
             !bVar19 * auVar134._20_4_;
        bVar19 = (bool)((byte)(uVar92 >> 6) & 1);
        auVar134._24_4_ =
             (uint)bVar19 * ((uint)bVar24 * auVar109._24_4_ | (uint)!bVar24 * iVar7) |
             !bVar19 * auVar134._24_4_;
        bVar19 = SUB81(uVar92 >> 7,0);
        auVar134._28_4_ =
             (uint)bVar19 * ((uint)bVar25 * auVar109._28_4_ | (uint)!bVar25 * iVar8) |
             !bVar19 * auVar134._28_4_;
        bVar84 = (~bVar87 | bVar82) & bVar84;
      }
    }
    if ((bVar84 & 0x7f) == 0) {
      auVar184 = ZEXT3264(CONCAT428(0x7fffffff,
                                    CONCAT424(0x7fffffff,
                                              CONCAT420(0x7fffffff,
                                                        CONCAT416(0x7fffffff,
                                                                  CONCAT412(0x7fffffff,
                                                                            CONCAT48(0x7fffffff,
                                                                                                                                                                          
                                                  0x7fffffff7fffffff)))))));
      auVar277 = ZEXT3264(_DAT_02020f20);
      auVar107 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar300 = ZEXT3264(auVar107);
      auVar301 = ZEXT3264(local_aa0);
      auVar299 = ZEXT3264(local_ac0);
    }
    else {
      fVar276 = *(float *)(ray + k * 4 + 0x200) - (float)local_990._0_4_;
      auVar240._4_4_ = fVar276;
      auVar240._0_4_ = fVar276;
      auVar240._8_4_ = fVar276;
      auVar240._12_4_ = fVar276;
      auVar240._16_4_ = fVar276;
      auVar240._20_4_ = fVar276;
      auVar240._24_4_ = fVar276;
      auVar240._28_4_ = fVar276;
      auVar130 = vminps_avx512vl(auVar240,auVar134);
      auVar78._4_4_ = fStack_73c;
      auVar78._0_4_ = local_740;
      auVar78._8_4_ = fStack_738;
      auVar78._12_4_ = fStack_734;
      auVar78._16_4_ = fStack_730;
      auVar78._20_4_ = fStack_72c;
      auVar78._24_4_ = fStack_728;
      auVar78._28_4_ = fStack_724;
      auVar109 = vmaxps_avx512vl(auVar78,auVar133);
      auVar122 = vmulps_avx512vl(auVar295,auVar122);
      auVar121 = vfmadd213ps_avx512vl(auVar121,auVar139,auVar122);
      auVar113 = vfmadd213ps_avx512vl(auVar113,auVar135,auVar121);
      auVar299 = ZEXT3264(local_ac0);
      auVar121 = vmulps_avx512vl(local_ac0,auVar295);
      auVar121 = vfmadd231ps_avx512vl(auVar121,auVar106,auVar139);
      auVar301 = ZEXT3264(local_aa0);
      auVar121 = vfmadd231ps_avx512vl(auVar121,local_aa0,auVar135);
      auVar135 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar121,auVar135);
      auVar131 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar34 = vcmpps_avx512vl(auVar135,auVar131,1);
      auVar132 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar113 = vxorps_avx512vl(auVar113,auVar132);
      auVar122 = vrcp14ps_avx512vl(auVar121);
      auVar136 = vxorps_avx512vl(auVar121,auVar132);
      auVar137 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar300 = ZEXT3264(auVar137);
      auVar138 = vfnmadd213ps_avx512vl(auVar122,auVar121,auVar137);
      auVar138 = vfmadd132ps_avx512vl(auVar138,auVar122,auVar122);
      auVar113 = vmulps_avx512vl(auVar138,auVar113);
      uVar35 = vcmpps_avx512vl(auVar121,auVar136,1);
      bVar87 = (byte)uVar34 | (byte)uVar35;
      auVar138 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar139 = vblendmps_avx512vl(auVar113,auVar138);
      auVar140._0_4_ =
           (uint)(bVar87 & 1) * auVar139._0_4_ | (uint)!(bool)(bVar87 & 1) * auVar122._0_4_;
      bVar19 = (bool)(bVar87 >> 1 & 1);
      auVar140._4_4_ = (uint)bVar19 * auVar139._4_4_ | (uint)!bVar19 * auVar122._4_4_;
      bVar19 = (bool)(bVar87 >> 2 & 1);
      auVar140._8_4_ = (uint)bVar19 * auVar139._8_4_ | (uint)!bVar19 * auVar122._8_4_;
      bVar19 = (bool)(bVar87 >> 3 & 1);
      auVar140._12_4_ = (uint)bVar19 * auVar139._12_4_ | (uint)!bVar19 * auVar122._12_4_;
      bVar19 = (bool)(bVar87 >> 4 & 1);
      auVar140._16_4_ = (uint)bVar19 * auVar139._16_4_ | (uint)!bVar19 * auVar122._16_4_;
      bVar19 = (bool)(bVar87 >> 5 & 1);
      auVar140._20_4_ = (uint)bVar19 * auVar139._20_4_ | (uint)!bVar19 * auVar122._20_4_;
      bVar19 = (bool)(bVar87 >> 6 & 1);
      auVar140._24_4_ = (uint)bVar19 * auVar139._24_4_ | (uint)!bVar19 * auVar122._24_4_;
      auVar140._28_4_ =
           (uint)(bVar87 >> 7) * auVar139._28_4_ | (uint)!(bool)(bVar87 >> 7) * auVar122._28_4_;
      auVar109 = vmaxps_avx(auVar109,auVar140);
      uVar35 = vcmpps_avx512vl(auVar121,auVar136,6);
      bVar87 = (byte)uVar34 | (byte)uVar35;
      auVar136 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar141._0_4_ =
           (uint)(bVar87 & 1) * auVar136._0_4_ | (uint)!(bool)(bVar87 & 1) * auVar113._0_4_;
      bVar19 = (bool)(bVar87 >> 1 & 1);
      auVar141._4_4_ = (uint)bVar19 * auVar136._4_4_ | (uint)!bVar19 * auVar113._4_4_;
      bVar19 = (bool)(bVar87 >> 2 & 1);
      auVar141._8_4_ = (uint)bVar19 * auVar136._8_4_ | (uint)!bVar19 * auVar113._8_4_;
      bVar19 = (bool)(bVar87 >> 3 & 1);
      auVar141._12_4_ = (uint)bVar19 * auVar136._12_4_ | (uint)!bVar19 * auVar113._12_4_;
      bVar19 = (bool)(bVar87 >> 4 & 1);
      auVar141._16_4_ = (uint)bVar19 * auVar136._16_4_ | (uint)!bVar19 * auVar113._16_4_;
      bVar19 = (bool)(bVar87 >> 5 & 1);
      auVar141._20_4_ = (uint)bVar19 * auVar136._20_4_ | (uint)!bVar19 * auVar113._20_4_;
      bVar19 = (bool)(bVar87 >> 6 & 1);
      auVar141._24_4_ = (uint)bVar19 * auVar136._24_4_ | (uint)!bVar19 * auVar113._24_4_;
      auVar141._28_4_ =
           (uint)(bVar87 >> 7) * auVar136._28_4_ | (uint)!(bool)(bVar87 >> 7) * auVar113._28_4_;
      auVar113 = vminps_avx(auVar130,auVar141);
      auVar297 = ZEXT864(0) << 0x20;
      auVar121 = vsubps_avx(ZEXT832(0) << 0x20,auVar115);
      auVar122 = vsubps_avx(ZEXT832(0) << 0x20,auVar116);
      auVar130 = ZEXT832(0) << 0x20;
      auVar115 = vsubps_avx(auVar130,auVar117);
      auVar55._4_4_ = auVar115._4_4_ * auVar120._4_4_;
      auVar55._0_4_ = auVar115._0_4_ * auVar120._0_4_;
      auVar55._8_4_ = auVar115._8_4_ * auVar120._8_4_;
      auVar55._12_4_ = auVar115._12_4_ * auVar120._12_4_;
      auVar55._16_4_ = auVar115._16_4_ * auVar120._16_4_;
      auVar55._20_4_ = auVar115._20_4_ * auVar120._20_4_;
      auVar55._24_4_ = auVar115._24_4_ * auVar120._24_4_;
      auVar55._28_4_ = auVar115._28_4_;
      auVar122 = vfnmsub231ps_avx512vl(auVar55,auVar119,auVar122);
      auVar121 = vfnmadd231ps_avx512vl(auVar122,auVar118,auVar121);
      auVar122 = vmulps_avx512vl(local_ac0,auVar120);
      auVar122 = vfnmsub231ps_avx512vl(auVar122,auVar106,auVar119);
      auVar122 = vfnmadd231ps_avx512vl(auVar122,local_aa0,auVar118);
      vandps_avx512vl(auVar122,auVar135);
      uVar34 = vcmpps_avx512vl(auVar122,auVar131,1);
      auVar121 = vxorps_avx512vl(auVar121,auVar132);
      auVar115 = vrcp14ps_avx512vl(auVar122);
      auVar116 = vxorps_avx512vl(auVar122,auVar132);
      auVar289 = ZEXT3264(auVar116);
      auVar117 = vfnmadd213ps_avx512vl(auVar115,auVar122,auVar137);
      auVar99 = vfmadd132ps_fma(auVar117,auVar115,auVar115);
      auVar292 = ZEXT1664(auVar99);
      fVar276 = auVar99._0_4_ * auVar121._0_4_;
      fVar278 = auVar99._4_4_ * auVar121._4_4_;
      auVar56._4_4_ = fVar278;
      auVar56._0_4_ = fVar276;
      fVar279 = auVar99._8_4_ * auVar121._8_4_;
      auVar56._8_4_ = fVar279;
      fVar280 = auVar99._12_4_ * auVar121._12_4_;
      auVar56._12_4_ = fVar280;
      fVar266 = auVar121._16_4_ * 0.0;
      auVar56._16_4_ = fVar266;
      fVar267 = auVar121._20_4_ * 0.0;
      auVar56._20_4_ = fVar267;
      fVar281 = auVar121._24_4_ * 0.0;
      auVar56._24_4_ = fVar281;
      auVar56._28_4_ = auVar121._28_4_;
      uVar35 = vcmpps_avx512vl(auVar122,auVar116,1);
      bVar87 = (byte)uVar34 | (byte)uVar35;
      auVar117 = vblendmps_avx512vl(auVar56,auVar138);
      auVar142._0_4_ =
           (uint)(bVar87 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar87 & 1) * auVar115._0_4_;
      bVar19 = (bool)(bVar87 >> 1 & 1);
      auVar142._4_4_ = (uint)bVar19 * auVar117._4_4_ | (uint)!bVar19 * auVar115._4_4_;
      bVar19 = (bool)(bVar87 >> 2 & 1);
      auVar142._8_4_ = (uint)bVar19 * auVar117._8_4_ | (uint)!bVar19 * auVar115._8_4_;
      bVar19 = (bool)(bVar87 >> 3 & 1);
      auVar142._12_4_ = (uint)bVar19 * auVar117._12_4_ | (uint)!bVar19 * auVar115._12_4_;
      bVar19 = (bool)(bVar87 >> 4 & 1);
      auVar142._16_4_ = (uint)bVar19 * auVar117._16_4_ | (uint)!bVar19 * auVar115._16_4_;
      bVar19 = (bool)(bVar87 >> 5 & 1);
      auVar142._20_4_ = (uint)bVar19 * auVar117._20_4_ | (uint)!bVar19 * auVar115._20_4_;
      bVar19 = (bool)(bVar87 >> 6 & 1);
      auVar142._24_4_ = (uint)bVar19 * auVar117._24_4_ | (uint)!bVar19 * auVar115._24_4_;
      auVar142._28_4_ =
           (uint)(bVar87 >> 7) * auVar117._28_4_ | (uint)!(bool)(bVar87 >> 7) * auVar115._28_4_;
      auVar285 = ZEXT3264(auVar142);
      _local_920 = vmaxps_avx(auVar109,auVar142);
      uVar35 = vcmpps_avx512vl(auVar122,auVar116,6);
      bVar87 = (byte)uVar34 | (byte)uVar35;
      auVar143._0_4_ =
           (uint)(bVar87 & 1) * auVar136._0_4_ | (uint)!(bool)(bVar87 & 1) * (int)fVar276;
      bVar19 = (bool)(bVar87 >> 1 & 1);
      auVar143._4_4_ = (uint)bVar19 * auVar136._4_4_ | (uint)!bVar19 * (int)fVar278;
      bVar19 = (bool)(bVar87 >> 2 & 1);
      auVar143._8_4_ = (uint)bVar19 * auVar136._8_4_ | (uint)!bVar19 * (int)fVar279;
      bVar19 = (bool)(bVar87 >> 3 & 1);
      auVar143._12_4_ = (uint)bVar19 * auVar136._12_4_ | (uint)!bVar19 * (int)fVar280;
      bVar19 = (bool)(bVar87 >> 4 & 1);
      auVar143._16_4_ = (uint)bVar19 * auVar136._16_4_ | (uint)!bVar19 * (int)fVar266;
      bVar19 = (bool)(bVar87 >> 5 & 1);
      auVar143._20_4_ = (uint)bVar19 * auVar136._20_4_ | (uint)!bVar19 * (int)fVar267;
      bVar19 = (bool)(bVar87 >> 6 & 1);
      auVar143._24_4_ = (uint)bVar19 * auVar136._24_4_ | (uint)!bVar19 * (int)fVar281;
      auVar143._28_4_ =
           (uint)(bVar87 >> 7) * auVar136._28_4_ | (uint)!(bool)(bVar87 >> 7) * auVar121._28_4_;
      local_780 = vminps_avx(auVar113,auVar143);
      uVar34 = vcmpps_avx512vl(_local_920,local_780,2);
      bVar84 = bVar84 & 0x7f & (byte)uVar34;
      if (bVar84 == 0) {
        auVar184 = ZEXT3264(CONCAT428(0x7fffffff,
                                      CONCAT424(0x7fffffff,
                                                CONCAT420(0x7fffffff,
                                                          CONCAT416(0x7fffffff,
                                                                    CONCAT412(0x7fffffff,
                                                                              CONCAT48(0x7fffffff,
                                                                                                                                                                              
                                                  0x7fffffff7fffffff)))))));
        auVar277 = ZEXT3264(_DAT_02020f20);
      }
      else {
        auVar109 = vmaxps_avx(auVar130,auVar111);
        auVar111 = vminps_avx512vl(local_820,auVar137);
        auVar63 = ZEXT412(0);
        auVar285 = ZEXT1264(auVar63) << 0x20;
        auVar111 = vmaxps_avx(auVar111,ZEXT1232(auVar63) << 0x20);
        auVar113 = vminps_avx512vl(local_840,auVar137);
        auVar291._8_4_ = 0x3e000000;
        auVar291._0_8_ = 0x3e0000003e000000;
        auVar291._12_4_ = 0x3e000000;
        auVar291._16_4_ = 0x3e000000;
        auVar291._20_4_ = 0x3e000000;
        auVar291._24_4_ = 0x3e000000;
        auVar291._28_4_ = 0x3e000000;
        auVar57._4_4_ = (auVar111._4_4_ + 1.0) * 0.125;
        auVar57._0_4_ = (auVar111._0_4_ + 0.0) * 0.125;
        auVar57._8_4_ = (auVar111._8_4_ + 2.0) * 0.125;
        auVar57._12_4_ = (auVar111._12_4_ + 3.0) * 0.125;
        auVar57._16_4_ = (auVar111._16_4_ + 4.0) * 0.125;
        auVar57._20_4_ = (auVar111._20_4_ + 5.0) * 0.125;
        auVar57._24_4_ = (auVar111._24_4_ + 6.0) * 0.125;
        auVar57._28_4_ = auVar111._28_4_ + 7.0;
        auVar99 = vfmadd213ps_fma(auVar57,local_a60,auVar250);
        local_820 = ZEXT1632(auVar99);
        auVar111 = vmaxps_avx(auVar113,ZEXT1232(auVar63) << 0x20);
        auVar58._4_4_ = (auVar111._4_4_ + 1.0) * 0.125;
        auVar58._0_4_ = (auVar111._0_4_ + 0.0) * 0.125;
        auVar58._8_4_ = (auVar111._8_4_ + 2.0) * 0.125;
        auVar58._12_4_ = (auVar111._12_4_ + 3.0) * 0.125;
        auVar58._16_4_ = (auVar111._16_4_ + 4.0) * 0.125;
        auVar58._20_4_ = (auVar111._20_4_ + 5.0) * 0.125;
        auVar58._24_4_ = (auVar111._24_4_ + 6.0) * 0.125;
        auVar58._28_4_ = auVar111._28_4_ + 7.0;
        auVar99 = vfmadd213ps_fma(auVar58,local_a60,auVar250);
        local_840 = ZEXT1632(auVar99);
        auVar241._0_4_ = auVar109._0_4_ * auVar109._0_4_;
        auVar241._4_4_ = auVar109._4_4_ * auVar109._4_4_;
        auVar241._8_4_ = auVar109._8_4_ * auVar109._8_4_;
        auVar241._12_4_ = auVar109._12_4_ * auVar109._12_4_;
        auVar241._16_4_ = auVar109._16_4_ * auVar109._16_4_;
        auVar241._20_4_ = auVar109._20_4_ * auVar109._20_4_;
        auVar241._24_4_ = auVar109._24_4_ * auVar109._24_4_;
        auVar241._28_4_ = 0;
        auVar109 = vsubps_avx(auVar124,auVar241);
        auVar111 = vmulps_avx512vl(auVar123,auVar109);
        auVar111 = vsubps_avx512vl(auVar129,auVar111);
        uVar34 = vcmpps_avx512vl(auVar111,ZEXT1232(auVar63) << 0x20,5);
        bVar87 = (byte)uVar34;
        if (bVar87 == 0) {
          auVar110 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar114 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar113 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar121 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar111 = ZEXT832(0) << 0x20;
          auVar144._8_4_ = 0x7f800000;
          auVar144._0_8_ = 0x7f8000007f800000;
          auVar144._12_4_ = 0x7f800000;
          auVar144._16_4_ = 0x7f800000;
          auVar144._20_4_ = 0x7f800000;
          auVar144._24_4_ = 0x7f800000;
          auVar144._28_4_ = 0x7f800000;
          auVar145._8_4_ = 0xff800000;
          auVar145._0_8_ = 0xff800000ff800000;
          auVar145._12_4_ = 0xff800000;
          auVar145._16_4_ = 0xff800000;
          auVar145._20_4_ = 0xff800000;
          auVar145._24_4_ = 0xff800000;
          auVar145._28_4_ = 0xff800000;
        }
        else {
          auVar100 = vxorps_avx512vl(auVar123._0_16_,auVar123._0_16_);
          uVar92 = vcmpps_avx512vl(auVar111,auVar130,5);
          auVar111 = vsqrtps_avx(auVar111);
          auVar252._0_4_ = auVar107._0_4_ + auVar107._0_4_;
          auVar252._4_4_ = auVar107._4_4_ + auVar107._4_4_;
          auVar252._8_4_ = auVar107._8_4_ + auVar107._8_4_;
          auVar252._12_4_ = auVar107._12_4_ + auVar107._12_4_;
          auVar252._16_4_ = auVar107._16_4_ + auVar107._16_4_;
          auVar252._20_4_ = auVar107._20_4_ + auVar107._20_4_;
          auVar252._24_4_ = auVar107._24_4_ + auVar107._24_4_;
          auVar252._28_4_ = auVar107._28_4_ + auVar107._28_4_;
          auVar113 = vrcp14ps_avx512vl(auVar252);
          auVar121 = vfnmadd213ps_avx512vl(auVar252,auVar113,auVar137);
          auVar99 = vfmadd132ps_fma(auVar121,auVar113,auVar113);
          auVar47._8_4_ = 0x80000000;
          auVar47._0_8_ = 0x8000000080000000;
          auVar47._12_4_ = 0x80000000;
          auVar47._16_4_ = 0x80000000;
          auVar47._20_4_ = 0x80000000;
          auVar47._24_4_ = 0x80000000;
          auVar47._28_4_ = 0x80000000;
          auVar113 = vxorps_avx512vl(auVar128,auVar47);
          auVar113 = vsubps_avx(auVar113,auVar111);
          auVar59._4_4_ = auVar113._4_4_ * auVar99._4_4_;
          auVar59._0_4_ = auVar113._0_4_ * auVar99._0_4_;
          auVar59._8_4_ = auVar113._8_4_ * auVar99._8_4_;
          auVar59._12_4_ = auVar113._12_4_ * auVar99._12_4_;
          auVar59._16_4_ = auVar113._16_4_ * 0.0;
          auVar59._20_4_ = auVar113._20_4_ * 0.0;
          auVar59._24_4_ = auVar113._24_4_ * 0.0;
          auVar59._28_4_ = 0x3e000000;
          auVar111 = vsubps_avx512vl(auVar111,auVar128);
          auVar296._0_4_ = auVar111._0_4_ * auVar99._0_4_;
          auVar296._4_4_ = auVar111._4_4_ * auVar99._4_4_;
          auVar296._8_4_ = auVar111._8_4_ * auVar99._8_4_;
          auVar296._12_4_ = auVar111._12_4_ * auVar99._12_4_;
          auVar296._16_4_ = auVar111._16_4_ * 0.0;
          auVar296._20_4_ = auVar111._20_4_ * 0.0;
          auVar296._24_4_ = auVar111._24_4_ * 0.0;
          auVar296._28_4_ = 0;
          auVar297 = ZEXT3264(auVar296);
          auVar111 = vfmadd213ps_avx512vl(auVar125,auVar59,auVar126);
          auVar60._4_4_ = auVar112._4_4_ * auVar111._4_4_;
          auVar60._0_4_ = auVar112._0_4_ * auVar111._0_4_;
          auVar60._8_4_ = auVar112._8_4_ * auVar111._8_4_;
          auVar60._12_4_ = auVar112._12_4_ * auVar111._12_4_;
          auVar60._16_4_ = auVar112._16_4_ * auVar111._16_4_;
          auVar60._20_4_ = auVar112._20_4_ * auVar111._20_4_;
          auVar60._24_4_ = auVar112._24_4_ * auVar111._24_4_;
          auVar60._28_4_ = auVar113._28_4_;
          auVar111 = vmulps_avx512vl(local_aa0,auVar59);
          auVar121 = vmulps_avx512vl(auVar106,auVar59);
          auVar122 = vmulps_avx512vl(local_ac0,auVar59);
          auVar113 = vfmadd213ps_avx512vl(auVar110,auVar60,local_b20);
          auVar113 = vsubps_avx512vl(auVar111,auVar113);
          auVar111 = vfmadd213ps_avx512vl(auVar114,auVar60,auVar226);
          auVar121 = vsubps_avx512vl(auVar121,auVar111);
          auVar99 = vfmadd213ps_fma(auVar60,local_8e0,local_a80);
          auVar111 = vsubps_avx(auVar122,ZEXT1632(auVar99));
          auVar122 = vfmadd213ps_avx512vl(auVar125,auVar296,auVar126);
          auVar112 = vmulps_avx512vl(auVar112,auVar122);
          auVar122 = vmulps_avx512vl(local_aa0,auVar296);
          auVar123 = vmulps_avx512vl(auVar106,auVar296);
          auVar115 = vmulps_avx512vl(local_ac0,auVar296);
          auVar99 = vfmadd213ps_fma(auVar110,auVar112,local_b20);
          auVar110 = vsubps_avx(auVar122,ZEXT1632(auVar99));
          auVar285 = ZEXT3264(auVar110);
          auVar99 = vfmadd213ps_fma(auVar114,auVar112,auVar226);
          auVar110 = vsubps_avx512vl(auVar123,ZEXT1632(auVar99));
          auVar99 = vfmadd213ps_fma(local_8e0,auVar112,local_a80);
          auVar114 = vsubps_avx512vl(auVar115,ZEXT1632(auVar99));
          auVar175._8_4_ = 0x7f800000;
          auVar175._0_8_ = 0x7f8000007f800000;
          auVar175._12_4_ = 0x7f800000;
          auVar175._16_4_ = 0x7f800000;
          auVar175._20_4_ = 0x7f800000;
          auVar175._24_4_ = 0x7f800000;
          auVar175._28_4_ = 0x7f800000;
          auVar112 = vblendmps_avx512vl(auVar175,auVar59);
          bVar19 = (bool)((byte)uVar92 & 1);
          auVar144._0_4_ = (uint)bVar19 * auVar112._0_4_ | (uint)!bVar19 * auVar284._0_4_;
          bVar19 = (bool)((byte)(uVar92 >> 1) & 1);
          auVar144._4_4_ = (uint)bVar19 * auVar112._4_4_ | (uint)!bVar19 * auVar284._4_4_;
          bVar19 = (bool)((byte)(uVar92 >> 2) & 1);
          auVar144._8_4_ = (uint)bVar19 * auVar112._8_4_ | (uint)!bVar19 * auVar284._8_4_;
          bVar19 = (bool)((byte)(uVar92 >> 3) & 1);
          auVar144._12_4_ = (uint)bVar19 * auVar112._12_4_ | (uint)!bVar19 * auVar284._12_4_;
          iVar5 = (uint)((byte)(uVar92 >> 4) & 1) * auVar112._16_4_;
          auVar144._16_4_ = iVar5;
          iVar4 = (uint)((byte)(uVar92 >> 5) & 1) * auVar112._20_4_;
          auVar144._20_4_ = iVar4;
          iVar2 = (uint)((byte)(uVar92 >> 6) & 1) * auVar112._24_4_;
          auVar144._24_4_ = iVar2;
          iVar3 = (uint)(byte)(uVar92 >> 7) * auVar112._28_4_;
          auVar144._28_4_ = iVar3;
          auVar176._8_4_ = 0xff800000;
          auVar176._0_8_ = 0xff800000ff800000;
          auVar176._12_4_ = 0xff800000;
          auVar176._16_4_ = 0xff800000;
          auVar176._20_4_ = 0xff800000;
          auVar176._24_4_ = 0xff800000;
          auVar176._28_4_ = 0xff800000;
          auVar112 = vblendmps_avx512vl(auVar176,auVar296);
          bVar19 = (bool)((byte)uVar92 & 1);
          auVar145._0_4_ = (uint)bVar19 * auVar112._0_4_ | (uint)!bVar19 * -0x800000;
          bVar19 = (bool)((byte)(uVar92 >> 1) & 1);
          auVar145._4_4_ = (uint)bVar19 * auVar112._4_4_ | (uint)!bVar19 * -0x800000;
          bVar19 = (bool)((byte)(uVar92 >> 2) & 1);
          auVar145._8_4_ = (uint)bVar19 * auVar112._8_4_ | (uint)!bVar19 * -0x800000;
          bVar19 = (bool)((byte)(uVar92 >> 3) & 1);
          auVar145._12_4_ = (uint)bVar19 * auVar112._12_4_ | (uint)!bVar19 * -0x800000;
          bVar19 = (bool)((byte)(uVar92 >> 4) & 1);
          auVar145._16_4_ = (uint)bVar19 * auVar112._16_4_ | (uint)!bVar19 * -0x800000;
          bVar19 = (bool)((byte)(uVar92 >> 5) & 1);
          auVar145._20_4_ = (uint)bVar19 * auVar112._20_4_ | (uint)!bVar19 * -0x800000;
          bVar19 = (bool)((byte)(uVar92 >> 6) & 1);
          auVar145._24_4_ = (uint)bVar19 * auVar112._24_4_ | (uint)!bVar19 * -0x800000;
          bVar19 = SUB81(uVar92 >> 7,0);
          auVar145._28_4_ = (uint)bVar19 * auVar112._28_4_ | (uint)!bVar19 * -0x800000;
          auVar272._8_4_ = 0x7fffffff;
          auVar272._0_8_ = 0x7fffffff7fffffff;
          auVar272._12_4_ = 0x7fffffff;
          auVar272._16_4_ = 0x7fffffff;
          auVar272._20_4_ = 0x7fffffff;
          auVar272._24_4_ = 0x7fffffff;
          auVar272._28_4_ = 0x7fffffff;
          vandps_avx512vl(auVar127,auVar272);
          auVar112 = vmaxps_avx(local_7c0,auVar145);
          auVar48._8_4_ = 0x36000000;
          auVar48._0_8_ = 0x3600000036000000;
          auVar48._12_4_ = 0x36000000;
          auVar48._16_4_ = 0x36000000;
          auVar48._20_4_ = 0x36000000;
          auVar48._24_4_ = 0x36000000;
          auVar48._28_4_ = 0x36000000;
          auVar112 = vmulps_avx512vl(auVar112,auVar48);
          auVar107 = vandps_avx(auVar107,auVar272);
          uVar89 = vcmpps_avx512vl(auVar107,auVar112,1);
          uVar92 = uVar92 & uVar89;
          bVar82 = (byte)uVar92;
          auVar291 = local_7c0;
          if (bVar82 != 0) {
            uVar89 = vcmpps_avx512vl(auVar109,ZEXT1632(auVar100),2);
            auVar273._8_4_ = 0xff800000;
            auVar273._0_8_ = 0xff800000ff800000;
            auVar273._12_4_ = 0xff800000;
            auVar273._16_4_ = 0xff800000;
            auVar273._20_4_ = 0xff800000;
            auVar273._24_4_ = 0xff800000;
            auVar273._28_4_ = 0xff800000;
            auVar288._8_4_ = 0x7f800000;
            auVar288._0_8_ = 0x7f8000007f800000;
            auVar288._12_4_ = 0x7f800000;
            auVar288._16_4_ = 0x7f800000;
            auVar288._20_4_ = 0x7f800000;
            auVar288._24_4_ = 0x7f800000;
            auVar288._28_4_ = 0x7f800000;
            auVar107 = vblendmps_avx512vl(auVar288,auVar273);
            bVar86 = (byte)uVar89;
            uVar85 = (uint)(bVar86 & 1) * auVar107._0_4_ |
                     (uint)!(bool)(bVar86 & 1) * auVar112._0_4_;
            bVar19 = (bool)((byte)(uVar89 >> 1) & 1);
            uVar154 = (uint)bVar19 * auVar107._4_4_ | (uint)!bVar19 * auVar112._4_4_;
            bVar19 = (bool)((byte)(uVar89 >> 2) & 1);
            uVar155 = (uint)bVar19 * auVar107._8_4_ | (uint)!bVar19 * auVar112._8_4_;
            bVar19 = (bool)((byte)(uVar89 >> 3) & 1);
            uVar156 = (uint)bVar19 * auVar107._12_4_ | (uint)!bVar19 * auVar112._12_4_;
            bVar19 = (bool)((byte)(uVar89 >> 4) & 1);
            uVar157 = (uint)bVar19 * auVar107._16_4_ | (uint)!bVar19 * auVar112._16_4_;
            bVar19 = (bool)((byte)(uVar89 >> 5) & 1);
            uVar158 = (uint)bVar19 * auVar107._20_4_ | (uint)!bVar19 * auVar112._20_4_;
            bVar19 = (bool)((byte)(uVar89 >> 6) & 1);
            uVar159 = (uint)bVar19 * auVar107._24_4_ | (uint)!bVar19 * auVar112._24_4_;
            bVar19 = SUB81(uVar89 >> 7,0);
            uVar160 = (uint)bVar19 * auVar107._28_4_ | (uint)!bVar19 * auVar112._28_4_;
            auVar144._0_4_ = (bVar82 & 1) * uVar85 | !(bool)(bVar82 & 1) * auVar144._0_4_;
            bVar19 = (bool)((byte)(uVar92 >> 1) & 1);
            auVar144._4_4_ = bVar19 * uVar154 | !bVar19 * auVar144._4_4_;
            bVar19 = (bool)((byte)(uVar92 >> 2) & 1);
            auVar144._8_4_ = bVar19 * uVar155 | !bVar19 * auVar144._8_4_;
            bVar19 = (bool)((byte)(uVar92 >> 3) & 1);
            auVar144._12_4_ = bVar19 * uVar156 | !bVar19 * auVar144._12_4_;
            bVar19 = (bool)((byte)(uVar92 >> 4) & 1);
            auVar144._16_4_ = bVar19 * uVar157 | (uint)!bVar19 * iVar5;
            bVar19 = (bool)((byte)(uVar92 >> 5) & 1);
            auVar144._20_4_ = bVar19 * uVar158 | (uint)!bVar19 * iVar4;
            bVar19 = (bool)((byte)(uVar92 >> 6) & 1);
            auVar144._24_4_ = bVar19 * uVar159 | (uint)!bVar19 * iVar2;
            bVar19 = SUB81(uVar92 >> 7,0);
            auVar144._28_4_ = bVar19 * uVar160 | (uint)!bVar19 * iVar3;
            auVar107 = vblendmps_avx512vl(auVar273,auVar288);
            bVar19 = (bool)((byte)(uVar89 >> 1) & 1);
            bVar20 = (bool)((byte)(uVar89 >> 2) & 1);
            bVar21 = (bool)((byte)(uVar89 >> 3) & 1);
            bVar22 = (bool)((byte)(uVar89 >> 4) & 1);
            bVar23 = (bool)((byte)(uVar89 >> 5) & 1);
            bVar24 = (bool)((byte)(uVar89 >> 6) & 1);
            bVar25 = SUB81(uVar89 >> 7,0);
            auVar145._0_4_ =
                 (uint)(bVar82 & 1) *
                 ((uint)(bVar86 & 1) * auVar107._0_4_ | !(bool)(bVar86 & 1) * uVar85) |
                 !(bool)(bVar82 & 1) * auVar145._0_4_;
            bVar91 = (bool)((byte)(uVar92 >> 1) & 1);
            auVar145._4_4_ =
                 (uint)bVar91 * ((uint)bVar19 * auVar107._4_4_ | !bVar19 * uVar154) |
                 !bVar91 * auVar145._4_4_;
            bVar19 = (bool)((byte)(uVar92 >> 2) & 1);
            auVar145._8_4_ =
                 (uint)bVar19 * ((uint)bVar20 * auVar107._8_4_ | !bVar20 * uVar155) |
                 !bVar19 * auVar145._8_4_;
            bVar19 = (bool)((byte)(uVar92 >> 3) & 1);
            auVar145._12_4_ =
                 (uint)bVar19 * ((uint)bVar21 * auVar107._12_4_ | !bVar21 * uVar156) |
                 !bVar19 * auVar145._12_4_;
            bVar19 = (bool)((byte)(uVar92 >> 4) & 1);
            auVar145._16_4_ =
                 (uint)bVar19 * ((uint)bVar22 * auVar107._16_4_ | !bVar22 * uVar157) |
                 !bVar19 * auVar145._16_4_;
            bVar19 = (bool)((byte)(uVar92 >> 5) & 1);
            auVar145._20_4_ =
                 (uint)bVar19 * ((uint)bVar23 * auVar107._20_4_ | !bVar23 * uVar158) |
                 !bVar19 * auVar145._20_4_;
            bVar19 = (bool)((byte)(uVar92 >> 6) & 1);
            auVar145._24_4_ =
                 (uint)bVar19 * ((uint)bVar24 * auVar107._24_4_ | !bVar24 * uVar159) |
                 !bVar19 * auVar145._24_4_;
            bVar19 = SUB81(uVar92 >> 7,0);
            auVar145._28_4_ =
                 (uint)bVar19 * ((uint)bVar25 * auVar107._28_4_ | !bVar25 * uVar160) |
                 !bVar19 * auVar145._28_4_;
            bVar87 = (~bVar82 | bVar86) & bVar87;
          }
        }
        auVar286._8_4_ = 0x7fffffff;
        auVar286._0_8_ = 0x7fffffff7fffffff;
        auVar286._12_4_ = 0x7fffffff;
        auVar292 = ZEXT3264(auVar291);
        auVar289 = ZEXT1664(auVar286);
        auVar107 = vmulps_avx512vl(local_ac0,auVar114);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar106,auVar110);
        auVar107 = vfmadd231ps_avx512vl(auVar107,local_aa0,auVar285._0_32_);
        _local_500 = _local_920;
        local_4e0 = vminps_avx(local_780,auVar144);
        auVar265._8_4_ = 0x7fffffff;
        auVar265._0_8_ = 0x7fffffff7fffffff;
        auVar265._12_4_ = 0x7fffffff;
        auVar265._16_4_ = 0x7fffffff;
        auVar265._20_4_ = 0x7fffffff;
        auVar265._24_4_ = 0x7fffffff;
        auVar265._28_4_ = 0x7fffffff;
        auVar107 = vandps_avx(auVar107,auVar265);
        _local_880 = vmaxps_avx(_local_920,auVar145);
        auVar259 = ZEXT3264(_local_880);
        _local_7a0 = _local_880;
        auVar177._8_4_ = 0x3e99999a;
        auVar177._0_8_ = 0x3e99999a3e99999a;
        auVar177._12_4_ = 0x3e99999a;
        auVar177._16_4_ = 0x3e99999a;
        auVar177._20_4_ = 0x3e99999a;
        auVar177._24_4_ = 0x3e99999a;
        auVar177._28_4_ = 0x3e99999a;
        uVar34 = vcmpps_avx512vl(auVar107,auVar177,1);
        uVar35 = vcmpps_avx512vl(_local_920,local_4e0,2);
        bVar82 = (byte)uVar35 & bVar84;
        uVar36 = vcmpps_avx512vl(_local_880,local_780,2);
        if ((bVar84 & ((byte)uVar36 | (byte)uVar35)) == 0) {
          auVar184 = ZEXT3264(auVar265);
          auVar277 = ZEXT3264(_DAT_02020f20);
          auVar107 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar300 = ZEXT3264(auVar107);
        }
        else {
          auVar107 = vmulps_avx512vl(local_ac0,auVar111);
          auVar107 = vfmadd213ps_avx512vl(auVar121,auVar106,auVar107);
          auVar107 = vfmadd213ps_avx512vl(auVar113,local_aa0,auVar107);
          auVar107 = vandps_avx(auVar107,auVar265);
          uVar35 = vcmpps_avx512vl(auVar107,auVar177,1);
          bVar86 = (byte)uVar35 | ~bVar87;
          auVar178._8_4_ = 2;
          auVar178._0_8_ = 0x200000002;
          auVar178._12_4_ = 2;
          auVar178._16_4_ = 2;
          auVar178._20_4_ = 2;
          auVar178._24_4_ = 2;
          auVar178._28_4_ = 2;
          auVar49._8_4_ = 3;
          auVar49._0_8_ = 0x300000003;
          auVar49._12_4_ = 3;
          auVar49._16_4_ = 3;
          auVar49._20_4_ = 3;
          auVar49._24_4_ = 3;
          auVar49._28_4_ = 3;
          auVar107 = vpblendmd_avx512vl(auVar178,auVar49);
          local_760._0_4_ = (uint)(bVar86 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar86 & 1) * 2;
          bVar19 = (bool)(bVar86 >> 1 & 1);
          local_760._4_4_ = (uint)bVar19 * auVar107._4_4_ | (uint)!bVar19 * 2;
          bVar19 = (bool)(bVar86 >> 2 & 1);
          local_760._8_4_ = (uint)bVar19 * auVar107._8_4_ | (uint)!bVar19 * 2;
          bVar19 = (bool)(bVar86 >> 3 & 1);
          local_760._12_4_ = (uint)bVar19 * auVar107._12_4_ | (uint)!bVar19 * 2;
          bVar19 = (bool)(bVar86 >> 4 & 1);
          local_760._16_4_ = (uint)bVar19 * auVar107._16_4_ | (uint)!bVar19 * 2;
          bVar19 = (bool)(bVar86 >> 5 & 1);
          local_760._20_4_ = (uint)bVar19 * auVar107._20_4_ | (uint)!bVar19 * 2;
          bVar19 = (bool)(bVar86 >> 6 & 1);
          local_760._24_4_ = (uint)bVar19 * auVar107._24_4_ | (uint)!bVar19 * 2;
          local_760._28_4_ = (uint)(bVar86 >> 7) * auVar107._28_4_ | (uint)!(bool)(bVar86 >> 7) * 2;
          auVar184._0_32_ = vpbroadcastd_avx512vl();
          auVar184._32_32_ = auVar108;
          local_7e0 = auVar184._0_32_;
          uVar35 = vpcmpd_avx512vl(auVar184._0_32_,local_760,5);
          bVar86 = (byte)uVar35 & bVar82;
          if (bVar86 != 0) {
            auVar284 = vminps_avx(local_9c0._0_16_,local_a00._0_16_);
            auVar99 = vmaxps_avx(local_9c0._0_16_,local_a00._0_16_);
            auVar100 = vminps_avx(local_9e0._0_16_,local_a20._0_16_);
            auVar33 = vminps_avx(auVar284,auVar100);
            auVar284 = vmaxps_avx(local_9e0._0_16_,local_a20._0_16_);
            auVar100 = vmaxps_avx(auVar99,auVar284);
            auVar99 = vandps_avx(auVar286,auVar33);
            auVar284 = vandps_avx(auVar286,auVar100);
            auVar99 = vmaxps_avx(auVar99,auVar284);
            auVar284 = vmovshdup_avx(auVar99);
            auVar284 = vmaxss_avx(auVar284,auVar99);
            auVar99 = vshufpd_avx(auVar99,auVar99,1);
            auVar99 = vmaxss_avx(auVar99,auVar284);
            fVar276 = auVar99._0_4_ * 1.9073486e-06;
            local_9a0 = vshufps_avx(auVar100,auVar100,0xff);
            local_860 = (float)local_920._0_4_ + (float)local_900._0_4_;
            fStack_85c = (float)local_920._4_4_ + (float)local_900._4_4_;
            fStack_858 = fStack_918 + fStack_8f8;
            fStack_854 = fStack_914 + fStack_8f4;
            fStack_850 = fStack_910 + fStack_8f0;
            fStack_84c = fStack_90c + fStack_8ec;
            fStack_848 = fStack_908 + fStack_8e8;
            fStack_844 = fStack_904 + fStack_8e4;
            do {
              auVar179._8_4_ = 0x7f800000;
              auVar179._0_8_ = 0x7f8000007f800000;
              auVar179._12_4_ = 0x7f800000;
              auVar179._16_4_ = 0x7f800000;
              auVar179._20_4_ = 0x7f800000;
              auVar179._24_4_ = 0x7f800000;
              auVar179._28_4_ = 0x7f800000;
              auVar108 = vblendmps_avx512vl(auVar179,_local_920);
              auVar146._0_4_ =
                   (uint)(bVar86 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar86 & 1) * 0x7f800000;
              bVar19 = (bool)(bVar86 >> 1 & 1);
              auVar146._4_4_ = (uint)bVar19 * auVar108._4_4_ | (uint)!bVar19 * 0x7f800000;
              bVar19 = (bool)(bVar86 >> 2 & 1);
              auVar146._8_4_ = (uint)bVar19 * auVar108._8_4_ | (uint)!bVar19 * 0x7f800000;
              bVar19 = (bool)(bVar86 >> 3 & 1);
              auVar146._12_4_ = (uint)bVar19 * auVar108._12_4_ | (uint)!bVar19 * 0x7f800000;
              bVar19 = (bool)(bVar86 >> 4 & 1);
              auVar146._16_4_ = (uint)bVar19 * auVar108._16_4_ | (uint)!bVar19 * 0x7f800000;
              bVar19 = (bool)(bVar86 >> 5 & 1);
              auVar146._20_4_ = (uint)bVar19 * auVar108._20_4_ | (uint)!bVar19 * 0x7f800000;
              auVar146._24_4_ =
                   (uint)(bVar86 >> 6) * auVar108._24_4_ | (uint)!(bool)(bVar86 >> 6) * 0x7f800000;
              auVar146._28_4_ = 0x7f800000;
              auVar184._0_32_ = auVar146;
              auVar108 = vshufps_avx(auVar146,auVar146,0xb1);
              auVar108 = vminps_avx(auVar146,auVar108);
              auVar107 = vshufpd_avx(auVar108,auVar108,5);
              auVar108 = vminps_avx(auVar108,auVar107);
              auVar107 = vpermpd_avx2(auVar108,0x4e);
              auVar108 = vminps_avx(auVar108,auVar107);
              uVar35 = vcmpps_avx512vl(auVar146,auVar108,0);
              bVar79 = (byte)uVar35 & bVar86;
              bVar80 = bVar86;
              if (bVar79 != 0) {
                bVar80 = bVar79;
              }
              iVar2 = 0;
              for (uVar85 = (uint)bVar80; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x80000000) {
                iVar2 = iVar2 + 1;
              }
              uVar85 = *(uint *)(local_820 + (uint)(iVar2 << 2));
              fVar278 = *(float *)(local_500 + (uint)(iVar2 << 2));
              fVar279 = auVar96._0_4_;
              if ((float)local_a40._0_4_ < 0.0) {
                fVar279 = sqrtf((float)local_a40._0_4_);
              }
              auVar285 = ZEXT464(uVar85);
              lVar90 = 4;
              do {
                auVar108 = auVar184._32_32_;
                auVar167._4_4_ = fVar278;
                auVar167._0_4_ = fVar278;
                auVar167._8_4_ = fVar278;
                auVar167._12_4_ = fVar278;
                auVar99 = vfmadd132ps_fma(auVar167,ZEXT816(0) << 0x40,local_a30);
                fVar282 = auVar285._0_4_;
                fVar254 = 1.0 - fVar282;
                fVar267 = fVar254 * fVar254 * fVar254;
                fVar280 = fVar282 * fVar282;
                fVar269 = fVar282 * fVar280;
                auVar284 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar267),
                                           ZEXT416((uint)fVar269));
                fVar266 = fVar282 * fVar254;
                auVar98 = ZEXT416((uint)fVar254);
                auVar33 = vfmadd231ss_fma(ZEXT416((uint)(fVar282 * fVar266 * 6.0)),
                                          ZEXT416((uint)(fVar266 * fVar254)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar100 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar269),
                                           ZEXT416((uint)fVar267));
                auVar101 = vfmadd231ss_fma(ZEXT416((uint)(fVar266 * fVar254 * 6.0)),
                                           SUB6416(ZEXT464(0x41400000),0),
                                           ZEXT416((uint)(fVar282 * fVar266)));
                fVar267 = fVar267 * 0.16666667;
                fVar281 = (auVar284._0_4_ + auVar33._0_4_) * 0.16666667;
                fVar253 = (auVar100._0_4_ + auVar101._0_4_) * 0.16666667;
                fVar269 = fVar269 * 0.16666667;
                auVar216._0_4_ = fVar269 * (float)local_a20._0_4_;
                auVar216._4_4_ = fVar269 * (float)local_a20._4_4_;
                auVar216._8_4_ = fVar269 * fStack_a18;
                auVar216._12_4_ = fVar269 * fStack_a14;
                auVar246._4_4_ = fVar253;
                auVar246._0_4_ = fVar253;
                auVar246._8_4_ = fVar253;
                auVar246._12_4_ = fVar253;
                auVar284 = vfmadd132ps_fma(auVar246,auVar216,local_9e0._0_16_);
                auVar217._4_4_ = fVar281;
                auVar217._0_4_ = fVar281;
                auVar217._8_4_ = fVar281;
                auVar217._12_4_ = fVar281;
                auVar284 = vfmadd132ps_fma(auVar217,auVar284,local_a00._0_16_);
                auVar194._4_4_ = fVar267;
                auVar194._0_4_ = fVar267;
                auVar194._8_4_ = fVar267;
                auVar194._12_4_ = fVar267;
                auVar284 = vfmadd132ps_fma(auVar194,auVar284,local_9c0._0_16_);
                local_8e0._0_16_ = auVar284;
                auVar99 = vsubps_avx(auVar99,auVar284);
                local_a60._0_16_ = auVar99;
                auVar99 = vdpps_avx(auVar99,auVar99,0x7f);
                auVar284 = auVar285._0_16_;
                local_a80._0_16_ = auVar99;
                if (auVar99._0_4_ < 0.0) {
                  local_b20._0_4_ = fVar280;
                  auVar289._0_4_ = sqrtf(auVar99._0_4_);
                  auVar289._4_60_ = extraout_var;
                  auVar99 = auVar289._0_16_;
                }
                else {
                  auVar99 = vsqrtss_avx(auVar99,auVar99);
                  local_b20._0_4_ = fVar280;
                }
                auVar33 = vfnmsub213ss_fma(auVar284,auVar284,ZEXT416((uint)(fVar266 * 4.0)));
                auVar100 = vfmadd231ss_fma(ZEXT416((uint)(fVar266 * 4.0)),auVar98,auVar98);
                fVar280 = fVar254 * -fVar254 * 0.5;
                fVar266 = auVar33._0_4_ * 0.5;
                fVar267 = auVar100._0_4_ * 0.5;
                local_b20._0_4_ = (float)local_b20._0_4_ * 0.5;
                auVar235._0_4_ = (float)local_b20._0_4_ * (float)local_a20._0_4_;
                auVar235._4_4_ = (float)local_b20._0_4_ * (float)local_a20._4_4_;
                auVar235._8_4_ = (float)local_b20._0_4_ * fStack_a18;
                auVar235._12_4_ = (float)local_b20._0_4_ * fStack_a14;
                auVar195._4_4_ = fVar267;
                auVar195._0_4_ = fVar267;
                auVar195._8_4_ = fVar267;
                auVar195._12_4_ = fVar267;
                auVar100 = vfmadd132ps_fma(auVar195,auVar235,local_9e0._0_16_);
                auVar218._4_4_ = fVar266;
                auVar218._0_4_ = fVar266;
                auVar218._8_4_ = fVar266;
                auVar218._12_4_ = fVar266;
                auVar100 = vfmadd132ps_fma(auVar218,auVar100,local_a00._0_16_);
                auVar293._4_4_ = fVar280;
                auVar293._0_4_ = fVar280;
                auVar293._8_4_ = fVar280;
                auVar293._12_4_ = fVar280;
                local_b20._0_16_ = vfmadd132ps_fma(auVar293,auVar100,local_9c0._0_16_);
                local_950 = vdpps_avx(local_b20._0_16_,local_b20._0_16_,0x7f);
                auVar64._12_4_ = 0;
                auVar64._0_12_ = ZEXT812(0);
                fVar280 = local_950._0_4_;
                auVar100 = vrsqrt14ss_avx512f(auVar64 << 0x20,ZEXT416((uint)fVar280));
                fVar266 = auVar100._0_4_;
                local_960 = vrcp14ss_avx512f(auVar64 << 0x20,ZEXT416((uint)fVar280));
                auVar100 = vfnmadd213ss_fma(local_960,local_950,ZEXT416(0x40000000));
                uVar85 = auVar99._0_4_;
                local_940 = fVar254;
                fStack_93c = fVar254;
                fStack_938 = fVar254;
                fStack_934 = fVar254;
                if (fVar280 < -fVar280) {
                  auVar277._0_4_ = sqrtf(fVar280);
                  auVar277._4_60_ = extraout_var_00;
                  auVar99 = ZEXT416(uVar85);
                  auVar101 = auVar277._0_16_;
                  auVar33 = local_b20._0_16_;
                }
                else {
                  auVar101 = vsqrtss_avx512f(local_950,local_950);
                  auVar33 = local_b20._0_16_;
                }
                fVar280 = fVar266 * 1.5 + fVar280 * -0.5 * fVar266 * fVar266 * fVar266;
                auVar168._0_4_ = auVar33._0_4_ * fVar280;
                auVar168._4_4_ = auVar33._4_4_ * fVar280;
                auVar168._8_4_ = auVar33._8_4_ * fVar280;
                auVar168._12_4_ = auVar33._12_4_ * fVar280;
                auVar283 = vdpps_avx(local_a60._0_16_,auVar168,0x7f);
                fVar281 = auVar99._0_4_;
                fVar266 = auVar283._0_4_;
                auVar169._0_4_ = fVar266 * fVar266;
                auVar169._4_4_ = auVar283._4_4_ * auVar283._4_4_;
                auVar169._8_4_ = auVar283._8_4_ * auVar283._8_4_;
                auVar169._12_4_ = auVar283._12_4_ * auVar283._12_4_;
                auVar102 = vsubps_avx512vl(local_a80._0_16_,auVar169);
                fVar267 = auVar102._0_4_;
                auVar196._4_12_ = ZEXT812(0) << 0x20;
                auVar196._0_4_ = fVar267;
                auVar103 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar196);
                auVar104 = vmulss_avx512f(auVar103,ZEXT416(0x3fc00000));
                auVar105 = vmulss_avx512f(auVar102,ZEXT416(0xbf000000));
                if (fVar267 < 0.0) {
                  local_980 = fVar280;
                  fStack_97c = fVar280;
                  fStack_978 = fVar280;
                  fStack_974 = fVar280;
                  local_970 = auVar103;
                  fVar267 = sqrtf(fVar267);
                  auVar105 = ZEXT416(auVar105._0_4_);
                  auVar104 = ZEXT416(auVar104._0_4_);
                  auVar101 = ZEXT416(auVar101._0_4_);
                  auVar99 = ZEXT416(uVar85);
                  auVar33 = local_b20._0_16_;
                  auVar103 = local_970;
                  fVar280 = local_980;
                  fVar253 = fStack_97c;
                  fVar269 = fStack_978;
                  fVar254 = fStack_974;
                }
                else {
                  auVar102 = vsqrtss_avx(auVar102,auVar102);
                  fVar267 = auVar102._0_4_;
                  fVar253 = fVar280;
                  fVar269 = fVar280;
                  fVar254 = fVar280;
                }
                auVar297 = ZEXT1664(auVar33);
                auVar287._8_4_ = 0x7fffffff;
                auVar287._0_8_ = 0x7fffffff7fffffff;
                auVar287._12_4_ = 0x7fffffff;
                auVar289 = ZEXT1664(auVar287);
                auVar301 = ZEXT3264(local_aa0);
                auVar149._32_32_ = auVar108;
                auVar149._0_32_ = local_ac0;
                auVar299 = ZEXT3264(local_ac0);
                auVar102 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar98,auVar284);
                auVar284 = vfmadd231ss_fma(auVar98,auVar284,SUB6416(ZEXT464(0xc0000000),0));
                auVar219._0_4_ = fVar282 * (float)local_a20._0_4_;
                auVar219._4_4_ = fVar282 * (float)local_a20._4_4_;
                auVar219._8_4_ = fVar282 * fStack_a18;
                auVar219._12_4_ = fVar282 * fStack_a14;
                auVar236._0_4_ = auVar284._0_4_;
                auVar236._4_4_ = auVar236._0_4_;
                auVar236._8_4_ = auVar236._0_4_;
                auVar236._12_4_ = auVar236._0_4_;
                auVar284 = vfmadd132ps_fma(auVar236,auVar219,local_9e0._0_16_);
                auVar197._0_4_ = auVar102._0_4_;
                auVar197._4_4_ = auVar197._0_4_;
                auVar197._8_4_ = auVar197._0_4_;
                auVar197._12_4_ = auVar197._0_4_;
                auVar284 = vfmadd132ps_fma(auVar197,auVar284,local_a00._0_16_);
                auVar74._4_4_ = fStack_93c;
                auVar74._0_4_ = local_940;
                auVar74._8_4_ = fStack_938;
                auVar74._12_4_ = fStack_934;
                auVar284 = vfmadd132ps_fma(auVar74,auVar284,local_9c0._0_16_);
                auVar198._0_4_ = auVar284._0_4_ * (float)local_950._0_4_;
                auVar198._4_4_ = auVar284._4_4_ * (float)local_950._0_4_;
                auVar198._8_4_ = auVar284._8_4_ * (float)local_950._0_4_;
                auVar198._12_4_ = auVar284._12_4_ * (float)local_950._0_4_;
                auVar284 = vdpps_avx(auVar33,auVar284,0x7f);
                fVar268 = auVar284._0_4_;
                auVar220._0_4_ = auVar33._0_4_ * fVar268;
                auVar220._4_4_ = auVar33._4_4_ * fVar268;
                auVar220._8_4_ = auVar33._8_4_ * fVar268;
                auVar220._12_4_ = auVar33._12_4_ * fVar268;
                auVar284 = vsubps_avx(auVar198,auVar220);
                fVar268 = auVar100._0_4_ * (float)local_960._0_4_;
                auVar41._8_4_ = 0x80000000;
                auVar41._0_8_ = 0x8000000080000000;
                auVar41._12_4_ = 0x80000000;
                auVar184._16_48_ = auVar149._16_48_;
                auVar102 = vxorps_avx512vl(auVar33,auVar41);
                auVar247._0_4_ = fVar280 * auVar284._0_4_ * fVar268;
                auVar247._4_4_ = fVar253 * auVar284._4_4_ * fVar268;
                auVar247._8_4_ = fVar269 * auVar284._8_4_ * fVar268;
                auVar247._12_4_ = fVar254 * auVar284._12_4_ * fVar268;
                auVar292 = ZEXT1664(auVar168);
                auVar284 = vdpps_avx(auVar102,auVar168,0x7f);
                auVar98 = vmaxss_avx(ZEXT416((uint)fVar276),
                                     ZEXT416((uint)(fVar278 * fVar279 * 1.9073486e-06)));
                auVar101 = vdivss_avx512f(ZEXT416((uint)fVar276),auVar101);
                auVar100 = vdpps_avx(local_a60._0_16_,auVar247,0x7f);
                auVar99 = vfmadd213ss_fma(auVar99,ZEXT416((uint)fVar276),auVar98);
                auVar101 = vfmadd213ss_fma(ZEXT416((uint)(fVar281 + 1.0)),auVar101,auVar99);
                auVar99 = vdpps_avx(local_a30,auVar168,0x7f);
                fVar280 = auVar284._0_4_ + auVar100._0_4_;
                auVar284 = vdpps_avx(local_a60._0_16_,auVar102,0x7f);
                auVar102 = vmulss_avx512f(auVar105,auVar103);
                auVar103 = vmulss_avx512f(auVar103,auVar103);
                auVar100 = vdpps_avx(local_a60._0_16_,local_a30,0x7f);
                auVar184._0_16_ =
                     vaddss_avx512f(auVar104,ZEXT416((uint)(auVar102._0_4_ * auVar103._0_4_)));
                auVar103 = vfnmadd231ss_fma(auVar284,auVar283,ZEXT416((uint)fVar280));
                auVar102 = vfnmadd231ss_fma(auVar100,auVar283,auVar99);
                auVar284 = vpermilps_avx(local_8e0._0_16_,0xff);
                fVar267 = fVar267 - auVar284._0_4_;
                auVar284 = vshufps_avx(auVar33,auVar33,0xff);
                auVar100 = vfmsub213ss_fma(auVar103,auVar184._0_16_,auVar284);
                fVar281 = auVar102._0_4_ * auVar184._0_4_;
                auVar103 = vfmsub231ss_fma(ZEXT416((uint)(auVar99._0_4_ * auVar100._0_4_)),
                                           ZEXT416((uint)fVar280),ZEXT416((uint)fVar281));
                fVar269 = auVar103._0_4_;
                fVar253 = fVar266 * (auVar100._0_4_ / fVar269);
                auVar259 = ZEXT464((uint)fVar253);
                fVar282 = fVar282 - (fVar266 * (fVar281 / fVar269) -
                                    fVar267 * (auVar99._0_4_ / fVar269));
                auVar285 = ZEXT464((uint)fVar282);
                fVar278 = fVar278 - (fVar267 * (fVar280 / fVar269) - fVar253);
                auVar99 = vandps_avx(auVar283,auVar287);
                if (auVar101._0_4_ <= auVar99._0_4_) {
LAB_01c3fcc6:
                  bVar19 = false;
                }
                else {
                  auVar100 = vfmadd231ss_fma(ZEXT416((uint)(auVar101._0_4_ + auVar98._0_4_)),
                                             local_9a0,ZEXT416(0x36000000));
                  auVar99 = vandps_avx(auVar287,ZEXT416((uint)fVar267));
                  if (auVar100._0_4_ <= auVar99._0_4_) goto LAB_01c3fcc6;
                  fVar278 = fVar278 + (float)local_990._0_4_;
                  bVar19 = true;
                  if ((((fVar161 <= fVar278) &&
                       (fVar280 = *(float *)(ray + k * 4 + 0x200), fVar278 <= fVar280)) &&
                      (0.0 <= fVar282)) && (fVar282 <= 1.0)) {
                    auVar150._16_48_ = auVar184._16_48_;
                    auVar150._0_16_ = ZEXT816(0) << 0x20;
                    auVar228._4_60_ = auVar150._4_60_;
                    auVar228._0_4_ = local_a80._0_4_;
                    auVar99 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar228._0_16_);
                    fVar266 = auVar99._0_4_;
                    auVar184._0_16_ = vmulss_avx512f(local_a80._0_16_,ZEXT416(0xbf000000));
                    pGVar13 = (context->scene->geometries).items[uVar83].ptr;
                    if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                      fVar266 = fVar266 * 1.5 + auVar184._0_4_ * fVar266 * fVar266 * fVar266;
                      auVar199._0_4_ = local_a60._0_4_ * fVar266;
                      auVar199._4_4_ = local_a60._4_4_ * fVar266;
                      auVar199._8_4_ = local_a60._8_4_ * fVar266;
                      auVar199._12_4_ = local_a60._12_4_ * fVar266;
                      auVar101 = vfmadd213ps_fma(auVar284,auVar199,auVar33);
                      auVar99 = vshufps_avx(auVar199,auVar199,0xc9);
                      auVar284 = vshufps_avx(auVar33,auVar33,0xc9);
                      auVar200._0_4_ = auVar199._0_4_ * auVar284._0_4_;
                      auVar200._4_4_ = auVar199._4_4_ * auVar284._4_4_;
                      auVar200._8_4_ = auVar199._8_4_ * auVar284._8_4_;
                      auVar200._12_4_ = auVar199._12_4_ * auVar284._12_4_;
                      auVar100 = vfmsub231ps_fma(auVar200,auVar33,auVar99);
                      auVar99 = vshufps_avx(auVar100,auVar100,0xc9);
                      auVar284 = vshufps_avx(auVar101,auVar101,0xc9);
                      auVar100 = vshufps_avx(auVar100,auVar100,0xd2);
                      auVar170._0_4_ = auVar101._0_4_ * auVar100._0_4_;
                      auVar170._4_4_ = auVar101._4_4_ * auVar100._4_4_;
                      auVar170._8_4_ = auVar101._8_4_ * auVar100._8_4_;
                      auVar170._12_4_ = auVar101._12_4_ * auVar100._12_4_;
                      auVar99 = vfmsub231ps_fma(auVar170,auVar99,auVar284);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x200) = fVar278;
                        uVar10 = vextractps_avx(auVar99,1);
                        *(undefined4 *)(ray + k * 4 + 0x300) = uVar10;
                        uVar10 = vextractps_avx(auVar99,2);
                        *(undefined4 *)(ray + k * 4 + 0x340) = uVar10;
                        *(int *)(ray + k * 4 + 0x380) = auVar99._0_4_;
                        *(float *)(ray + k * 4 + 0x3c0) = fVar282;
                        *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                        *(uint *)(ray + k * 4 + 0x440) = uVar12;
                        *(uint *)(ray + k * 4 + 0x480) = uVar83;
                        *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar17 = context->user;
                        auVar284 = ZEXT416((uint)fVar282);
                        local_340 = vbroadcastss_avx512f(auVar284);
                        auVar184 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar184 = vpermps_avx512f(auVar184,ZEXT1664(auVar99));
                        auVar277 = vbroadcastss_avx512f(ZEXT416(2));
                        local_3c0 = vpermps_avx512f(auVar277,ZEXT1664(auVar99));
                        local_380 = vbroadcastss_avx512f(auVar99);
                        local_400[0] = (RTCHitN)auVar184[0];
                        local_400[1] = (RTCHitN)auVar184[1];
                        local_400[2] = (RTCHitN)auVar184[2];
                        local_400[3] = (RTCHitN)auVar184[3];
                        local_400[4] = (RTCHitN)auVar184[4];
                        local_400[5] = (RTCHitN)auVar184[5];
                        local_400[6] = (RTCHitN)auVar184[6];
                        local_400[7] = (RTCHitN)auVar184[7];
                        local_400[8] = (RTCHitN)auVar184[8];
                        local_400[9] = (RTCHitN)auVar184[9];
                        local_400[10] = (RTCHitN)auVar184[10];
                        local_400[0xb] = (RTCHitN)auVar184[0xb];
                        local_400[0xc] = (RTCHitN)auVar184[0xc];
                        local_400[0xd] = (RTCHitN)auVar184[0xd];
                        local_400[0xe] = (RTCHitN)auVar184[0xe];
                        local_400[0xf] = (RTCHitN)auVar184[0xf];
                        local_400[0x10] = (RTCHitN)auVar184[0x10];
                        local_400[0x11] = (RTCHitN)auVar184[0x11];
                        local_400[0x12] = (RTCHitN)auVar184[0x12];
                        local_400[0x13] = (RTCHitN)auVar184[0x13];
                        local_400[0x14] = (RTCHitN)auVar184[0x14];
                        local_400[0x15] = (RTCHitN)auVar184[0x15];
                        local_400[0x16] = (RTCHitN)auVar184[0x16];
                        local_400[0x17] = (RTCHitN)auVar184[0x17];
                        local_400[0x18] = (RTCHitN)auVar184[0x18];
                        local_400[0x19] = (RTCHitN)auVar184[0x19];
                        local_400[0x1a] = (RTCHitN)auVar184[0x1a];
                        local_400[0x1b] = (RTCHitN)auVar184[0x1b];
                        local_400[0x1c] = (RTCHitN)auVar184[0x1c];
                        local_400[0x1d] = (RTCHitN)auVar184[0x1d];
                        local_400[0x1e] = (RTCHitN)auVar184[0x1e];
                        local_400[0x1f] = (RTCHitN)auVar184[0x1f];
                        local_400[0x20] = (RTCHitN)auVar184[0x20];
                        local_400[0x21] = (RTCHitN)auVar184[0x21];
                        local_400[0x22] = (RTCHitN)auVar184[0x22];
                        local_400[0x23] = (RTCHitN)auVar184[0x23];
                        local_400[0x24] = (RTCHitN)auVar184[0x24];
                        local_400[0x25] = (RTCHitN)auVar184[0x25];
                        local_400[0x26] = (RTCHitN)auVar184[0x26];
                        local_400[0x27] = (RTCHitN)auVar184[0x27];
                        local_400[0x28] = (RTCHitN)auVar184[0x28];
                        local_400[0x29] = (RTCHitN)auVar184[0x29];
                        local_400[0x2a] = (RTCHitN)auVar184[0x2a];
                        local_400[0x2b] = (RTCHitN)auVar184[0x2b];
                        local_400[0x2c] = (RTCHitN)auVar184[0x2c];
                        local_400[0x2d] = (RTCHitN)auVar184[0x2d];
                        local_400[0x2e] = (RTCHitN)auVar184[0x2e];
                        local_400[0x2f] = (RTCHitN)auVar184[0x2f];
                        local_400[0x30] = (RTCHitN)auVar184[0x30];
                        local_400[0x31] = (RTCHitN)auVar184[0x31];
                        local_400[0x32] = (RTCHitN)auVar184[0x32];
                        local_400[0x33] = (RTCHitN)auVar184[0x33];
                        local_400[0x34] = (RTCHitN)auVar184[0x34];
                        local_400[0x35] = (RTCHitN)auVar184[0x35];
                        local_400[0x36] = (RTCHitN)auVar184[0x36];
                        local_400[0x37] = (RTCHitN)auVar184[0x37];
                        local_400[0x38] = (RTCHitN)auVar184[0x38];
                        local_400[0x39] = (RTCHitN)auVar184[0x39];
                        local_400[0x3a] = (RTCHitN)auVar184[0x3a];
                        local_400[0x3b] = (RTCHitN)auVar184[0x3b];
                        local_400[0x3c] = (RTCHitN)auVar184[0x3c];
                        local_400[0x3d] = (RTCHitN)auVar184[0x3d];
                        local_400[0x3e] = (RTCHitN)auVar184[0x3e];
                        local_400[0x3f] = (RTCHitN)auVar184[0x3f];
                        local_300 = 0;
                        uStack_2f8 = 0;
                        uStack_2f0 = 0;
                        uStack_2e8 = 0;
                        uStack_2e0 = 0;
                        uStack_2d8 = 0;
                        uStack_2d0 = 0;
                        uStack_2c8 = 0;
                        local_2c0 = local_480._0_8_;
                        uStack_2b8 = local_480._8_8_;
                        uStack_2b0 = local_480._16_8_;
                        uStack_2a8 = local_480._24_8_;
                        uStack_2a0 = local_480._32_8_;
                        uStack_298 = local_480._40_8_;
                        uStack_290 = local_480._48_8_;
                        uStack_288 = local_480._56_8_;
                        auVar184 = vmovdqa64_avx512f(local_440);
                        local_280 = vmovdqa64_avx512f(auVar184);
                        auVar108 = vpcmpeqd_avx2(auVar184._0_32_,auVar184._0_32_);
                        local_ad8[3] = auVar108;
                        local_ad8[2] = auVar108;
                        local_ad8[1] = auVar108;
                        *local_ad8 = auVar108;
                        local_240 = vbroadcastss_avx512f(ZEXT416(pRVar17->instID[0]));
                        local_200 = vbroadcastss_avx512f(ZEXT416(pRVar17->instPrimID[0]));
                        *(float *)(ray + k * 4 + 0x200) = fVar278;
                        local_8c0 = local_4c0;
                        local_b50.valid = (int *)local_8c0;
                        local_b50.geometryUserPtr = pGVar13->userPtr;
                        local_b50.context = context->user;
                        local_b50.hit = local_400;
                        local_b50.N = 0x10;
                        local_b50.ray = (RTCRayN *)ray;
                        if (pGVar13->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar259 = ZEXT464((uint)fVar253);
                          auVar292 = ZEXT1664(auVar168);
                          auVar297 = ZEXT1664(auVar33);
                          (*pGVar13->intersectionFilterN)(&local_b50);
                          auVar285 = ZEXT1664(auVar284);
                          auVar299 = ZEXT3264(local_ac0);
                          auVar301 = ZEXT3264(local_aa0);
                          auVar289 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        auVar184 = vmovdqa64_avx512f(local_8c0);
                        uVar35 = vptestmd_avx512f(auVar184,auVar184);
                        if ((short)uVar35 != 0) {
                          p_Var18 = context->args->filter;
                          if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar259 = ZEXT1664(auVar259._0_16_);
                            auVar292 = ZEXT1664(auVar292._0_16_);
                            auVar297 = ZEXT1664(auVar297._0_16_);
                            (*p_Var18)(&local_b50);
                            auVar285 = ZEXT1664(auVar284);
                            auVar299 = ZEXT3264(local_ac0);
                            auVar301 = ZEXT3264(local_aa0);
                            auVar289 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar184 = vmovdqa64_avx512f(local_8c0);
                          uVar92 = vptestmd_avx512f(auVar184,auVar184);
                          if ((short)uVar92 != 0) {
                            iVar3 = *(int *)(local_b50.hit + 4);
                            iVar4 = *(int *)(local_b50.hit + 8);
                            iVar5 = *(int *)(local_b50.hit + 0xc);
                            iVar6 = *(int *)(local_b50.hit + 0x10);
                            iVar7 = *(int *)(local_b50.hit + 0x14);
                            iVar8 = *(int *)(local_b50.hit + 0x18);
                            iVar1 = *(int *)(local_b50.hit + 0x1c);
                            iVar66 = *(int *)(local_b50.hit + 0x20);
                            iVar67 = *(int *)(local_b50.hit + 0x24);
                            iVar68 = *(int *)(local_b50.hit + 0x28);
                            iVar69 = *(int *)(local_b50.hit + 0x2c);
                            iVar70 = *(int *)(local_b50.hit + 0x30);
                            iVar71 = *(int *)(local_b50.hit + 0x34);
                            iVar72 = *(int *)(local_b50.hit + 0x38);
                            iVar73 = *(int *)(local_b50.hit + 0x3c);
                            bVar80 = (byte)uVar92;
                            bVar91 = (bool)((byte)(uVar92 >> 1) & 1);
                            bVar20 = (bool)((byte)(uVar92 >> 2) & 1);
                            bVar21 = (bool)((byte)(uVar92 >> 3) & 1);
                            bVar22 = (bool)((byte)(uVar92 >> 4) & 1);
                            bVar23 = (bool)((byte)(uVar92 >> 5) & 1);
                            bVar24 = (bool)((byte)(uVar92 >> 6) & 1);
                            bVar25 = (bool)((byte)(uVar92 >> 7) & 1);
                            bVar79 = (byte)(uVar92 >> 8);
                            bVar26 = (bool)((byte)(uVar92 >> 9) & 1);
                            bVar27 = (bool)((byte)(uVar92 >> 10) & 1);
                            bVar28 = (bool)((byte)(uVar92 >> 0xb) & 1);
                            bVar29 = (bool)((byte)(uVar92 >> 0xc) & 1);
                            bVar30 = (bool)((byte)(uVar92 >> 0xd) & 1);
                            bVar31 = (bool)((byte)(uVar92 >> 0xe) & 1);
                            bVar32 = SUB81(uVar92 >> 0xf,0);
                            *(uint *)(local_b50.ray + 0x300) =
                                 (uint)(bVar80 & 1) * *(int *)local_b50.hit |
                                 (uint)!(bool)(bVar80 & 1) * *(int *)(local_b50.ray + 0x300);
                            *(uint *)(local_b50.ray + 0x304) =
                                 (uint)bVar91 * iVar3 |
                                 (uint)!bVar91 * *(int *)(local_b50.ray + 0x304);
                            *(uint *)(local_b50.ray + 0x308) =
                                 (uint)bVar20 * iVar4 |
                                 (uint)!bVar20 * *(int *)(local_b50.ray + 0x308);
                            *(uint *)(local_b50.ray + 0x30c) =
                                 (uint)bVar21 * iVar5 |
                                 (uint)!bVar21 * *(int *)(local_b50.ray + 0x30c);
                            *(uint *)(local_b50.ray + 0x310) =
                                 (uint)bVar22 * iVar6 |
                                 (uint)!bVar22 * *(int *)(local_b50.ray + 0x310);
                            *(uint *)(local_b50.ray + 0x314) =
                                 (uint)bVar23 * iVar7 |
                                 (uint)!bVar23 * *(int *)(local_b50.ray + 0x314);
                            *(uint *)(local_b50.ray + 0x318) =
                                 (uint)bVar24 * iVar8 |
                                 (uint)!bVar24 * *(int *)(local_b50.ray + 0x318);
                            *(uint *)(local_b50.ray + 0x31c) =
                                 (uint)bVar25 * iVar1 |
                                 (uint)!bVar25 * *(int *)(local_b50.ray + 0x31c);
                            *(uint *)(local_b50.ray + 800) =
                                 (uint)(bVar79 & 1) * iVar66 |
                                 (uint)!(bool)(bVar79 & 1) * *(int *)(local_b50.ray + 800);
                            *(uint *)(local_b50.ray + 0x324) =
                                 (uint)bVar26 * iVar67 |
                                 (uint)!bVar26 * *(int *)(local_b50.ray + 0x324);
                            *(uint *)(local_b50.ray + 0x328) =
                                 (uint)bVar27 * iVar68 |
                                 (uint)!bVar27 * *(int *)(local_b50.ray + 0x328);
                            *(uint *)(local_b50.ray + 0x32c) =
                                 (uint)bVar28 * iVar69 |
                                 (uint)!bVar28 * *(int *)(local_b50.ray + 0x32c);
                            *(uint *)(local_b50.ray + 0x330) =
                                 (uint)bVar29 * iVar70 |
                                 (uint)!bVar29 * *(int *)(local_b50.ray + 0x330);
                            *(uint *)(local_b50.ray + 0x334) =
                                 (uint)bVar30 * iVar71 |
                                 (uint)!bVar30 * *(int *)(local_b50.ray + 0x334);
                            *(uint *)(local_b50.ray + 0x338) =
                                 (uint)bVar31 * iVar72 |
                                 (uint)!bVar31 * *(int *)(local_b50.ray + 0x338);
                            *(uint *)(local_b50.ray + 0x33c) =
                                 (uint)bVar32 * iVar73 |
                                 (uint)!bVar32 * *(int *)(local_b50.ray + 0x33c);
                            iVar3 = *(int *)(local_b50.hit + 0x44);
                            iVar4 = *(int *)(local_b50.hit + 0x48);
                            iVar5 = *(int *)(local_b50.hit + 0x4c);
                            iVar6 = *(int *)(local_b50.hit + 0x50);
                            iVar7 = *(int *)(local_b50.hit + 0x54);
                            iVar8 = *(int *)(local_b50.hit + 0x58);
                            iVar1 = *(int *)(local_b50.hit + 0x5c);
                            iVar66 = *(int *)(local_b50.hit + 0x60);
                            iVar67 = *(int *)(local_b50.hit + 100);
                            iVar68 = *(int *)(local_b50.hit + 0x68);
                            iVar69 = *(int *)(local_b50.hit + 0x6c);
                            iVar70 = *(int *)(local_b50.hit + 0x70);
                            iVar71 = *(int *)(local_b50.hit + 0x74);
                            iVar72 = *(int *)(local_b50.hit + 0x78);
                            iVar73 = *(int *)(local_b50.hit + 0x7c);
                            bVar91 = (bool)((byte)(uVar92 >> 1) & 1);
                            bVar20 = (bool)((byte)(uVar92 >> 2) & 1);
                            bVar21 = (bool)((byte)(uVar92 >> 3) & 1);
                            bVar22 = (bool)((byte)(uVar92 >> 4) & 1);
                            bVar23 = (bool)((byte)(uVar92 >> 5) & 1);
                            bVar24 = (bool)((byte)(uVar92 >> 6) & 1);
                            bVar25 = (bool)((byte)(uVar92 >> 7) & 1);
                            bVar26 = (bool)((byte)(uVar92 >> 9) & 1);
                            bVar27 = (bool)((byte)(uVar92 >> 10) & 1);
                            bVar28 = (bool)((byte)(uVar92 >> 0xb) & 1);
                            bVar29 = (bool)((byte)(uVar92 >> 0xc) & 1);
                            bVar30 = (bool)((byte)(uVar92 >> 0xd) & 1);
                            bVar31 = (bool)((byte)(uVar92 >> 0xe) & 1);
                            bVar32 = SUB81(uVar92 >> 0xf,0);
                            *(uint *)(local_b50.ray + 0x340) =
                                 (uint)(bVar80 & 1) * *(int *)(local_b50.hit + 0x40) |
                                 (uint)!(bool)(bVar80 & 1) * *(int *)(local_b50.ray + 0x340);
                            *(uint *)(local_b50.ray + 0x344) =
                                 (uint)bVar91 * iVar3 |
                                 (uint)!bVar91 * *(int *)(local_b50.ray + 0x344);
                            *(uint *)(local_b50.ray + 0x348) =
                                 (uint)bVar20 * iVar4 |
                                 (uint)!bVar20 * *(int *)(local_b50.ray + 0x348);
                            *(uint *)(local_b50.ray + 0x34c) =
                                 (uint)bVar21 * iVar5 |
                                 (uint)!bVar21 * *(int *)(local_b50.ray + 0x34c);
                            *(uint *)(local_b50.ray + 0x350) =
                                 (uint)bVar22 * iVar6 |
                                 (uint)!bVar22 * *(int *)(local_b50.ray + 0x350);
                            *(uint *)(local_b50.ray + 0x354) =
                                 (uint)bVar23 * iVar7 |
                                 (uint)!bVar23 * *(int *)(local_b50.ray + 0x354);
                            *(uint *)(local_b50.ray + 0x358) =
                                 (uint)bVar24 * iVar8 |
                                 (uint)!bVar24 * *(int *)(local_b50.ray + 0x358);
                            *(uint *)(local_b50.ray + 0x35c) =
                                 (uint)bVar25 * iVar1 |
                                 (uint)!bVar25 * *(int *)(local_b50.ray + 0x35c);
                            *(uint *)(local_b50.ray + 0x360) =
                                 (uint)(bVar79 & 1) * iVar66 |
                                 (uint)!(bool)(bVar79 & 1) * *(int *)(local_b50.ray + 0x360);
                            *(uint *)(local_b50.ray + 0x364) =
                                 (uint)bVar26 * iVar67 |
                                 (uint)!bVar26 * *(int *)(local_b50.ray + 0x364);
                            *(uint *)(local_b50.ray + 0x368) =
                                 (uint)bVar27 * iVar68 |
                                 (uint)!bVar27 * *(int *)(local_b50.ray + 0x368);
                            *(uint *)(local_b50.ray + 0x36c) =
                                 (uint)bVar28 * iVar69 |
                                 (uint)!bVar28 * *(int *)(local_b50.ray + 0x36c);
                            *(uint *)(local_b50.ray + 0x370) =
                                 (uint)bVar29 * iVar70 |
                                 (uint)!bVar29 * *(int *)(local_b50.ray + 0x370);
                            *(uint *)(local_b50.ray + 0x374) =
                                 (uint)bVar30 * iVar71 |
                                 (uint)!bVar30 * *(int *)(local_b50.ray + 0x374);
                            *(uint *)(local_b50.ray + 0x378) =
                                 (uint)bVar31 * iVar72 |
                                 (uint)!bVar31 * *(int *)(local_b50.ray + 0x378);
                            *(uint *)(local_b50.ray + 0x37c) =
                                 (uint)bVar32 * iVar73 |
                                 (uint)!bVar32 * *(int *)(local_b50.ray + 0x37c);
                            iVar3 = *(int *)(local_b50.hit + 0x84);
                            iVar4 = *(int *)(local_b50.hit + 0x88);
                            iVar5 = *(int *)(local_b50.hit + 0x8c);
                            iVar6 = *(int *)(local_b50.hit + 0x90);
                            iVar7 = *(int *)(local_b50.hit + 0x94);
                            iVar8 = *(int *)(local_b50.hit + 0x98);
                            iVar1 = *(int *)(local_b50.hit + 0x9c);
                            iVar66 = *(int *)(local_b50.hit + 0xa0);
                            iVar67 = *(int *)(local_b50.hit + 0xa4);
                            iVar68 = *(int *)(local_b50.hit + 0xa8);
                            iVar69 = *(int *)(local_b50.hit + 0xac);
                            iVar70 = *(int *)(local_b50.hit + 0xb0);
                            iVar71 = *(int *)(local_b50.hit + 0xb4);
                            iVar72 = *(int *)(local_b50.hit + 0xb8);
                            iVar73 = *(int *)(local_b50.hit + 0xbc);
                            bVar91 = (bool)((byte)(uVar92 >> 1) & 1);
                            bVar20 = (bool)((byte)(uVar92 >> 2) & 1);
                            bVar21 = (bool)((byte)(uVar92 >> 3) & 1);
                            bVar22 = (bool)((byte)(uVar92 >> 4) & 1);
                            bVar23 = (bool)((byte)(uVar92 >> 5) & 1);
                            bVar24 = (bool)((byte)(uVar92 >> 6) & 1);
                            bVar25 = (bool)((byte)(uVar92 >> 7) & 1);
                            bVar26 = (bool)((byte)(uVar92 >> 9) & 1);
                            bVar27 = (bool)((byte)(uVar92 >> 10) & 1);
                            bVar28 = (bool)((byte)(uVar92 >> 0xb) & 1);
                            bVar29 = (bool)((byte)(uVar92 >> 0xc) & 1);
                            bVar30 = (bool)((byte)(uVar92 >> 0xd) & 1);
                            bVar31 = (bool)((byte)(uVar92 >> 0xe) & 1);
                            bVar32 = SUB81(uVar92 >> 0xf,0);
                            *(uint *)(local_b50.ray + 0x380) =
                                 (uint)(bVar80 & 1) * *(int *)(local_b50.hit + 0x80) |
                                 (uint)!(bool)(bVar80 & 1) * *(int *)(local_b50.ray + 0x380);
                            *(uint *)(local_b50.ray + 900) =
                                 (uint)bVar91 * iVar3 |
                                 (uint)!bVar91 * *(int *)(local_b50.ray + 900);
                            *(uint *)(local_b50.ray + 0x388) =
                                 (uint)bVar20 * iVar4 |
                                 (uint)!bVar20 * *(int *)(local_b50.ray + 0x388);
                            *(uint *)(local_b50.ray + 0x38c) =
                                 (uint)bVar21 * iVar5 |
                                 (uint)!bVar21 * *(int *)(local_b50.ray + 0x38c);
                            *(uint *)(local_b50.ray + 0x390) =
                                 (uint)bVar22 * iVar6 |
                                 (uint)!bVar22 * *(int *)(local_b50.ray + 0x390);
                            *(uint *)(local_b50.ray + 0x394) =
                                 (uint)bVar23 * iVar7 |
                                 (uint)!bVar23 * *(int *)(local_b50.ray + 0x394);
                            *(uint *)(local_b50.ray + 0x398) =
                                 (uint)bVar24 * iVar8 |
                                 (uint)!bVar24 * *(int *)(local_b50.ray + 0x398);
                            *(uint *)(local_b50.ray + 0x39c) =
                                 (uint)bVar25 * iVar1 |
                                 (uint)!bVar25 * *(int *)(local_b50.ray + 0x39c);
                            *(uint *)(local_b50.ray + 0x3a0) =
                                 (uint)(bVar79 & 1) * iVar66 |
                                 (uint)!(bool)(bVar79 & 1) * *(int *)(local_b50.ray + 0x3a0);
                            *(uint *)(local_b50.ray + 0x3a4) =
                                 (uint)bVar26 * iVar67 |
                                 (uint)!bVar26 * *(int *)(local_b50.ray + 0x3a4);
                            *(uint *)(local_b50.ray + 0x3a8) =
                                 (uint)bVar27 * iVar68 |
                                 (uint)!bVar27 * *(int *)(local_b50.ray + 0x3a8);
                            *(uint *)(local_b50.ray + 0x3ac) =
                                 (uint)bVar28 * iVar69 |
                                 (uint)!bVar28 * *(int *)(local_b50.ray + 0x3ac);
                            *(uint *)(local_b50.ray + 0x3b0) =
                                 (uint)bVar29 * iVar70 |
                                 (uint)!bVar29 * *(int *)(local_b50.ray + 0x3b0);
                            *(uint *)(local_b50.ray + 0x3b4) =
                                 (uint)bVar30 * iVar71 |
                                 (uint)!bVar30 * *(int *)(local_b50.ray + 0x3b4);
                            *(uint *)(local_b50.ray + 0x3b8) =
                                 (uint)bVar31 * iVar72 |
                                 (uint)!bVar31 * *(int *)(local_b50.ray + 0x3b8);
                            *(uint *)(local_b50.ray + 0x3bc) =
                                 (uint)bVar32 * iVar73 |
                                 (uint)!bVar32 * *(int *)(local_b50.ray + 0x3bc);
                            iVar3 = *(int *)(local_b50.hit + 0xc4);
                            iVar4 = *(int *)(local_b50.hit + 200);
                            iVar5 = *(int *)(local_b50.hit + 0xcc);
                            iVar6 = *(int *)(local_b50.hit + 0xd0);
                            iVar7 = *(int *)(local_b50.hit + 0xd4);
                            iVar8 = *(int *)(local_b50.hit + 0xd8);
                            iVar1 = *(int *)(local_b50.hit + 0xdc);
                            iVar66 = *(int *)(local_b50.hit + 0xe0);
                            iVar67 = *(int *)(local_b50.hit + 0xe4);
                            iVar68 = *(int *)(local_b50.hit + 0xe8);
                            iVar69 = *(int *)(local_b50.hit + 0xec);
                            iVar70 = *(int *)(local_b50.hit + 0xf0);
                            iVar71 = *(int *)(local_b50.hit + 0xf4);
                            iVar72 = *(int *)(local_b50.hit + 0xf8);
                            iVar73 = *(int *)(local_b50.hit + 0xfc);
                            bVar91 = (bool)((byte)(uVar92 >> 1) & 1);
                            bVar20 = (bool)((byte)(uVar92 >> 2) & 1);
                            bVar21 = (bool)((byte)(uVar92 >> 3) & 1);
                            bVar22 = (bool)((byte)(uVar92 >> 4) & 1);
                            bVar23 = (bool)((byte)(uVar92 >> 5) & 1);
                            bVar24 = (bool)((byte)(uVar92 >> 6) & 1);
                            bVar25 = (bool)((byte)(uVar92 >> 7) & 1);
                            bVar26 = (bool)((byte)(uVar92 >> 9) & 1);
                            bVar27 = (bool)((byte)(uVar92 >> 10) & 1);
                            bVar28 = (bool)((byte)(uVar92 >> 0xb) & 1);
                            bVar29 = (bool)((byte)(uVar92 >> 0xc) & 1);
                            bVar30 = (bool)((byte)(uVar92 >> 0xd) & 1);
                            bVar31 = (bool)((byte)(uVar92 >> 0xe) & 1);
                            bVar32 = SUB81(uVar92 >> 0xf,0);
                            *(uint *)(local_b50.ray + 0x3c0) =
                                 (uint)(bVar80 & 1) * *(int *)(local_b50.hit + 0xc0) |
                                 (uint)!(bool)(bVar80 & 1) * *(int *)(local_b50.ray + 0x3c0);
                            *(uint *)(local_b50.ray + 0x3c4) =
                                 (uint)bVar91 * iVar3 |
                                 (uint)!bVar91 * *(int *)(local_b50.ray + 0x3c4);
                            *(uint *)(local_b50.ray + 0x3c8) =
                                 (uint)bVar20 * iVar4 |
                                 (uint)!bVar20 * *(int *)(local_b50.ray + 0x3c8);
                            *(uint *)(local_b50.ray + 0x3cc) =
                                 (uint)bVar21 * iVar5 |
                                 (uint)!bVar21 * *(int *)(local_b50.ray + 0x3cc);
                            *(uint *)(local_b50.ray + 0x3d0) =
                                 (uint)bVar22 * iVar6 |
                                 (uint)!bVar22 * *(int *)(local_b50.ray + 0x3d0);
                            *(uint *)(local_b50.ray + 0x3d4) =
                                 (uint)bVar23 * iVar7 |
                                 (uint)!bVar23 * *(int *)(local_b50.ray + 0x3d4);
                            *(uint *)(local_b50.ray + 0x3d8) =
                                 (uint)bVar24 * iVar8 |
                                 (uint)!bVar24 * *(int *)(local_b50.ray + 0x3d8);
                            *(uint *)(local_b50.ray + 0x3dc) =
                                 (uint)bVar25 * iVar1 |
                                 (uint)!bVar25 * *(int *)(local_b50.ray + 0x3dc);
                            *(uint *)(local_b50.ray + 0x3e0) =
                                 (uint)(bVar79 & 1) * iVar66 |
                                 (uint)!(bool)(bVar79 & 1) * *(int *)(local_b50.ray + 0x3e0);
                            *(uint *)(local_b50.ray + 0x3e4) =
                                 (uint)bVar26 * iVar67 |
                                 (uint)!bVar26 * *(int *)(local_b50.ray + 0x3e4);
                            *(uint *)(local_b50.ray + 1000) =
                                 (uint)bVar27 * iVar68 |
                                 (uint)!bVar27 * *(int *)(local_b50.ray + 1000);
                            *(uint *)(local_b50.ray + 0x3ec) =
                                 (uint)bVar28 * iVar69 |
                                 (uint)!bVar28 * *(int *)(local_b50.ray + 0x3ec);
                            *(uint *)(local_b50.ray + 0x3f0) =
                                 (uint)bVar29 * iVar70 |
                                 (uint)!bVar29 * *(int *)(local_b50.ray + 0x3f0);
                            *(uint *)(local_b50.ray + 0x3f4) =
                                 (uint)bVar30 * iVar71 |
                                 (uint)!bVar30 * *(int *)(local_b50.ray + 0x3f4);
                            *(uint *)(local_b50.ray + 0x3f8) =
                                 (uint)bVar31 * iVar72 |
                                 (uint)!bVar31 * *(int *)(local_b50.ray + 0x3f8);
                            *(uint *)(local_b50.ray + 0x3fc) =
                                 (uint)bVar32 * iVar73 |
                                 (uint)!bVar32 * *(int *)(local_b50.ray + 0x3fc);
                            iVar3 = *(int *)(local_b50.hit + 0x104);
                            iVar4 = *(int *)(local_b50.hit + 0x108);
                            iVar5 = *(int *)(local_b50.hit + 0x10c);
                            iVar6 = *(int *)(local_b50.hit + 0x110);
                            iVar7 = *(int *)(local_b50.hit + 0x114);
                            iVar8 = *(int *)(local_b50.hit + 0x118);
                            iVar1 = *(int *)(local_b50.hit + 0x11c);
                            iVar66 = *(int *)(local_b50.hit + 0x120);
                            iVar67 = *(int *)(local_b50.hit + 0x124);
                            iVar68 = *(int *)(local_b50.hit + 0x128);
                            iVar69 = *(int *)(local_b50.hit + 300);
                            iVar70 = *(int *)(local_b50.hit + 0x130);
                            iVar71 = *(int *)(local_b50.hit + 0x134);
                            iVar72 = *(int *)(local_b50.hit + 0x138);
                            iVar73 = *(int *)(local_b50.hit + 0x13c);
                            bVar91 = (bool)((byte)(uVar92 >> 1) & 1);
                            bVar20 = (bool)((byte)(uVar92 >> 2) & 1);
                            bVar21 = (bool)((byte)(uVar92 >> 3) & 1);
                            bVar22 = (bool)((byte)(uVar92 >> 4) & 1);
                            bVar23 = (bool)((byte)(uVar92 >> 5) & 1);
                            bVar24 = (bool)((byte)(uVar92 >> 6) & 1);
                            bVar25 = (bool)((byte)(uVar92 >> 7) & 1);
                            bVar26 = (bool)((byte)(uVar92 >> 9) & 1);
                            bVar27 = (bool)((byte)(uVar92 >> 10) & 1);
                            bVar28 = (bool)((byte)(uVar92 >> 0xb) & 1);
                            bVar29 = (bool)((byte)(uVar92 >> 0xc) & 1);
                            bVar30 = (bool)((byte)(uVar92 >> 0xd) & 1);
                            bVar31 = (bool)((byte)(uVar92 >> 0xe) & 1);
                            bVar32 = SUB81(uVar92 >> 0xf,0);
                            *(uint *)(local_b50.ray + 0x400) =
                                 (uint)(bVar80 & 1) * *(int *)(local_b50.hit + 0x100) |
                                 (uint)!(bool)(bVar80 & 1) * *(int *)(local_b50.ray + 0x400);
                            *(uint *)(local_b50.ray + 0x404) =
                                 (uint)bVar91 * iVar3 |
                                 (uint)!bVar91 * *(int *)(local_b50.ray + 0x404);
                            *(uint *)(local_b50.ray + 0x408) =
                                 (uint)bVar20 * iVar4 |
                                 (uint)!bVar20 * *(int *)(local_b50.ray + 0x408);
                            *(uint *)(local_b50.ray + 0x40c) =
                                 (uint)bVar21 * iVar5 |
                                 (uint)!bVar21 * *(int *)(local_b50.ray + 0x40c);
                            *(uint *)(local_b50.ray + 0x410) =
                                 (uint)bVar22 * iVar6 |
                                 (uint)!bVar22 * *(int *)(local_b50.ray + 0x410);
                            *(uint *)(local_b50.ray + 0x414) =
                                 (uint)bVar23 * iVar7 |
                                 (uint)!bVar23 * *(int *)(local_b50.ray + 0x414);
                            *(uint *)(local_b50.ray + 0x418) =
                                 (uint)bVar24 * iVar8 |
                                 (uint)!bVar24 * *(int *)(local_b50.ray + 0x418);
                            *(uint *)(local_b50.ray + 0x41c) =
                                 (uint)bVar25 * iVar1 |
                                 (uint)!bVar25 * *(int *)(local_b50.ray + 0x41c);
                            *(uint *)(local_b50.ray + 0x420) =
                                 (uint)(bVar79 & 1) * iVar66 |
                                 (uint)!(bool)(bVar79 & 1) * *(int *)(local_b50.ray + 0x420);
                            *(uint *)(local_b50.ray + 0x424) =
                                 (uint)bVar26 * iVar67 |
                                 (uint)!bVar26 * *(int *)(local_b50.ray + 0x424);
                            *(uint *)(local_b50.ray + 0x428) =
                                 (uint)bVar27 * iVar68 |
                                 (uint)!bVar27 * *(int *)(local_b50.ray + 0x428);
                            *(uint *)(local_b50.ray + 0x42c) =
                                 (uint)bVar28 * iVar69 |
                                 (uint)!bVar28 * *(int *)(local_b50.ray + 0x42c);
                            *(uint *)(local_b50.ray + 0x430) =
                                 (uint)bVar29 * iVar70 |
                                 (uint)!bVar29 * *(int *)(local_b50.ray + 0x430);
                            *(uint *)(local_b50.ray + 0x434) =
                                 (uint)bVar30 * iVar71 |
                                 (uint)!bVar30 * *(int *)(local_b50.ray + 0x434);
                            *(uint *)(local_b50.ray + 0x438) =
                                 (uint)bVar31 * iVar72 |
                                 (uint)!bVar31 * *(int *)(local_b50.ray + 0x438);
                            *(uint *)(local_b50.ray + 0x43c) =
                                 (uint)bVar32 * iVar73 |
                                 (uint)!bVar32 * *(int *)(local_b50.ray + 0x43c);
                            auVar184 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b50.hit + 0x140));
                            auVar184 = vmovdqu32_avx512f(auVar184);
                            *(undefined1 (*) [64])(local_b50.ray + 0x440) = auVar184;
                            auVar184 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b50.hit + 0x180));
                            auVar184 = vmovdqu32_avx512f(auVar184);
                            *(undefined1 (*) [64])(local_b50.ray + 0x480) = auVar184;
                            auVar277 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b50.hit + 0x1c0));
                            auVar184 = vmovdqa32_avx512f(auVar277);
                            *(undefined1 (*) [64])(local_b50.ray + 0x4c0) = auVar184;
                            auVar300 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b50.hit + 0x200));
                            bVar91 = (bool)((byte)(uVar92 >> 1) & 1);
                            auVar61._4_56_ = auVar300._8_56_;
                            auVar61._0_4_ =
                                 (uint)bVar91 * auVar300._4_4_ | (uint)!bVar91 * auVar277._4_4_;
                            auVar184._0_8_ = auVar61._0_8_ << 0x20;
                            bVar91 = (bool)((byte)(uVar92 >> 2) & 1);
                            auVar184._8_4_ =
                                 (uint)bVar91 * auVar300._8_4_ | (uint)!bVar91 * auVar277._8_4_;
                            bVar91 = (bool)((byte)(uVar92 >> 3) & 1);
                            auVar184._12_4_ =
                                 (uint)bVar91 * auVar300._12_4_ | (uint)!bVar91 * auVar277._12_4_;
                            bVar91 = (bool)((byte)(uVar92 >> 4) & 1);
                            auVar184._16_4_ =
                                 (uint)bVar91 * auVar300._16_4_ | (uint)!bVar91 * auVar277._16_4_;
                            bVar91 = (bool)((byte)(uVar92 >> 5) & 1);
                            auVar184._20_4_ =
                                 (uint)bVar91 * auVar300._20_4_ | (uint)!bVar91 * auVar277._20_4_;
                            bVar91 = (bool)((byte)(uVar92 >> 6) & 1);
                            auVar184._24_4_ =
                                 (uint)bVar91 * auVar300._24_4_ | (uint)!bVar91 * auVar277._24_4_;
                            bVar91 = (bool)((byte)(uVar92 >> 7) & 1);
                            auVar184._28_4_ =
                                 (uint)bVar91 * auVar300._28_4_ | (uint)!bVar91 * auVar277._28_4_;
                            auVar184._32_4_ =
                                 (uint)(bVar79 & 1) * auVar300._32_4_ |
                                 (uint)!(bool)(bVar79 & 1) * auVar277._32_4_;
                            bVar91 = (bool)((byte)(uVar92 >> 9) & 1);
                            auVar184._36_4_ =
                                 (uint)bVar91 * auVar300._36_4_ | (uint)!bVar91 * auVar277._36_4_;
                            bVar91 = (bool)((byte)(uVar92 >> 10) & 1);
                            auVar184._40_4_ =
                                 (uint)bVar91 * auVar300._40_4_ | (uint)!bVar91 * auVar277._40_4_;
                            bVar91 = (bool)((byte)(uVar92 >> 0xb) & 1);
                            auVar184._44_4_ =
                                 (uint)bVar91 * auVar300._44_4_ | (uint)!bVar91 * auVar277._44_4_;
                            bVar91 = (bool)((byte)(uVar92 >> 0xc) & 1);
                            auVar184._48_4_ =
                                 (uint)bVar91 * auVar300._48_4_ | (uint)!bVar91 * auVar277._48_4_;
                            bVar91 = (bool)((byte)(uVar92 >> 0xd) & 1);
                            auVar184._52_4_ =
                                 (uint)bVar91 * auVar300._52_4_ | (uint)!bVar91 * auVar277._52_4_;
                            bVar91 = (bool)((byte)(uVar92 >> 0xe) & 1);
                            auVar184._56_4_ =
                                 (uint)bVar91 * auVar300._56_4_ | (uint)!bVar91 * auVar277._56_4_;
                            bVar91 = SUB81(uVar92 >> 0xf,0);
                            auVar184._60_4_ =
                                 (uint)bVar91 * auVar300._60_4_ | (uint)!bVar91 * auVar277._60_4_;
                            auVar277 = vmovdqa32_avx512f(auVar300);
                            *(undefined1 (*) [64])(local_b50.ray + 0x500) = auVar277;
                            goto LAB_01c3fcc9;
                          }
                        }
                        *(float *)(ray + k * 4 + 0x200) = fVar280;
                      }
                    }
                  }
                }
LAB_01c3fcc9:
                auVar108 = auVar184._32_32_;
                bVar91 = lVar90 != 0;
                lVar90 = lVar90 + -1;
              } while ((!bVar19) && (bVar91));
              auVar76._4_4_ = fStack_85c;
              auVar76._0_4_ = local_860;
              auVar76._8_4_ = fStack_858;
              auVar76._12_4_ = fStack_854;
              auVar76._16_4_ = fStack_850;
              auVar76._20_4_ = fStack_84c;
              auVar76._24_4_ = fStack_848;
              auVar76._28_4_ = fStack_844;
              uVar10 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar50._4_4_ = uVar10;
              auVar50._0_4_ = uVar10;
              auVar50._8_4_ = uVar10;
              auVar50._12_4_ = uVar10;
              auVar50._16_4_ = uVar10;
              auVar50._20_4_ = uVar10;
              auVar50._24_4_ = uVar10;
              auVar50._28_4_ = uVar10;
              uVar35 = vcmpps_avx512vl(auVar76,auVar50,2);
              bVar86 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar86 & (byte)uVar35;
            } while (bVar86 != 0);
          }
          auVar180._0_4_ = (float)local_880._0_4_ + (float)local_900._0_4_;
          auVar180._4_4_ = (float)local_880._4_4_ + (float)local_900._4_4_;
          auVar180._8_4_ = fStack_878 + fStack_8f8;
          auVar180._12_4_ = fStack_874 + fStack_8f4;
          auVar180._16_4_ = fStack_870 + fStack_8f0;
          auVar180._20_4_ = fStack_86c + fStack_8ec;
          auVar180._24_4_ = fStack_868 + fStack_8e8;
          auVar180._28_4_ = fStack_864 + fStack_8e4;
          uVar10 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar51._4_4_ = uVar10;
          auVar51._0_4_ = uVar10;
          auVar51._8_4_ = uVar10;
          auVar51._12_4_ = uVar10;
          auVar51._16_4_ = uVar10;
          auVar51._20_4_ = uVar10;
          auVar51._24_4_ = uVar10;
          auVar51._28_4_ = uVar10;
          uVar35 = vcmpps_avx512vl(auVar180,auVar51,2);
          bVar87 = (byte)uVar34 | ~bVar87;
          bVar84 = (byte)uVar36 & bVar84 & (byte)uVar35;
          auVar181._8_4_ = 2;
          auVar181._0_8_ = 0x200000002;
          auVar181._12_4_ = 2;
          auVar181._16_4_ = 2;
          auVar181._20_4_ = 2;
          auVar181._24_4_ = 2;
          auVar181._28_4_ = 2;
          auVar52._8_4_ = 3;
          auVar52._0_8_ = 0x300000003;
          auVar52._12_4_ = 3;
          auVar52._16_4_ = 3;
          auVar52._20_4_ = 3;
          auVar52._24_4_ = 3;
          auVar52._28_4_ = 3;
          auVar107 = vpblendmd_avx512vl(auVar181,auVar52);
          local_880._0_4_ = (uint)(bVar87 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar87 & 1) * 2;
          bVar19 = (bool)(bVar87 >> 1 & 1);
          local_880._4_4_ = (uint)bVar19 * auVar107._4_4_ | (uint)!bVar19 * 2;
          bVar19 = (bool)(bVar87 >> 2 & 1);
          fStack_878 = (float)((uint)bVar19 * auVar107._8_4_ | (uint)!bVar19 * 2);
          bVar19 = (bool)(bVar87 >> 3 & 1);
          fStack_874 = (float)((uint)bVar19 * auVar107._12_4_ | (uint)!bVar19 * 2);
          bVar19 = (bool)(bVar87 >> 4 & 1);
          fStack_870 = (float)((uint)bVar19 * auVar107._16_4_ | (uint)!bVar19 * 2);
          bVar19 = (bool)(bVar87 >> 5 & 1);
          fStack_86c = (float)((uint)bVar19 * auVar107._20_4_ | (uint)!bVar19 * 2);
          bVar19 = (bool)(bVar87 >> 6 & 1);
          fStack_868 = (float)((uint)bVar19 * auVar107._24_4_ | (uint)!bVar19 * 2);
          fStack_864 = (float)((uint)(bVar87 >> 7) * auVar107._28_4_ |
                              (uint)!(bool)(bVar87 >> 7) * 2);
          auVar153._32_32_ = auVar108;
          auVar153._0_32_ = _local_880;
          uVar34 = vpcmpd_avx512vl(_local_880,local_7e0,2);
          bVar87 = (byte)uVar34 & bVar84;
          if (bVar87 != 0) {
            auVar284 = vminps_avx(local_9c0._0_16_,local_a00._0_16_);
            auVar99 = vmaxps_avx(local_9c0._0_16_,local_a00._0_16_);
            auVar100 = vminps_avx(local_9e0._0_16_,local_a20._0_16_);
            auVar33 = vminps_avx(auVar284,auVar100);
            auVar284 = vmaxps_avx(local_9e0._0_16_,local_a20._0_16_);
            auVar100 = vmaxps_avx(auVar99,auVar284);
            auVar99 = vandps_avx(auVar289._0_16_,auVar33);
            auVar284 = vandps_avx(auVar289._0_16_,auVar100);
            auVar99 = vmaxps_avx(auVar99,auVar284);
            auVar284 = vmovshdup_avx(auVar99);
            auVar284 = vmaxss_avx(auVar284,auVar99);
            auVar99 = vshufpd_avx(auVar99,auVar99,1);
            auVar99 = vmaxss_avx(auVar99,auVar284);
            fVar276 = auVar99._0_4_ * 1.9073486e-06;
            local_9a0 = vshufps_avx(auVar100,auVar100,0xff);
            _local_920 = _local_7a0;
            local_860 = (float)local_7a0._0_4_ + (float)local_900._0_4_;
            fStack_85c = (float)local_7a0._4_4_ + (float)local_900._4_4_;
            fStack_858 = fStack_798 + fStack_8f8;
            fStack_854 = fStack_794 + fStack_8f4;
            fStack_850 = fStack_790 + fStack_8f0;
            fStack_84c = fStack_78c + fStack_8ec;
            fStack_848 = fStack_788 + fStack_8e8;
            fStack_844 = fStack_784 + fStack_8e4;
            do {
              auVar182._8_4_ = 0x7f800000;
              auVar182._0_8_ = 0x7f8000007f800000;
              auVar182._12_4_ = 0x7f800000;
              auVar182._16_4_ = 0x7f800000;
              auVar182._20_4_ = 0x7f800000;
              auVar182._24_4_ = 0x7f800000;
              auVar182._28_4_ = 0x7f800000;
              auVar108 = vblendmps_avx512vl(auVar182,_local_920);
              auVar147._0_4_ =
                   (uint)(bVar87 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar87 & 1) * 0x7f800000;
              bVar19 = (bool)(bVar87 >> 1 & 1);
              auVar147._4_4_ = (uint)bVar19 * auVar108._4_4_ | (uint)!bVar19 * 0x7f800000;
              bVar19 = (bool)(bVar87 >> 2 & 1);
              auVar147._8_4_ = (uint)bVar19 * auVar108._8_4_ | (uint)!bVar19 * 0x7f800000;
              bVar19 = (bool)(bVar87 >> 3 & 1);
              auVar147._12_4_ = (uint)bVar19 * auVar108._12_4_ | (uint)!bVar19 * 0x7f800000;
              bVar19 = (bool)(bVar87 >> 4 & 1);
              auVar147._16_4_ = (uint)bVar19 * auVar108._16_4_ | (uint)!bVar19 * 0x7f800000;
              bVar19 = (bool)(bVar87 >> 5 & 1);
              auVar147._20_4_ = (uint)bVar19 * auVar108._20_4_ | (uint)!bVar19 * 0x7f800000;
              auVar147._24_4_ =
                   (uint)(bVar87 >> 6) * auVar108._24_4_ | (uint)!(bool)(bVar87 >> 6) * 0x7f800000;
              auVar147._28_4_ = 0x7f800000;
              auVar153._0_32_ = auVar147;
              auVar108 = vshufps_avx(auVar147,auVar147,0xb1);
              auVar108 = vminps_avx(auVar147,auVar108);
              auVar107 = vshufpd_avx(auVar108,auVar108,5);
              auVar108 = vminps_avx(auVar108,auVar107);
              auVar107 = vpermpd_avx2(auVar108,0x4e);
              auVar108 = vminps_avx(auVar108,auVar107);
              uVar34 = vcmpps_avx512vl(auVar147,auVar108,0);
              bVar80 = (byte)uVar34 & bVar87;
              bVar86 = bVar87;
              if (bVar80 != 0) {
                bVar86 = bVar80;
              }
              iVar2 = 0;
              for (uVar85 = (uint)bVar86; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x80000000) {
                iVar2 = iVar2 + 1;
              }
              uVar85 = *(uint *)(local_840 + (uint)(iVar2 << 2));
              fVar278 = *(float *)(local_780 + (uint)(iVar2 << 2));
              fVar279 = auVar97._0_4_;
              if ((float)local_a40._0_4_ < 0.0) {
                fVar279 = sqrtf((float)local_a40._0_4_);
              }
              auVar285 = ZEXT464(uVar85);
              lVar90 = 4;
              do {
                auVar108 = auVar153._32_32_;
                auVar171._4_4_ = fVar278;
                auVar171._0_4_ = fVar278;
                auVar171._8_4_ = fVar278;
                auVar171._12_4_ = fVar278;
                auVar99 = vfmadd132ps_fma(auVar171,ZEXT816(0) << 0x40,local_a30);
                fVar282 = auVar285._0_4_;
                fVar254 = 1.0 - fVar282;
                fVar267 = fVar254 * fVar254 * fVar254;
                fVar280 = fVar282 * fVar282;
                fVar269 = fVar282 * fVar280;
                auVar284 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar267),
                                           ZEXT416((uint)fVar269));
                fVar266 = fVar282 * fVar254;
                auVar98 = ZEXT416((uint)fVar254);
                auVar33 = vfmadd231ss_fma(ZEXT416((uint)(fVar282 * fVar266 * 6.0)),
                                          ZEXT416((uint)(fVar266 * fVar254)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar100 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar269),
                                           ZEXT416((uint)fVar267));
                auVar101 = vfmadd231ss_fma(ZEXT416((uint)(fVar266 * fVar254 * 6.0)),
                                           SUB6416(ZEXT464(0x41400000),0),
                                           ZEXT416((uint)(fVar282 * fVar266)));
                fVar267 = fVar267 * 0.16666667;
                fVar281 = (auVar284._0_4_ + auVar33._0_4_) * 0.16666667;
                fVar253 = (auVar100._0_4_ + auVar101._0_4_) * 0.16666667;
                fVar269 = fVar269 * 0.16666667;
                auVar221._0_4_ = fVar269 * (float)local_a20._0_4_;
                auVar221._4_4_ = fVar269 * (float)local_a20._4_4_;
                auVar221._8_4_ = fVar269 * fStack_a18;
                auVar221._12_4_ = fVar269 * fStack_a14;
                auVar248._4_4_ = fVar253;
                auVar248._0_4_ = fVar253;
                auVar248._8_4_ = fVar253;
                auVar248._12_4_ = fVar253;
                auVar284 = vfmadd132ps_fma(auVar248,auVar221,local_9e0._0_16_);
                auVar222._4_4_ = fVar281;
                auVar222._0_4_ = fVar281;
                auVar222._8_4_ = fVar281;
                auVar222._12_4_ = fVar281;
                auVar284 = vfmadd132ps_fma(auVar222,auVar284,local_a00._0_16_);
                auVar201._4_4_ = fVar267;
                auVar201._0_4_ = fVar267;
                auVar201._8_4_ = fVar267;
                auVar201._12_4_ = fVar267;
                auVar284 = vfmadd132ps_fma(auVar201,auVar284,local_9c0._0_16_);
                local_8e0._0_16_ = auVar284;
                auVar99 = vsubps_avx(auVar99,auVar284);
                local_a60._0_16_ = auVar99;
                auVar99 = vdpps_avx(auVar99,auVar99,0x7f);
                auVar284 = auVar285._0_16_;
                local_a80._0_16_ = auVar99;
                if (auVar99._0_4_ < 0.0) {
                  local_b20._0_4_ = fVar280;
                  auVar259._0_4_ = sqrtf(auVar99._0_4_);
                  auVar259._4_60_ = extraout_var_01;
                  auVar99 = auVar259._0_16_;
                }
                else {
                  auVar99 = vsqrtss_avx(auVar99,auVar99);
                  local_b20._0_4_ = fVar280;
                }
                auVar33 = vfnmsub213ss_fma(auVar284,auVar284,ZEXT416((uint)(fVar266 * 4.0)));
                auVar100 = vfmadd231ss_fma(ZEXT416((uint)(fVar266 * 4.0)),auVar98,auVar98);
                fVar280 = fVar254 * -fVar254 * 0.5;
                fVar266 = auVar33._0_4_ * 0.5;
                fVar267 = auVar100._0_4_ * 0.5;
                local_b20._0_4_ = (float)local_b20._0_4_ * 0.5;
                auVar237._0_4_ = (float)local_b20._0_4_ * (float)local_a20._0_4_;
                auVar237._4_4_ = (float)local_b20._0_4_ * (float)local_a20._4_4_;
                auVar237._8_4_ = (float)local_b20._0_4_ * fStack_a18;
                auVar237._12_4_ = (float)local_b20._0_4_ * fStack_a14;
                auVar202._4_4_ = fVar267;
                auVar202._0_4_ = fVar267;
                auVar202._8_4_ = fVar267;
                auVar202._12_4_ = fVar267;
                auVar100 = vfmadd132ps_fma(auVar202,auVar237,local_9e0._0_16_);
                auVar223._4_4_ = fVar266;
                auVar223._0_4_ = fVar266;
                auVar223._8_4_ = fVar266;
                auVar223._12_4_ = fVar266;
                auVar100 = vfmadd132ps_fma(auVar223,auVar100,local_a00._0_16_);
                auVar294._4_4_ = fVar280;
                auVar294._0_4_ = fVar280;
                auVar294._8_4_ = fVar280;
                auVar294._12_4_ = fVar280;
                local_b20._0_16_ = vfmadd132ps_fma(auVar294,auVar100,local_9c0._0_16_);
                local_950 = vdpps_avx(local_b20._0_16_,local_b20._0_16_,0x7f);
                auVar65._12_4_ = 0;
                auVar65._0_12_ = ZEXT812(0);
                fVar280 = local_950._0_4_;
                auVar100 = vrsqrt14ss_avx512f(auVar65 << 0x20,ZEXT416((uint)fVar280));
                fVar266 = auVar100._0_4_;
                local_960 = vrcp14ss_avx512f(auVar65 << 0x20,ZEXT416((uint)fVar280));
                auVar100 = vfnmadd213ss_fma(local_960,local_950,ZEXT416(0x40000000));
                uVar85 = auVar99._0_4_;
                local_940 = fVar254;
                fStack_93c = fVar254;
                fStack_938 = fVar254;
                fStack_934 = fVar254;
                if (fVar280 < -fVar280) {
                  auVar285._0_4_ = sqrtf(fVar280);
                  auVar285._4_60_ = extraout_var_02;
                  auVar99 = ZEXT416(uVar85);
                  auVar101 = auVar285._0_16_;
                  auVar33 = local_b20._0_16_;
                }
                else {
                  auVar101 = vsqrtss_avx512f(local_950,local_950);
                  auVar33 = local_b20._0_16_;
                }
                fVar280 = fVar266 * 1.5 + fVar280 * -0.5 * fVar266 * fVar266 * fVar266;
                auVar172._0_4_ = auVar33._0_4_ * fVar280;
                auVar172._4_4_ = auVar33._4_4_ * fVar280;
                auVar172._8_4_ = auVar33._8_4_ * fVar280;
                auVar172._12_4_ = auVar33._12_4_ * fVar280;
                auVar283 = vdpps_avx(local_a60._0_16_,auVar172,0x7f);
                fVar281 = auVar99._0_4_;
                fVar266 = auVar283._0_4_;
                auVar173._0_4_ = fVar266 * fVar266;
                auVar173._4_4_ = auVar283._4_4_ * auVar283._4_4_;
                auVar173._8_4_ = auVar283._8_4_ * auVar283._8_4_;
                auVar173._12_4_ = auVar283._12_4_ * auVar283._12_4_;
                auVar102 = vsubps_avx512vl(local_a80._0_16_,auVar173);
                fVar267 = auVar102._0_4_;
                auVar203._4_12_ = ZEXT812(0) << 0x20;
                auVar203._0_4_ = fVar267;
                auVar103 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar203);
                auVar104 = vmulss_avx512f(auVar103,ZEXT416(0x3fc00000));
                auVar105 = vmulss_avx512f(auVar102,ZEXT416(0xbf000000));
                if (fVar267 < 0.0) {
                  local_980 = fVar280;
                  fStack_97c = fVar280;
                  fStack_978 = fVar280;
                  fStack_974 = fVar280;
                  local_970 = auVar103;
                  fVar267 = sqrtf(fVar267);
                  auVar105 = ZEXT416(auVar105._0_4_);
                  auVar104 = ZEXT416(auVar104._0_4_);
                  auVar101 = ZEXT416(auVar101._0_4_);
                  auVar99 = ZEXT416(uVar85);
                  auVar33 = local_b20._0_16_;
                  auVar103 = local_970;
                  fVar280 = local_980;
                  fVar253 = fStack_97c;
                  fVar269 = fStack_978;
                  fVar254 = fStack_974;
                }
                else {
                  auVar102 = vsqrtss_avx(auVar102,auVar102);
                  fVar267 = auVar102._0_4_;
                  fVar253 = fVar280;
                  fVar269 = fVar280;
                  fVar254 = fVar280;
                }
                auVar297 = ZEXT1664(auVar33);
                auVar289 = ZEXT1664(local_a60._0_16_);
                auVar275._8_4_ = 0x7fffffff;
                auVar275._0_8_ = 0x7fffffff7fffffff;
                auVar275._12_4_ = 0x7fffffff;
                auVar301 = ZEXT3264(local_aa0);
                auVar292._32_32_ = auVar108;
                auVar292._0_32_ = local_ac0;
                auVar299 = ZEXT3264(local_ac0);
                auVar102 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar98,auVar284);
                auVar284 = vfmadd231ss_fma(auVar98,auVar284,SUB6416(ZEXT464(0xc0000000),0));
                auVar224._0_4_ = fVar282 * (float)local_a20._0_4_;
                auVar224._4_4_ = fVar282 * (float)local_a20._4_4_;
                auVar224._8_4_ = fVar282 * fStack_a18;
                auVar224._12_4_ = fVar282 * fStack_a14;
                auVar238._0_4_ = auVar284._0_4_;
                auVar238._4_4_ = auVar238._0_4_;
                auVar238._8_4_ = auVar238._0_4_;
                auVar238._12_4_ = auVar238._0_4_;
                auVar284 = vfmadd132ps_fma(auVar238,auVar224,local_9e0._0_16_);
                auVar204._0_4_ = auVar102._0_4_;
                auVar204._4_4_ = auVar204._0_4_;
                auVar204._8_4_ = auVar204._0_4_;
                auVar204._12_4_ = auVar204._0_4_;
                auVar284 = vfmadd132ps_fma(auVar204,auVar284,local_a00._0_16_);
                auVar75._4_4_ = fStack_93c;
                auVar75._0_4_ = local_940;
                auVar75._8_4_ = fStack_938;
                auVar75._12_4_ = fStack_934;
                auVar284 = vfmadd132ps_fma(auVar75,auVar284,local_9c0._0_16_);
                auVar205._0_4_ = auVar284._0_4_ * (float)local_950._0_4_;
                auVar205._4_4_ = auVar284._4_4_ * (float)local_950._0_4_;
                auVar205._8_4_ = auVar284._8_4_ * (float)local_950._0_4_;
                auVar205._12_4_ = auVar284._12_4_ * (float)local_950._0_4_;
                auVar284 = vdpps_avx(auVar33,auVar284,0x7f);
                fVar268 = auVar284._0_4_;
                auVar225._0_4_ = auVar33._0_4_ * fVar268;
                auVar225._4_4_ = auVar33._4_4_ * fVar268;
                auVar225._8_4_ = auVar33._8_4_ * fVar268;
                auVar225._12_4_ = auVar33._12_4_ * fVar268;
                auVar284 = vsubps_avx(auVar205,auVar225);
                fVar268 = auVar100._0_4_ * (float)local_960._0_4_;
                auVar42._8_4_ = 0x80000000;
                auVar42._0_8_ = 0x8000000080000000;
                auVar42._12_4_ = 0x80000000;
                auVar153._16_48_ = auVar292._16_48_;
                auVar102 = vxorps_avx512vl(auVar33,auVar42);
                auVar249._0_4_ = fVar280 * auVar284._0_4_ * fVar268;
                auVar249._4_4_ = fVar253 * auVar284._4_4_ * fVar268;
                auVar249._8_4_ = fVar269 * auVar284._8_4_ * fVar268;
                auVar249._12_4_ = fVar254 * auVar284._12_4_ * fVar268;
                auVar292 = ZEXT1664(auVar172);
                auVar284 = vdpps_avx(auVar102,auVar172,0x7f);
                auVar98 = vmaxss_avx(ZEXT416((uint)fVar276),
                                     ZEXT416((uint)(fVar278 * fVar279 * 1.9073486e-06)));
                auVar101 = vdivss_avx512f(ZEXT416((uint)fVar276),auVar101);
                auVar100 = vdpps_avx(local_a60._0_16_,auVar249,0x7f);
                auVar99 = vfmadd213ss_fma(auVar99,ZEXT416((uint)fVar276),auVar98);
                auVar101 = vfmadd213ss_fma(ZEXT416((uint)(fVar281 + 1.0)),auVar101,auVar99);
                auVar99 = vdpps_avx(local_a30,auVar172,0x7f);
                fVar280 = auVar284._0_4_ + auVar100._0_4_;
                auVar284 = vdpps_avx(local_a60._0_16_,auVar102,0x7f);
                auVar102 = vmulss_avx512f(auVar105,auVar103);
                auVar103 = vmulss_avx512f(auVar103,auVar103);
                auVar100 = vdpps_avx(local_a60._0_16_,local_a30,0x7f);
                auVar153._0_16_ =
                     vaddss_avx512f(auVar104,ZEXT416((uint)(auVar102._0_4_ * auVar103._0_4_)));
                auVar103 = vfnmadd231ss_fma(auVar284,auVar283,ZEXT416((uint)fVar280));
                auVar102 = vfnmadd231ss_fma(auVar100,auVar283,auVar99);
                auVar284 = vpermilps_avx(local_8e0._0_16_,0xff);
                fVar267 = fVar267 - auVar284._0_4_;
                auVar284 = vshufps_avx(auVar33,auVar33,0xff);
                auVar100 = vfmsub213ss_fma(auVar103,auVar153._0_16_,auVar284);
                fVar281 = auVar102._0_4_ * auVar153._0_4_;
                auVar103 = vfmsub231ss_fma(ZEXT416((uint)(auVar99._0_4_ * auVar100._0_4_)),
                                           ZEXT416((uint)fVar280),ZEXT416((uint)fVar281));
                fVar269 = auVar103._0_4_;
                fVar253 = fVar266 * (auVar100._0_4_ / fVar269);
                auVar259 = ZEXT464((uint)fVar253);
                fVar282 = fVar282 - (fVar266 * (fVar281 / fVar269) -
                                    fVar267 * (auVar99._0_4_ / fVar269));
                auVar285 = ZEXT464((uint)fVar282);
                fVar278 = fVar278 - (fVar267 * (fVar280 / fVar269) - fVar253);
                auVar99 = vandps_avx(auVar283,auVar275);
                if (auVar101._0_4_ <= auVar99._0_4_) {
LAB_01c408dc:
                  bVar19 = false;
                }
                else {
                  auVar100 = vfmadd231ss_fma(ZEXT416((uint)(auVar101._0_4_ + auVar98._0_4_)),
                                             local_9a0,ZEXT416(0x36000000));
                  auVar99 = vandps_avx(auVar275,ZEXT416((uint)fVar267));
                  if (auVar100._0_4_ <= auVar99._0_4_) goto LAB_01c408dc;
                  fVar278 = fVar278 + (float)local_990._0_4_;
                  bVar19 = true;
                  if ((((fVar161 <= fVar278) &&
                       (fVar280 = *(float *)(ray + k * 4 + 0x200), fVar278 <= fVar280)) &&
                      (0.0 <= fVar282)) && (fVar282 <= 1.0)) {
                    auVar152._16_48_ = auVar153._16_48_;
                    auVar152._0_16_ = ZEXT816(0) << 0x20;
                    auVar151._4_60_ = auVar152._4_60_;
                    auVar151._0_4_ = local_a80._0_4_;
                    auVar99 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar151._0_16_);
                    fVar266 = auVar99._0_4_;
                    auVar153._0_16_ = vmulss_avx512f(local_a80._0_16_,ZEXT416(0xbf000000));
                    pGVar13 = (context->scene->geometries).items[uVar83].ptr;
                    if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                      fVar266 = fVar266 * 1.5 + auVar153._0_4_ * fVar266 * fVar266 * fVar266;
                      auVar206._0_4_ = local_a60._0_4_ * fVar266;
                      auVar206._4_4_ = local_a60._4_4_ * fVar266;
                      auVar206._8_4_ = local_a60._8_4_ * fVar266;
                      auVar206._12_4_ = local_a60._12_4_ * fVar266;
                      auVar101 = vfmadd213ps_fma(auVar284,auVar206,auVar33);
                      auVar99 = vshufps_avx(auVar206,auVar206,0xc9);
                      auVar284 = vshufps_avx(auVar33,auVar33,0xc9);
                      auVar207._0_4_ = auVar206._0_4_ * auVar284._0_4_;
                      auVar207._4_4_ = auVar206._4_4_ * auVar284._4_4_;
                      auVar207._8_4_ = auVar206._8_4_ * auVar284._8_4_;
                      auVar207._12_4_ = auVar206._12_4_ * auVar284._12_4_;
                      auVar100 = vfmsub231ps_fma(auVar207,auVar33,auVar99);
                      auVar99 = vshufps_avx(auVar100,auVar100,0xc9);
                      auVar284 = vshufps_avx(auVar101,auVar101,0xc9);
                      auVar100 = vshufps_avx(auVar100,auVar100,0xd2);
                      auVar174._0_4_ = auVar101._0_4_ * auVar100._0_4_;
                      auVar174._4_4_ = auVar101._4_4_ * auVar100._4_4_;
                      auVar174._8_4_ = auVar101._8_4_ * auVar100._8_4_;
                      auVar174._12_4_ = auVar101._12_4_ * auVar100._12_4_;
                      auVar99 = vfmsub231ps_fma(auVar174,auVar99,auVar284);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x200) = fVar278;
                        uVar10 = vextractps_avx(auVar99,1);
                        *(undefined4 *)(ray + k * 4 + 0x300) = uVar10;
                        uVar10 = vextractps_avx(auVar99,2);
                        *(undefined4 *)(ray + k * 4 + 0x340) = uVar10;
                        *(int *)(ray + k * 4 + 0x380) = auVar99._0_4_;
                        *(float *)(ray + k * 4 + 0x3c0) = fVar282;
                        *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                        *(uint *)(ray + k * 4 + 0x440) = uVar12;
                        *(uint *)(ray + k * 4 + 0x480) = uVar83;
                        *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar17 = context->user;
                        auVar284 = ZEXT416((uint)fVar282);
                        local_340 = vbroadcastss_avx512f(auVar284);
                        auVar184 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar184 = vpermps_avx512f(auVar184,ZEXT1664(auVar99));
                        auVar277 = vbroadcastss_avx512f(ZEXT416(2));
                        local_3c0 = vpermps_avx512f(auVar277,ZEXT1664(auVar99));
                        local_380 = vbroadcastss_avx512f(auVar99);
                        local_400[0] = (RTCHitN)auVar184[0];
                        local_400[1] = (RTCHitN)auVar184[1];
                        local_400[2] = (RTCHitN)auVar184[2];
                        local_400[3] = (RTCHitN)auVar184[3];
                        local_400[4] = (RTCHitN)auVar184[4];
                        local_400[5] = (RTCHitN)auVar184[5];
                        local_400[6] = (RTCHitN)auVar184[6];
                        local_400[7] = (RTCHitN)auVar184[7];
                        local_400[8] = (RTCHitN)auVar184[8];
                        local_400[9] = (RTCHitN)auVar184[9];
                        local_400[10] = (RTCHitN)auVar184[10];
                        local_400[0xb] = (RTCHitN)auVar184[0xb];
                        local_400[0xc] = (RTCHitN)auVar184[0xc];
                        local_400[0xd] = (RTCHitN)auVar184[0xd];
                        local_400[0xe] = (RTCHitN)auVar184[0xe];
                        local_400[0xf] = (RTCHitN)auVar184[0xf];
                        local_400[0x10] = (RTCHitN)auVar184[0x10];
                        local_400[0x11] = (RTCHitN)auVar184[0x11];
                        local_400[0x12] = (RTCHitN)auVar184[0x12];
                        local_400[0x13] = (RTCHitN)auVar184[0x13];
                        local_400[0x14] = (RTCHitN)auVar184[0x14];
                        local_400[0x15] = (RTCHitN)auVar184[0x15];
                        local_400[0x16] = (RTCHitN)auVar184[0x16];
                        local_400[0x17] = (RTCHitN)auVar184[0x17];
                        local_400[0x18] = (RTCHitN)auVar184[0x18];
                        local_400[0x19] = (RTCHitN)auVar184[0x19];
                        local_400[0x1a] = (RTCHitN)auVar184[0x1a];
                        local_400[0x1b] = (RTCHitN)auVar184[0x1b];
                        local_400[0x1c] = (RTCHitN)auVar184[0x1c];
                        local_400[0x1d] = (RTCHitN)auVar184[0x1d];
                        local_400[0x1e] = (RTCHitN)auVar184[0x1e];
                        local_400[0x1f] = (RTCHitN)auVar184[0x1f];
                        local_400[0x20] = (RTCHitN)auVar184[0x20];
                        local_400[0x21] = (RTCHitN)auVar184[0x21];
                        local_400[0x22] = (RTCHitN)auVar184[0x22];
                        local_400[0x23] = (RTCHitN)auVar184[0x23];
                        local_400[0x24] = (RTCHitN)auVar184[0x24];
                        local_400[0x25] = (RTCHitN)auVar184[0x25];
                        local_400[0x26] = (RTCHitN)auVar184[0x26];
                        local_400[0x27] = (RTCHitN)auVar184[0x27];
                        local_400[0x28] = (RTCHitN)auVar184[0x28];
                        local_400[0x29] = (RTCHitN)auVar184[0x29];
                        local_400[0x2a] = (RTCHitN)auVar184[0x2a];
                        local_400[0x2b] = (RTCHitN)auVar184[0x2b];
                        local_400[0x2c] = (RTCHitN)auVar184[0x2c];
                        local_400[0x2d] = (RTCHitN)auVar184[0x2d];
                        local_400[0x2e] = (RTCHitN)auVar184[0x2e];
                        local_400[0x2f] = (RTCHitN)auVar184[0x2f];
                        local_400[0x30] = (RTCHitN)auVar184[0x30];
                        local_400[0x31] = (RTCHitN)auVar184[0x31];
                        local_400[0x32] = (RTCHitN)auVar184[0x32];
                        local_400[0x33] = (RTCHitN)auVar184[0x33];
                        local_400[0x34] = (RTCHitN)auVar184[0x34];
                        local_400[0x35] = (RTCHitN)auVar184[0x35];
                        local_400[0x36] = (RTCHitN)auVar184[0x36];
                        local_400[0x37] = (RTCHitN)auVar184[0x37];
                        local_400[0x38] = (RTCHitN)auVar184[0x38];
                        local_400[0x39] = (RTCHitN)auVar184[0x39];
                        local_400[0x3a] = (RTCHitN)auVar184[0x3a];
                        local_400[0x3b] = (RTCHitN)auVar184[0x3b];
                        local_400[0x3c] = (RTCHitN)auVar184[0x3c];
                        local_400[0x3d] = (RTCHitN)auVar184[0x3d];
                        local_400[0x3e] = (RTCHitN)auVar184[0x3e];
                        local_400[0x3f] = (RTCHitN)auVar184[0x3f];
                        local_300 = 0;
                        uStack_2f8 = 0;
                        uStack_2f0 = 0;
                        uStack_2e8 = 0;
                        uStack_2e0 = 0;
                        uStack_2d8 = 0;
                        uStack_2d0 = 0;
                        uStack_2c8 = 0;
                        local_2c0 = local_480._0_8_;
                        uStack_2b8 = local_480._8_8_;
                        uStack_2b0 = local_480._16_8_;
                        uStack_2a8 = local_480._24_8_;
                        uStack_2a0 = local_480._32_8_;
                        uStack_298 = local_480._40_8_;
                        uStack_290 = local_480._48_8_;
                        uStack_288 = local_480._56_8_;
                        auVar184 = vmovdqa64_avx512f(local_440);
                        local_280 = vmovdqa64_avx512f(auVar184);
                        auVar108 = vpcmpeqd_avx2(auVar184._0_32_,auVar184._0_32_);
                        local_ad8[3] = auVar108;
                        local_ad8[2] = auVar108;
                        local_ad8[1] = auVar108;
                        *local_ad8 = auVar108;
                        local_240 = vbroadcastss_avx512f(ZEXT416(pRVar17->instID[0]));
                        local_200 = vbroadcastss_avx512f(ZEXT416(pRVar17->instPrimID[0]));
                        *(float *)(ray + k * 4 + 0x200) = fVar278;
                        local_8c0 = local_4c0;
                        local_b50.valid = (int *)local_8c0;
                        local_b50.geometryUserPtr = pGVar13->userPtr;
                        local_b50.context = context->user;
                        local_b50.hit = local_400;
                        local_b50.N = 0x10;
                        local_b50.ray = (RTCRayN *)ray;
                        if (pGVar13->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar259 = ZEXT464((uint)fVar253);
                          auVar289 = ZEXT1664(local_a60._0_16_);
                          auVar292 = ZEXT1664(auVar172);
                          auVar297 = ZEXT1664(auVar33);
                          (*pGVar13->intersectionFilterN)(&local_b50);
                          auVar285 = ZEXT1664(auVar284);
                          auVar299 = ZEXT3264(local_ac0);
                          auVar301 = ZEXT3264(local_aa0);
                        }
                        auVar153 = vmovdqa64_avx512f(local_8c0);
                        uVar34 = vptestmd_avx512f(auVar153,auVar153);
                        if ((short)uVar34 != 0) {
                          p_Var18 = context->args->filter;
                          if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar259 = ZEXT1664(auVar259._0_16_);
                            auVar289 = ZEXT1664(auVar289._0_16_);
                            auVar292 = ZEXT1664(auVar292._0_16_);
                            auVar297 = ZEXT1664(auVar297._0_16_);
                            (*p_Var18)(&local_b50);
                            auVar285 = ZEXT1664(auVar284);
                            auVar299 = ZEXT3264(local_ac0);
                            auVar301 = ZEXT3264(local_aa0);
                          }
                          auVar153 = vmovdqa64_avx512f(local_8c0);
                          uVar92 = vptestmd_avx512f(auVar153,auVar153);
                          if ((short)uVar92 != 0) {
                            iVar3 = *(int *)(local_b50.hit + 4);
                            iVar4 = *(int *)(local_b50.hit + 8);
                            iVar5 = *(int *)(local_b50.hit + 0xc);
                            iVar6 = *(int *)(local_b50.hit + 0x10);
                            iVar7 = *(int *)(local_b50.hit + 0x14);
                            iVar8 = *(int *)(local_b50.hit + 0x18);
                            iVar1 = *(int *)(local_b50.hit + 0x1c);
                            iVar66 = *(int *)(local_b50.hit + 0x20);
                            iVar67 = *(int *)(local_b50.hit + 0x24);
                            iVar68 = *(int *)(local_b50.hit + 0x28);
                            iVar69 = *(int *)(local_b50.hit + 0x2c);
                            iVar70 = *(int *)(local_b50.hit + 0x30);
                            iVar71 = *(int *)(local_b50.hit + 0x34);
                            iVar72 = *(int *)(local_b50.hit + 0x38);
                            iVar73 = *(int *)(local_b50.hit + 0x3c);
                            bVar86 = (byte)uVar92;
                            bVar91 = (bool)((byte)(uVar92 >> 1) & 1);
                            bVar20 = (bool)((byte)(uVar92 >> 2) & 1);
                            bVar21 = (bool)((byte)(uVar92 >> 3) & 1);
                            bVar22 = (bool)((byte)(uVar92 >> 4) & 1);
                            bVar23 = (bool)((byte)(uVar92 >> 5) & 1);
                            bVar24 = (bool)((byte)(uVar92 >> 6) & 1);
                            bVar25 = (bool)((byte)(uVar92 >> 7) & 1);
                            bVar80 = (byte)(uVar92 >> 8);
                            bVar26 = (bool)((byte)(uVar92 >> 9) & 1);
                            bVar27 = (bool)((byte)(uVar92 >> 10) & 1);
                            bVar28 = (bool)((byte)(uVar92 >> 0xb) & 1);
                            bVar29 = (bool)((byte)(uVar92 >> 0xc) & 1);
                            bVar30 = (bool)((byte)(uVar92 >> 0xd) & 1);
                            bVar31 = (bool)((byte)(uVar92 >> 0xe) & 1);
                            bVar32 = SUB81(uVar92 >> 0xf,0);
                            *(uint *)(local_b50.ray + 0x300) =
                                 (uint)(bVar86 & 1) * *(int *)local_b50.hit |
                                 (uint)!(bool)(bVar86 & 1) * *(int *)(local_b50.ray + 0x300);
                            *(uint *)(local_b50.ray + 0x304) =
                                 (uint)bVar91 * iVar3 |
                                 (uint)!bVar91 * *(int *)(local_b50.ray + 0x304);
                            *(uint *)(local_b50.ray + 0x308) =
                                 (uint)bVar20 * iVar4 |
                                 (uint)!bVar20 * *(int *)(local_b50.ray + 0x308);
                            *(uint *)(local_b50.ray + 0x30c) =
                                 (uint)bVar21 * iVar5 |
                                 (uint)!bVar21 * *(int *)(local_b50.ray + 0x30c);
                            *(uint *)(local_b50.ray + 0x310) =
                                 (uint)bVar22 * iVar6 |
                                 (uint)!bVar22 * *(int *)(local_b50.ray + 0x310);
                            *(uint *)(local_b50.ray + 0x314) =
                                 (uint)bVar23 * iVar7 |
                                 (uint)!bVar23 * *(int *)(local_b50.ray + 0x314);
                            *(uint *)(local_b50.ray + 0x318) =
                                 (uint)bVar24 * iVar8 |
                                 (uint)!bVar24 * *(int *)(local_b50.ray + 0x318);
                            *(uint *)(local_b50.ray + 0x31c) =
                                 (uint)bVar25 * iVar1 |
                                 (uint)!bVar25 * *(int *)(local_b50.ray + 0x31c);
                            *(uint *)(local_b50.ray + 800) =
                                 (uint)(bVar80 & 1) * iVar66 |
                                 (uint)!(bool)(bVar80 & 1) * *(int *)(local_b50.ray + 800);
                            *(uint *)(local_b50.ray + 0x324) =
                                 (uint)bVar26 * iVar67 |
                                 (uint)!bVar26 * *(int *)(local_b50.ray + 0x324);
                            *(uint *)(local_b50.ray + 0x328) =
                                 (uint)bVar27 * iVar68 |
                                 (uint)!bVar27 * *(int *)(local_b50.ray + 0x328);
                            *(uint *)(local_b50.ray + 0x32c) =
                                 (uint)bVar28 * iVar69 |
                                 (uint)!bVar28 * *(int *)(local_b50.ray + 0x32c);
                            *(uint *)(local_b50.ray + 0x330) =
                                 (uint)bVar29 * iVar70 |
                                 (uint)!bVar29 * *(int *)(local_b50.ray + 0x330);
                            *(uint *)(local_b50.ray + 0x334) =
                                 (uint)bVar30 * iVar71 |
                                 (uint)!bVar30 * *(int *)(local_b50.ray + 0x334);
                            *(uint *)(local_b50.ray + 0x338) =
                                 (uint)bVar31 * iVar72 |
                                 (uint)!bVar31 * *(int *)(local_b50.ray + 0x338);
                            *(uint *)(local_b50.ray + 0x33c) =
                                 (uint)bVar32 * iVar73 |
                                 (uint)!bVar32 * *(int *)(local_b50.ray + 0x33c);
                            iVar3 = *(int *)(local_b50.hit + 0x44);
                            iVar4 = *(int *)(local_b50.hit + 0x48);
                            iVar5 = *(int *)(local_b50.hit + 0x4c);
                            iVar6 = *(int *)(local_b50.hit + 0x50);
                            iVar7 = *(int *)(local_b50.hit + 0x54);
                            iVar8 = *(int *)(local_b50.hit + 0x58);
                            iVar1 = *(int *)(local_b50.hit + 0x5c);
                            iVar66 = *(int *)(local_b50.hit + 0x60);
                            iVar67 = *(int *)(local_b50.hit + 100);
                            iVar68 = *(int *)(local_b50.hit + 0x68);
                            iVar69 = *(int *)(local_b50.hit + 0x6c);
                            iVar70 = *(int *)(local_b50.hit + 0x70);
                            iVar71 = *(int *)(local_b50.hit + 0x74);
                            iVar72 = *(int *)(local_b50.hit + 0x78);
                            iVar73 = *(int *)(local_b50.hit + 0x7c);
                            bVar91 = (bool)((byte)(uVar92 >> 1) & 1);
                            bVar20 = (bool)((byte)(uVar92 >> 2) & 1);
                            bVar21 = (bool)((byte)(uVar92 >> 3) & 1);
                            bVar22 = (bool)((byte)(uVar92 >> 4) & 1);
                            bVar23 = (bool)((byte)(uVar92 >> 5) & 1);
                            bVar24 = (bool)((byte)(uVar92 >> 6) & 1);
                            bVar25 = (bool)((byte)(uVar92 >> 7) & 1);
                            bVar26 = (bool)((byte)(uVar92 >> 9) & 1);
                            bVar27 = (bool)((byte)(uVar92 >> 10) & 1);
                            bVar28 = (bool)((byte)(uVar92 >> 0xb) & 1);
                            bVar29 = (bool)((byte)(uVar92 >> 0xc) & 1);
                            bVar30 = (bool)((byte)(uVar92 >> 0xd) & 1);
                            bVar31 = (bool)((byte)(uVar92 >> 0xe) & 1);
                            bVar32 = SUB81(uVar92 >> 0xf,0);
                            *(uint *)(local_b50.ray + 0x340) =
                                 (uint)(bVar86 & 1) * *(int *)(local_b50.hit + 0x40) |
                                 (uint)!(bool)(bVar86 & 1) * *(int *)(local_b50.ray + 0x340);
                            *(uint *)(local_b50.ray + 0x344) =
                                 (uint)bVar91 * iVar3 |
                                 (uint)!bVar91 * *(int *)(local_b50.ray + 0x344);
                            *(uint *)(local_b50.ray + 0x348) =
                                 (uint)bVar20 * iVar4 |
                                 (uint)!bVar20 * *(int *)(local_b50.ray + 0x348);
                            *(uint *)(local_b50.ray + 0x34c) =
                                 (uint)bVar21 * iVar5 |
                                 (uint)!bVar21 * *(int *)(local_b50.ray + 0x34c);
                            *(uint *)(local_b50.ray + 0x350) =
                                 (uint)bVar22 * iVar6 |
                                 (uint)!bVar22 * *(int *)(local_b50.ray + 0x350);
                            *(uint *)(local_b50.ray + 0x354) =
                                 (uint)bVar23 * iVar7 |
                                 (uint)!bVar23 * *(int *)(local_b50.ray + 0x354);
                            *(uint *)(local_b50.ray + 0x358) =
                                 (uint)bVar24 * iVar8 |
                                 (uint)!bVar24 * *(int *)(local_b50.ray + 0x358);
                            *(uint *)(local_b50.ray + 0x35c) =
                                 (uint)bVar25 * iVar1 |
                                 (uint)!bVar25 * *(int *)(local_b50.ray + 0x35c);
                            *(uint *)(local_b50.ray + 0x360) =
                                 (uint)(bVar80 & 1) * iVar66 |
                                 (uint)!(bool)(bVar80 & 1) * *(int *)(local_b50.ray + 0x360);
                            *(uint *)(local_b50.ray + 0x364) =
                                 (uint)bVar26 * iVar67 |
                                 (uint)!bVar26 * *(int *)(local_b50.ray + 0x364);
                            *(uint *)(local_b50.ray + 0x368) =
                                 (uint)bVar27 * iVar68 |
                                 (uint)!bVar27 * *(int *)(local_b50.ray + 0x368);
                            *(uint *)(local_b50.ray + 0x36c) =
                                 (uint)bVar28 * iVar69 |
                                 (uint)!bVar28 * *(int *)(local_b50.ray + 0x36c);
                            *(uint *)(local_b50.ray + 0x370) =
                                 (uint)bVar29 * iVar70 |
                                 (uint)!bVar29 * *(int *)(local_b50.ray + 0x370);
                            *(uint *)(local_b50.ray + 0x374) =
                                 (uint)bVar30 * iVar71 |
                                 (uint)!bVar30 * *(int *)(local_b50.ray + 0x374);
                            *(uint *)(local_b50.ray + 0x378) =
                                 (uint)bVar31 * iVar72 |
                                 (uint)!bVar31 * *(int *)(local_b50.ray + 0x378);
                            *(uint *)(local_b50.ray + 0x37c) =
                                 (uint)bVar32 * iVar73 |
                                 (uint)!bVar32 * *(int *)(local_b50.ray + 0x37c);
                            iVar3 = *(int *)(local_b50.hit + 0x84);
                            iVar4 = *(int *)(local_b50.hit + 0x88);
                            iVar5 = *(int *)(local_b50.hit + 0x8c);
                            iVar6 = *(int *)(local_b50.hit + 0x90);
                            iVar7 = *(int *)(local_b50.hit + 0x94);
                            iVar8 = *(int *)(local_b50.hit + 0x98);
                            iVar1 = *(int *)(local_b50.hit + 0x9c);
                            iVar66 = *(int *)(local_b50.hit + 0xa0);
                            iVar67 = *(int *)(local_b50.hit + 0xa4);
                            iVar68 = *(int *)(local_b50.hit + 0xa8);
                            iVar69 = *(int *)(local_b50.hit + 0xac);
                            iVar70 = *(int *)(local_b50.hit + 0xb0);
                            iVar71 = *(int *)(local_b50.hit + 0xb4);
                            iVar72 = *(int *)(local_b50.hit + 0xb8);
                            iVar73 = *(int *)(local_b50.hit + 0xbc);
                            bVar91 = (bool)((byte)(uVar92 >> 1) & 1);
                            bVar20 = (bool)((byte)(uVar92 >> 2) & 1);
                            bVar21 = (bool)((byte)(uVar92 >> 3) & 1);
                            bVar22 = (bool)((byte)(uVar92 >> 4) & 1);
                            bVar23 = (bool)((byte)(uVar92 >> 5) & 1);
                            bVar24 = (bool)((byte)(uVar92 >> 6) & 1);
                            bVar25 = (bool)((byte)(uVar92 >> 7) & 1);
                            bVar26 = (bool)((byte)(uVar92 >> 9) & 1);
                            bVar27 = (bool)((byte)(uVar92 >> 10) & 1);
                            bVar28 = (bool)((byte)(uVar92 >> 0xb) & 1);
                            bVar29 = (bool)((byte)(uVar92 >> 0xc) & 1);
                            bVar30 = (bool)((byte)(uVar92 >> 0xd) & 1);
                            bVar31 = (bool)((byte)(uVar92 >> 0xe) & 1);
                            bVar32 = SUB81(uVar92 >> 0xf,0);
                            *(uint *)(local_b50.ray + 0x380) =
                                 (uint)(bVar86 & 1) * *(int *)(local_b50.hit + 0x80) |
                                 (uint)!(bool)(bVar86 & 1) * *(int *)(local_b50.ray + 0x380);
                            *(uint *)(local_b50.ray + 900) =
                                 (uint)bVar91 * iVar3 |
                                 (uint)!bVar91 * *(int *)(local_b50.ray + 900);
                            *(uint *)(local_b50.ray + 0x388) =
                                 (uint)bVar20 * iVar4 |
                                 (uint)!bVar20 * *(int *)(local_b50.ray + 0x388);
                            *(uint *)(local_b50.ray + 0x38c) =
                                 (uint)bVar21 * iVar5 |
                                 (uint)!bVar21 * *(int *)(local_b50.ray + 0x38c);
                            *(uint *)(local_b50.ray + 0x390) =
                                 (uint)bVar22 * iVar6 |
                                 (uint)!bVar22 * *(int *)(local_b50.ray + 0x390);
                            *(uint *)(local_b50.ray + 0x394) =
                                 (uint)bVar23 * iVar7 |
                                 (uint)!bVar23 * *(int *)(local_b50.ray + 0x394);
                            *(uint *)(local_b50.ray + 0x398) =
                                 (uint)bVar24 * iVar8 |
                                 (uint)!bVar24 * *(int *)(local_b50.ray + 0x398);
                            *(uint *)(local_b50.ray + 0x39c) =
                                 (uint)bVar25 * iVar1 |
                                 (uint)!bVar25 * *(int *)(local_b50.ray + 0x39c);
                            *(uint *)(local_b50.ray + 0x3a0) =
                                 (uint)(bVar80 & 1) * iVar66 |
                                 (uint)!(bool)(bVar80 & 1) * *(int *)(local_b50.ray + 0x3a0);
                            *(uint *)(local_b50.ray + 0x3a4) =
                                 (uint)bVar26 * iVar67 |
                                 (uint)!bVar26 * *(int *)(local_b50.ray + 0x3a4);
                            *(uint *)(local_b50.ray + 0x3a8) =
                                 (uint)bVar27 * iVar68 |
                                 (uint)!bVar27 * *(int *)(local_b50.ray + 0x3a8);
                            *(uint *)(local_b50.ray + 0x3ac) =
                                 (uint)bVar28 * iVar69 |
                                 (uint)!bVar28 * *(int *)(local_b50.ray + 0x3ac);
                            *(uint *)(local_b50.ray + 0x3b0) =
                                 (uint)bVar29 * iVar70 |
                                 (uint)!bVar29 * *(int *)(local_b50.ray + 0x3b0);
                            *(uint *)(local_b50.ray + 0x3b4) =
                                 (uint)bVar30 * iVar71 |
                                 (uint)!bVar30 * *(int *)(local_b50.ray + 0x3b4);
                            *(uint *)(local_b50.ray + 0x3b8) =
                                 (uint)bVar31 * iVar72 |
                                 (uint)!bVar31 * *(int *)(local_b50.ray + 0x3b8);
                            *(uint *)(local_b50.ray + 0x3bc) =
                                 (uint)bVar32 * iVar73 |
                                 (uint)!bVar32 * *(int *)(local_b50.ray + 0x3bc);
                            iVar3 = *(int *)(local_b50.hit + 0xc4);
                            iVar4 = *(int *)(local_b50.hit + 200);
                            iVar5 = *(int *)(local_b50.hit + 0xcc);
                            iVar6 = *(int *)(local_b50.hit + 0xd0);
                            iVar7 = *(int *)(local_b50.hit + 0xd4);
                            iVar8 = *(int *)(local_b50.hit + 0xd8);
                            iVar1 = *(int *)(local_b50.hit + 0xdc);
                            iVar66 = *(int *)(local_b50.hit + 0xe0);
                            iVar67 = *(int *)(local_b50.hit + 0xe4);
                            iVar68 = *(int *)(local_b50.hit + 0xe8);
                            iVar69 = *(int *)(local_b50.hit + 0xec);
                            iVar70 = *(int *)(local_b50.hit + 0xf0);
                            iVar71 = *(int *)(local_b50.hit + 0xf4);
                            iVar72 = *(int *)(local_b50.hit + 0xf8);
                            iVar73 = *(int *)(local_b50.hit + 0xfc);
                            bVar91 = (bool)((byte)(uVar92 >> 1) & 1);
                            bVar20 = (bool)((byte)(uVar92 >> 2) & 1);
                            bVar21 = (bool)((byte)(uVar92 >> 3) & 1);
                            bVar22 = (bool)((byte)(uVar92 >> 4) & 1);
                            bVar23 = (bool)((byte)(uVar92 >> 5) & 1);
                            bVar24 = (bool)((byte)(uVar92 >> 6) & 1);
                            bVar25 = (bool)((byte)(uVar92 >> 7) & 1);
                            bVar26 = (bool)((byte)(uVar92 >> 9) & 1);
                            bVar27 = (bool)((byte)(uVar92 >> 10) & 1);
                            bVar28 = (bool)((byte)(uVar92 >> 0xb) & 1);
                            bVar29 = (bool)((byte)(uVar92 >> 0xc) & 1);
                            bVar30 = (bool)((byte)(uVar92 >> 0xd) & 1);
                            bVar31 = (bool)((byte)(uVar92 >> 0xe) & 1);
                            bVar32 = SUB81(uVar92 >> 0xf,0);
                            *(uint *)(local_b50.ray + 0x3c0) =
                                 (uint)(bVar86 & 1) * *(int *)(local_b50.hit + 0xc0) |
                                 (uint)!(bool)(bVar86 & 1) * *(int *)(local_b50.ray + 0x3c0);
                            *(uint *)(local_b50.ray + 0x3c4) =
                                 (uint)bVar91 * iVar3 |
                                 (uint)!bVar91 * *(int *)(local_b50.ray + 0x3c4);
                            *(uint *)(local_b50.ray + 0x3c8) =
                                 (uint)bVar20 * iVar4 |
                                 (uint)!bVar20 * *(int *)(local_b50.ray + 0x3c8);
                            *(uint *)(local_b50.ray + 0x3cc) =
                                 (uint)bVar21 * iVar5 |
                                 (uint)!bVar21 * *(int *)(local_b50.ray + 0x3cc);
                            *(uint *)(local_b50.ray + 0x3d0) =
                                 (uint)bVar22 * iVar6 |
                                 (uint)!bVar22 * *(int *)(local_b50.ray + 0x3d0);
                            *(uint *)(local_b50.ray + 0x3d4) =
                                 (uint)bVar23 * iVar7 |
                                 (uint)!bVar23 * *(int *)(local_b50.ray + 0x3d4);
                            *(uint *)(local_b50.ray + 0x3d8) =
                                 (uint)bVar24 * iVar8 |
                                 (uint)!bVar24 * *(int *)(local_b50.ray + 0x3d8);
                            *(uint *)(local_b50.ray + 0x3dc) =
                                 (uint)bVar25 * iVar1 |
                                 (uint)!bVar25 * *(int *)(local_b50.ray + 0x3dc);
                            *(uint *)(local_b50.ray + 0x3e0) =
                                 (uint)(bVar80 & 1) * iVar66 |
                                 (uint)!(bool)(bVar80 & 1) * *(int *)(local_b50.ray + 0x3e0);
                            *(uint *)(local_b50.ray + 0x3e4) =
                                 (uint)bVar26 * iVar67 |
                                 (uint)!bVar26 * *(int *)(local_b50.ray + 0x3e4);
                            *(uint *)(local_b50.ray + 1000) =
                                 (uint)bVar27 * iVar68 |
                                 (uint)!bVar27 * *(int *)(local_b50.ray + 1000);
                            *(uint *)(local_b50.ray + 0x3ec) =
                                 (uint)bVar28 * iVar69 |
                                 (uint)!bVar28 * *(int *)(local_b50.ray + 0x3ec);
                            *(uint *)(local_b50.ray + 0x3f0) =
                                 (uint)bVar29 * iVar70 |
                                 (uint)!bVar29 * *(int *)(local_b50.ray + 0x3f0);
                            *(uint *)(local_b50.ray + 0x3f4) =
                                 (uint)bVar30 * iVar71 |
                                 (uint)!bVar30 * *(int *)(local_b50.ray + 0x3f4);
                            *(uint *)(local_b50.ray + 0x3f8) =
                                 (uint)bVar31 * iVar72 |
                                 (uint)!bVar31 * *(int *)(local_b50.ray + 0x3f8);
                            *(uint *)(local_b50.ray + 0x3fc) =
                                 (uint)bVar32 * iVar73 |
                                 (uint)!bVar32 * *(int *)(local_b50.ray + 0x3fc);
                            iVar3 = *(int *)(local_b50.hit + 0x104);
                            iVar4 = *(int *)(local_b50.hit + 0x108);
                            iVar5 = *(int *)(local_b50.hit + 0x10c);
                            iVar6 = *(int *)(local_b50.hit + 0x110);
                            iVar7 = *(int *)(local_b50.hit + 0x114);
                            iVar8 = *(int *)(local_b50.hit + 0x118);
                            iVar1 = *(int *)(local_b50.hit + 0x11c);
                            iVar66 = *(int *)(local_b50.hit + 0x120);
                            iVar67 = *(int *)(local_b50.hit + 0x124);
                            iVar68 = *(int *)(local_b50.hit + 0x128);
                            iVar69 = *(int *)(local_b50.hit + 300);
                            iVar70 = *(int *)(local_b50.hit + 0x130);
                            iVar71 = *(int *)(local_b50.hit + 0x134);
                            iVar72 = *(int *)(local_b50.hit + 0x138);
                            iVar73 = *(int *)(local_b50.hit + 0x13c);
                            bVar91 = (bool)((byte)(uVar92 >> 1) & 1);
                            bVar20 = (bool)((byte)(uVar92 >> 2) & 1);
                            bVar21 = (bool)((byte)(uVar92 >> 3) & 1);
                            bVar22 = (bool)((byte)(uVar92 >> 4) & 1);
                            bVar23 = (bool)((byte)(uVar92 >> 5) & 1);
                            bVar24 = (bool)((byte)(uVar92 >> 6) & 1);
                            bVar25 = (bool)((byte)(uVar92 >> 7) & 1);
                            bVar26 = (bool)((byte)(uVar92 >> 9) & 1);
                            bVar27 = (bool)((byte)(uVar92 >> 10) & 1);
                            bVar28 = (bool)((byte)(uVar92 >> 0xb) & 1);
                            bVar29 = (bool)((byte)(uVar92 >> 0xc) & 1);
                            bVar30 = (bool)((byte)(uVar92 >> 0xd) & 1);
                            bVar31 = (bool)((byte)(uVar92 >> 0xe) & 1);
                            bVar32 = SUB81(uVar92 >> 0xf,0);
                            *(uint *)(local_b50.ray + 0x400) =
                                 (uint)(bVar86 & 1) * *(int *)(local_b50.hit + 0x100) |
                                 (uint)!(bool)(bVar86 & 1) * *(int *)(local_b50.ray + 0x400);
                            *(uint *)(local_b50.ray + 0x404) =
                                 (uint)bVar91 * iVar3 |
                                 (uint)!bVar91 * *(int *)(local_b50.ray + 0x404);
                            *(uint *)(local_b50.ray + 0x408) =
                                 (uint)bVar20 * iVar4 |
                                 (uint)!bVar20 * *(int *)(local_b50.ray + 0x408);
                            *(uint *)(local_b50.ray + 0x40c) =
                                 (uint)bVar21 * iVar5 |
                                 (uint)!bVar21 * *(int *)(local_b50.ray + 0x40c);
                            *(uint *)(local_b50.ray + 0x410) =
                                 (uint)bVar22 * iVar6 |
                                 (uint)!bVar22 * *(int *)(local_b50.ray + 0x410);
                            *(uint *)(local_b50.ray + 0x414) =
                                 (uint)bVar23 * iVar7 |
                                 (uint)!bVar23 * *(int *)(local_b50.ray + 0x414);
                            *(uint *)(local_b50.ray + 0x418) =
                                 (uint)bVar24 * iVar8 |
                                 (uint)!bVar24 * *(int *)(local_b50.ray + 0x418);
                            *(uint *)(local_b50.ray + 0x41c) =
                                 (uint)bVar25 * iVar1 |
                                 (uint)!bVar25 * *(int *)(local_b50.ray + 0x41c);
                            *(uint *)(local_b50.ray + 0x420) =
                                 (uint)(bVar80 & 1) * iVar66 |
                                 (uint)!(bool)(bVar80 & 1) * *(int *)(local_b50.ray + 0x420);
                            *(uint *)(local_b50.ray + 0x424) =
                                 (uint)bVar26 * iVar67 |
                                 (uint)!bVar26 * *(int *)(local_b50.ray + 0x424);
                            *(uint *)(local_b50.ray + 0x428) =
                                 (uint)bVar27 * iVar68 |
                                 (uint)!bVar27 * *(int *)(local_b50.ray + 0x428);
                            *(uint *)(local_b50.ray + 0x42c) =
                                 (uint)bVar28 * iVar69 |
                                 (uint)!bVar28 * *(int *)(local_b50.ray + 0x42c);
                            *(uint *)(local_b50.ray + 0x430) =
                                 (uint)bVar29 * iVar70 |
                                 (uint)!bVar29 * *(int *)(local_b50.ray + 0x430);
                            *(uint *)(local_b50.ray + 0x434) =
                                 (uint)bVar30 * iVar71 |
                                 (uint)!bVar30 * *(int *)(local_b50.ray + 0x434);
                            *(uint *)(local_b50.ray + 0x438) =
                                 (uint)bVar31 * iVar72 |
                                 (uint)!bVar31 * *(int *)(local_b50.ray + 0x438);
                            *(uint *)(local_b50.ray + 0x43c) =
                                 (uint)bVar32 * iVar73 |
                                 (uint)!bVar32 * *(int *)(local_b50.ray + 0x43c);
                            auVar184 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b50.hit + 0x140));
                            auVar184 = vmovdqu32_avx512f(auVar184);
                            *(undefined1 (*) [64])(local_b50.ray + 0x440) = auVar184;
                            auVar184 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b50.hit + 0x180));
                            auVar184 = vmovdqu32_avx512f(auVar184);
                            *(undefined1 (*) [64])(local_b50.ray + 0x480) = auVar184;
                            auVar277 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b50.hit + 0x1c0));
                            auVar184 = vmovdqa32_avx512f(auVar277);
                            *(undefined1 (*) [64])(local_b50.ray + 0x4c0) = auVar184;
                            auVar184 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b50.hit + 0x200));
                            bVar91 = (bool)((byte)(uVar92 >> 1) & 1);
                            auVar62._4_56_ = auVar184._8_56_;
                            auVar62._0_4_ =
                                 (uint)bVar91 * auVar184._4_4_ | (uint)!bVar91 * auVar277._4_4_;
                            auVar153._0_8_ = auVar62._0_8_ << 0x20;
                            bVar91 = (bool)((byte)(uVar92 >> 2) & 1);
                            auVar153._8_4_ =
                                 (uint)bVar91 * auVar184._8_4_ | (uint)!bVar91 * auVar277._8_4_;
                            bVar91 = (bool)((byte)(uVar92 >> 3) & 1);
                            auVar153._12_4_ =
                                 (uint)bVar91 * auVar184._12_4_ | (uint)!bVar91 * auVar277._12_4_;
                            bVar91 = (bool)((byte)(uVar92 >> 4) & 1);
                            auVar153._16_4_ =
                                 (uint)bVar91 * auVar184._16_4_ | (uint)!bVar91 * auVar277._16_4_;
                            bVar91 = (bool)((byte)(uVar92 >> 5) & 1);
                            auVar153._20_4_ =
                                 (uint)bVar91 * auVar184._20_4_ | (uint)!bVar91 * auVar277._20_4_;
                            bVar91 = (bool)((byte)(uVar92 >> 6) & 1);
                            auVar153._24_4_ =
                                 (uint)bVar91 * auVar184._24_4_ | (uint)!bVar91 * auVar277._24_4_;
                            bVar91 = (bool)((byte)(uVar92 >> 7) & 1);
                            auVar153._28_4_ =
                                 (uint)bVar91 * auVar184._28_4_ | (uint)!bVar91 * auVar277._28_4_;
                            auVar153._32_4_ =
                                 (uint)(bVar80 & 1) * auVar184._32_4_ |
                                 (uint)!(bool)(bVar80 & 1) * auVar277._32_4_;
                            bVar91 = (bool)((byte)(uVar92 >> 9) & 1);
                            auVar153._36_4_ =
                                 (uint)bVar91 * auVar184._36_4_ | (uint)!bVar91 * auVar277._36_4_;
                            bVar91 = (bool)((byte)(uVar92 >> 10) & 1);
                            auVar153._40_4_ =
                                 (uint)bVar91 * auVar184._40_4_ | (uint)!bVar91 * auVar277._40_4_;
                            bVar91 = (bool)((byte)(uVar92 >> 0xb) & 1);
                            auVar153._44_4_ =
                                 (uint)bVar91 * auVar184._44_4_ | (uint)!bVar91 * auVar277._44_4_;
                            bVar91 = (bool)((byte)(uVar92 >> 0xc) & 1);
                            auVar153._48_4_ =
                                 (uint)bVar91 * auVar184._48_4_ | (uint)!bVar91 * auVar277._48_4_;
                            bVar91 = (bool)((byte)(uVar92 >> 0xd) & 1);
                            auVar153._52_4_ =
                                 (uint)bVar91 * auVar184._52_4_ | (uint)!bVar91 * auVar277._52_4_;
                            bVar91 = (bool)((byte)(uVar92 >> 0xe) & 1);
                            auVar153._56_4_ =
                                 (uint)bVar91 * auVar184._56_4_ | (uint)!bVar91 * auVar277._56_4_;
                            bVar91 = SUB81(uVar92 >> 0xf,0);
                            auVar153._60_4_ =
                                 (uint)bVar91 * auVar184._60_4_ | (uint)!bVar91 * auVar277._60_4_;
                            auVar184 = vmovdqa32_avx512f(auVar184);
                            *(undefined1 (*) [64])(local_b50.ray + 0x500) = auVar184;
                            goto LAB_01c408df;
                          }
                        }
                        *(float *)(ray + k * 4 + 0x200) = fVar280;
                      }
                    }
                  }
                }
LAB_01c408df:
                auVar108 = auVar153._32_32_;
                bVar91 = lVar90 != 0;
                lVar90 = lVar90 + -1;
              } while ((!bVar19) && (bVar91));
              auVar77._4_4_ = fStack_85c;
              auVar77._0_4_ = local_860;
              auVar77._8_4_ = fStack_858;
              auVar77._12_4_ = fStack_854;
              auVar77._16_4_ = fStack_850;
              auVar77._20_4_ = fStack_84c;
              auVar77._24_4_ = fStack_848;
              auVar77._28_4_ = fStack_844;
              uVar10 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar53._4_4_ = uVar10;
              auVar53._0_4_ = uVar10;
              auVar53._8_4_ = uVar10;
              auVar53._12_4_ = uVar10;
              auVar53._16_4_ = uVar10;
              auVar53._20_4_ = uVar10;
              auVar53._24_4_ = uVar10;
              auVar53._28_4_ = uVar10;
              uVar34 = vcmpps_avx512vl(auVar77,auVar53,2);
              bVar87 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar87 & (byte)uVar34;
            } while (bVar87 != 0);
          }
          uVar35 = vpcmpd_avx512vl(local_7e0,_local_880,1);
          uVar36 = vpcmpd_avx512vl(local_7e0,local_760,1);
          auVar208._0_4_ = (float)local_900._0_4_ + (float)local_500._0_4_;
          auVar208._4_4_ = (float)local_900._4_4_ + (float)local_500._4_4_;
          auVar208._8_4_ = fStack_8f8 + fStack_4f8;
          auVar208._12_4_ = fStack_8f4 + fStack_4f4;
          auVar208._16_4_ = fStack_8f0 + fStack_4f0;
          auVar208._20_4_ = fStack_8ec + fStack_4ec;
          auVar208._24_4_ = fStack_8e8 + fStack_4e8;
          auVar208._28_4_ = fStack_8e4 + fStack_4e4;
          uVar10 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar227._4_4_ = uVar10;
          auVar227._0_4_ = uVar10;
          auVar227._8_4_ = uVar10;
          auVar227._12_4_ = uVar10;
          auVar227._16_4_ = uVar10;
          auVar227._20_4_ = uVar10;
          auVar227._24_4_ = uVar10;
          auVar227._28_4_ = uVar10;
          uVar34 = vcmpps_avx512vl(auVar208,auVar227,2);
          bVar82 = bVar82 & (byte)uVar36 & (byte)uVar34;
          auVar242._0_4_ = (float)local_900._0_4_ + (float)local_7a0._0_4_;
          auVar242._4_4_ = (float)local_900._4_4_ + (float)local_7a0._4_4_;
          auVar242._8_4_ = fStack_8f8 + fStack_798;
          auVar242._12_4_ = fStack_8f4 + fStack_794;
          auVar242._16_4_ = fStack_8f0 + fStack_790;
          auVar242._20_4_ = fStack_8ec + fStack_78c;
          auVar242._24_4_ = fStack_8e8 + fStack_788;
          auVar242._28_4_ = fStack_8e4 + fStack_784;
          uVar34 = vcmpps_avx512vl(auVar242,auVar227,2);
          bVar84 = bVar84 & (byte)uVar35 & (byte)uVar34 | bVar82;
          prim = local_ad0;
          if (bVar84 == 0) {
            auVar184 = ZEXT3264(CONCAT428(0x7fffffff,
                                          CONCAT424(0x7fffffff,
                                                    CONCAT420(0x7fffffff,
                                                              CONCAT416(0x7fffffff,
                                                                        CONCAT412(0x7fffffff,
                                                                                  CONCAT48(
                                                  0x7fffffff,0x7fffffff7fffffff)))))));
            auVar277 = ZEXT3264(_DAT_02020f20);
            auVar107 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar300 = ZEXT3264(auVar107);
          }
          else {
            abStack_1a0[uVar81 * 0x60] = bVar84;
            bVar19 = (bool)(bVar82 >> 1 & 1);
            bVar91 = (bool)(bVar82 >> 2 & 1);
            bVar20 = (bool)(bVar82 >> 3 & 1);
            bVar21 = (bool)(bVar82 >> 4 & 1);
            bVar22 = (bool)(bVar82 >> 5 & 1);
            auStack_180[uVar81 * 0x18] =
                 (uint)(bVar82 & 1) * local_500._0_4_ | (uint)!(bool)(bVar82 & 1) * local_7a0._0_4_;
            auStack_180[uVar81 * 0x18 + 1] =
                 (uint)bVar19 * local_500._4_4_ | (uint)!bVar19 * local_7a0._4_4_;
            auStack_180[uVar81 * 0x18 + 2] =
                 (uint)bVar91 * (int)fStack_4f8 | (uint)!bVar91 * (int)fStack_798;
            auStack_180[uVar81 * 0x18 + 3] =
                 (uint)bVar20 * (int)fStack_4f4 | (uint)!bVar20 * (int)fStack_794;
            auStack_180[uVar81 * 0x18 + 4] =
                 (uint)bVar21 * (int)fStack_4f0 | (uint)!bVar21 * (int)fStack_790;
            auStack_180[uVar81 * 0x18 + 5] =
                 (uint)bVar22 * (int)fStack_4ec | (uint)!bVar22 * (int)fStack_78c;
            auStack_180[uVar81 * 0x18 + 6] =
                 (uint)(bVar82 >> 6) * (int)fStack_4e8 |
                 (uint)!(bool)(bVar82 >> 6) * (int)fStack_788;
            (&fStack_164)[uVar81 * 0x18] = fStack_784;
            uVar34 = vmovlps_avx(local_af0);
            (&uStack_160)[uVar81 * 0xc] = uVar34;
            afStack_158[uVar81 * 0x18] = (float)((int)local_ac8 + 1);
            uVar81 = (ulong)((int)uVar81 + 1);
            auVar184 = ZEXT3264(CONCAT428(0x7fffffff,
                                          CONCAT424(0x7fffffff,
                                                    CONCAT420(0x7fffffff,
                                                              CONCAT416(0x7fffffff,
                                                                        CONCAT412(0x7fffffff,
                                                                                  CONCAT48(
                                                  0x7fffffff,0x7fffffff7fffffff)))))));
            auVar277 = ZEXT3264(_DAT_02020f20);
            auVar107 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar300 = ZEXT3264(auVar107);
          }
        }
      }
    }
    auVar228 = ZEXT1664(local_af0);
    do {
      if ((int)uVar81 == 0) {
        uVar10 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar43._4_4_ = uVar10;
        auVar43._0_4_ = uVar10;
        auVar43._8_4_ = uVar10;
        auVar43._12_4_ = uVar10;
        uVar34 = vcmpps_avx512vl(local_7f0,auVar43,2);
        uVar83 = (uint)uVar34 & (uint)local_928 - 1 & (uint)local_928;
        local_928 = (ulong)uVar83;
        if (uVar83 == 0) {
          return;
        }
        goto LAB_01c3e4aa;
      }
      uVar92 = (ulong)((int)uVar81 - 1);
      auVar107 = *(undefined1 (*) [32])(auStack_180 + uVar92 * 0x18);
      auVar209._0_4_ = auVar107._0_4_ + (float)local_900._0_4_;
      auVar209._4_4_ = auVar107._4_4_ + (float)local_900._4_4_;
      auVar209._8_4_ = auVar107._8_4_ + fStack_8f8;
      auVar209._12_4_ = auVar107._12_4_ + fStack_8f4;
      auVar209._16_4_ = auVar107._16_4_ + fStack_8f0;
      auVar209._20_4_ = auVar107._20_4_ + fStack_8ec;
      auVar209._24_4_ = auVar107._24_4_ + fStack_8e8;
      auVar209._28_4_ = auVar107._28_4_ + fStack_8e4;
      uVar10 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar54._4_4_ = uVar10;
      auVar54._0_4_ = uVar10;
      auVar54._8_4_ = uVar10;
      auVar54._12_4_ = uVar10;
      auVar54._16_4_ = uVar10;
      auVar54._20_4_ = uVar10;
      auVar54._24_4_ = uVar10;
      auVar54._28_4_ = uVar10;
      uVar34 = vcmpps_avx512vl(auVar209,auVar54,2);
      uVar85 = (uint)uVar34 & (uint)abStack_1a0[uVar92 * 0x60];
      bVar84 = (byte)uVar85;
      if (uVar85 != 0) {
        auVar210._8_4_ = 0x7f800000;
        auVar210._0_8_ = 0x7f8000007f800000;
        auVar210._12_4_ = 0x7f800000;
        auVar210._16_4_ = 0x7f800000;
        auVar210._20_4_ = 0x7f800000;
        auVar210._24_4_ = 0x7f800000;
        auVar210._28_4_ = 0x7f800000;
        auVar109 = vblendmps_avx512vl(auVar210,auVar107);
        auVar148._0_4_ =
             (uint)(bVar84 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar84 & 1) * (int)auVar107._0_4_;
        bVar19 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar148._4_4_ = (uint)bVar19 * auVar109._4_4_ | (uint)!bVar19 * (int)auVar107._4_4_;
        bVar19 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar148._8_4_ = (uint)bVar19 * auVar109._8_4_ | (uint)!bVar19 * (int)auVar107._8_4_;
        bVar19 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar148._12_4_ = (uint)bVar19 * auVar109._12_4_ | (uint)!bVar19 * (int)auVar107._12_4_;
        bVar19 = (bool)((byte)(uVar85 >> 4) & 1);
        auVar148._16_4_ = (uint)bVar19 * auVar109._16_4_ | (uint)!bVar19 * (int)auVar107._16_4_;
        bVar19 = (bool)((byte)(uVar85 >> 5) & 1);
        auVar148._20_4_ = (uint)bVar19 * auVar109._20_4_ | (uint)!bVar19 * (int)auVar107._20_4_;
        bVar19 = (bool)((byte)(uVar85 >> 6) & 1);
        auVar148._24_4_ = (uint)bVar19 * auVar109._24_4_ | (uint)!bVar19 * (int)auVar107._24_4_;
        auVar148._28_4_ =
             (uVar85 >> 7) * auVar109._28_4_ | (uint)!SUB41(uVar85 >> 7,0) * (int)auVar107._28_4_;
        auVar107 = vshufps_avx(auVar148,auVar148,0xb1);
        auVar107 = vminps_avx(auVar148,auVar107);
        auVar109 = vshufpd_avx(auVar107,auVar107,5);
        auVar107 = vminps_avx(auVar107,auVar109);
        auVar109 = vpermpd_avx2(auVar107,0x4e);
        auVar107 = vminps_avx(auVar107,auVar109);
        uVar34 = vcmpps_avx512vl(auVar148,auVar107,0);
        bVar87 = (byte)uVar34 & bVar84;
        if (bVar87 != 0) {
          uVar85 = (uint)bVar87;
        }
        fVar276 = afStack_158[uVar92 * 0x18 + -1];
        uVar154 = 0;
        for (; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x80000000) {
          uVar154 = uVar154 + 1;
        }
        local_ac8 = (ulong)(uint)afStack_158[uVar92 * 0x18];
        bVar87 = ~('\x01' << ((byte)uVar154 & 0x1f)) & bVar84;
        abStack_1a0[uVar92 * 0x60] = bVar87;
        uVar89 = uVar92;
        if (bVar87 != 0) {
          uVar89 = uVar81;
        }
        fVar278 = *(float *)(&uStack_160 + uVar92 * 0xc);
        auVar211._4_4_ = fVar278;
        auVar211._0_4_ = fVar278;
        auVar211._8_4_ = fVar278;
        auVar211._12_4_ = fVar278;
        auVar211._16_4_ = fVar278;
        auVar211._20_4_ = fVar278;
        auVar211._24_4_ = fVar278;
        auVar211._28_4_ = fVar278;
        fVar276 = fVar276 - fVar278;
        auVar183._4_4_ = fVar276;
        auVar183._0_4_ = fVar276;
        auVar183._8_4_ = fVar276;
        auVar183._12_4_ = fVar276;
        auVar183._16_4_ = fVar276;
        auVar183._20_4_ = fVar276;
        auVar183._24_4_ = fVar276;
        auVar183._28_4_ = fVar276;
        auVar99 = vfmadd132ps_fma(auVar183,auVar211,auVar277._0_32_);
        auVar107 = ZEXT1632(auVar99);
        local_400[0] = (RTCHitN)auVar107[0];
        local_400[1] = (RTCHitN)auVar107[1];
        local_400[2] = (RTCHitN)auVar107[2];
        local_400[3] = (RTCHitN)auVar107[3];
        local_400[4] = (RTCHitN)auVar107[4];
        local_400[5] = (RTCHitN)auVar107[5];
        local_400[6] = (RTCHitN)auVar107[6];
        local_400[7] = (RTCHitN)auVar107[7];
        local_400[8] = (RTCHitN)auVar107[8];
        local_400[9] = (RTCHitN)auVar107[9];
        local_400[10] = (RTCHitN)auVar107[10];
        local_400[0xb] = (RTCHitN)auVar107[0xb];
        local_400[0xc] = (RTCHitN)auVar107[0xc];
        local_400[0xd] = (RTCHitN)auVar107[0xd];
        local_400[0xe] = (RTCHitN)auVar107[0xe];
        local_400[0xf] = (RTCHitN)auVar107[0xf];
        local_400[0x10] = (RTCHitN)auVar107[0x10];
        local_400[0x11] = (RTCHitN)auVar107[0x11];
        local_400[0x12] = (RTCHitN)auVar107[0x12];
        local_400[0x13] = (RTCHitN)auVar107[0x13];
        local_400[0x14] = (RTCHitN)auVar107[0x14];
        local_400[0x15] = (RTCHitN)auVar107[0x15];
        local_400[0x16] = (RTCHitN)auVar107[0x16];
        local_400[0x17] = (RTCHitN)auVar107[0x17];
        local_400[0x18] = (RTCHitN)auVar107[0x18];
        local_400[0x19] = (RTCHitN)auVar107[0x19];
        local_400[0x1a] = (RTCHitN)auVar107[0x1a];
        local_400[0x1b] = (RTCHitN)auVar107[0x1b];
        local_400[0x1c] = (RTCHitN)auVar107[0x1c];
        local_400[0x1d] = (RTCHitN)auVar107[0x1d];
        local_400[0x1e] = (RTCHitN)auVar107[0x1e];
        local_400[0x1f] = (RTCHitN)auVar107[0x1f];
        auVar228 = ZEXT864(*(ulong *)(local_400 + (ulong)uVar154 * 4));
        uVar92 = uVar89;
      }
      uVar81 = uVar92;
      auVar107 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    } while (bVar84 == 0);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }